

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  bool bVar72;
  bool bVar73;
  bool bVar74;
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  uint uVar89;
  ulong uVar90;
  uint uVar91;
  long lVar92;
  ulong uVar93;
  ulong uVar94;
  bool bVar95;
  float fVar96;
  float fVar123;
  float fVar126;
  __m128 a;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar97;
  float fVar98;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar132;
  float fVar134;
  float fVar136;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar124;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar133;
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar140;
  float fVar178;
  float fVar179;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar181;
  undefined1 auVar162 [32];
  float fVar180;
  float fVar182;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar150 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar203;
  float fVar226;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [28];
  float fVar224;
  float fVar225;
  float fVar227;
  float fVar228;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar229;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  float fVar230;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar247;
  float fVar249;
  float fVar252;
  float fVar255;
  float fVar258;
  undefined1 auVar239 [28];
  float fVar251;
  float fVar254;
  float fVar257;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar245;
  float fVar246;
  float fVar248;
  float fVar250;
  float fVar253;
  float fVar256;
  undefined1 auVar244 [64];
  float fVar259;
  float fVar260;
  float fVar279;
  float fVar281;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar285;
  float fVar287;
  float fVar289;
  undefined1 auVar269 [32];
  float fVar283;
  undefined1 auVar270 [32];
  float fVar280;
  float fVar282;
  float fVar284;
  float fVar286;
  float fVar288;
  float fVar290;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar291;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar294 [16];
  float fVar292;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar307;
  float fVar309;
  float fVar313;
  float fVar315;
  float fVar317;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar311;
  undefined1 auVar300 [32];
  float fVar293;
  float fVar308;
  float fVar310;
  float fVar312;
  float fVar314;
  float fVar316;
  float fVar318;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [64];
  float fVar319;
  undefined1 auVar320 [16];
  float fVar335;
  float fVar336;
  float fVar340;
  float fVar342;
  float fVar344;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  float fVar338;
  undefined1 auVar328 [32];
  float fVar337;
  float fVar339;
  float fVar341;
  float fVar343;
  float fVar345;
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [64];
  float fVar346;
  undefined1 auVar347 [16];
  float fVar352;
  float fVar353;
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  float fVar354;
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [28];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  float fVar365;
  undefined1 auVar364 [32];
  float fVar366;
  undefined1 auVar367 [16];
  float fVar371;
  float fVar372;
  float fVar374;
  float fVar375;
  float fVar376;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  float fVar373;
  float fVar377;
  undefined1 auVar370 [32];
  undefined1 auVar378 [16];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  float fVar384;
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  float fVar385;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float in_register_0000151c;
  undefined1 auVar386 [32];
  float fVar395;
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  float fVar396;
  float fVar397;
  float fVar403;
  float fVar406;
  float fVar408;
  float fVar410;
  float fVar412;
  float fVar414;
  undefined1 auVar399 [32];
  float fVar404;
  float fVar407;
  float fVar409;
  float fVar411;
  float fVar413;
  float fVar415;
  float fVar416;
  undefined1 auVar400 [32];
  float fVar398;
  float fVar405;
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  float in_register_0000159c;
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  float fVar421;
  float fVar423;
  float fVar424;
  float fVar425;
  float fVar426;
  float fVar427;
  float fVar428;
  float in_register_000015dc;
  undefined1 auVar422 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_bc0;
  undefined8 local_b20;
  undefined8 uStack_b18;
  ulong local_b10;
  float local_b08;
  float local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ab0 [8];
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 *local_9e8;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 auStack_9b0 [16];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  RTCHitN local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  uint local_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  uint uStack_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar383 [64];
  
  PVar7 = prim[1];
  uVar93 = (ulong)(byte)PVar7;
  lVar92 = uVar93 * 5;
  auVar143 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar209 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar209 = vinsertps_avx(auVar209,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar203 = *(float *)(prim + uVar93 * 0x19 + 0x12);
  auVar143 = vsubps_avx(auVar143,*(undefined1 (*) [16])(prim + uVar93 * 0x19 + 6));
  auVar141._0_4_ = fVar203 * auVar143._0_4_;
  auVar141._4_4_ = fVar203 * auVar143._4_4_;
  auVar141._8_4_ = fVar203 * auVar143._8_4_;
  auVar141._12_4_ = fVar203 * auVar143._12_4_;
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 4 + 6)));
  auVar320 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 4 + 10)));
  auVar261._0_4_ = fVar203 * auVar209._0_4_;
  auVar261._4_4_ = fVar203 * auVar209._4_4_;
  auVar261._8_4_ = fVar203 * auVar209._8_4_;
  auVar261._12_4_ = fVar203 * auVar209._12_4_;
  auVar110._16_16_ = auVar320;
  auVar110._0_16_ = auVar143;
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar92 + 6)));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar92 + 10)));
  auVar194._16_16_ = auVar209;
  auVar194._0_16_ = auVar143;
  auVar350 = vcvtdq2ps_avx(auVar194);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 6 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 6 + 10)));
  auVar214._16_16_ = auVar209;
  auVar214._0_16_ = auVar143;
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0xb + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0xb + 10)));
  auVar12 = vcvtdq2ps_avx(auVar214);
  auVar215._16_16_ = auVar209;
  auVar215._0_16_ = auVar143;
  auVar331 = vcvtdq2ps_avx(auVar215);
  uVar90 = (ulong)((uint)(byte)PVar7 * 0xc);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 10)));
  auVar297._16_16_ = auVar209;
  auVar297._0_16_ = auVar143;
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + uVar93 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar297);
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + uVar93 + 10)));
  auVar321._16_16_ = auVar209;
  auVar321._0_16_ = auVar143;
  lVar11 = uVar93 * 9;
  uVar90 = (ulong)(uint)((int)lVar11 * 2);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 6)));
  auVar402 = vcvtdq2ps_avx(auVar321);
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 10)));
  auVar322._16_16_ = auVar209;
  auVar322._0_16_ = auVar143;
  auVar14 = vcvtdq2ps_avx(auVar322);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + uVar93 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + uVar93 + 10)));
  auVar361._16_16_ = auVar209;
  auVar361._0_16_ = auVar143;
  uVar90 = (ulong)(uint)((int)lVar92 << 2);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 10)));
  auVar15 = vcvtdq2ps_avx(auVar361);
  auVar368._16_16_ = auVar209;
  auVar368._0_16_ = auVar143;
  auVar303 = vcvtdq2ps_avx(auVar368);
  auVar143 = vshufps_avx(auVar261,auVar261,0);
  auVar209 = vshufps_avx(auVar261,auVar261,0x55);
  auVar320 = vshufps_avx(auVar261,auVar261,0xaa);
  fVar203 = auVar320._0_4_;
  fVar224 = auVar320._4_4_;
  fVar225 = auVar320._8_4_;
  fVar226 = auVar320._12_4_;
  fVar227 = auVar209._0_4_;
  fVar228 = auVar209._4_4_;
  fVar229 = auVar209._8_4_;
  fVar230 = auVar209._12_4_;
  fVar245 = auVar143._0_4_;
  fVar246 = auVar143._4_4_;
  fVar248 = auVar143._8_4_;
  fVar250 = auVar143._12_4_;
  auVar386._0_4_ = fVar245 * auVar110._0_4_ + fVar227 * auVar350._0_4_ + fVar203 * auVar12._0_4_;
  auVar386._4_4_ = fVar246 * auVar110._4_4_ + fVar228 * auVar350._4_4_ + fVar224 * auVar12._4_4_;
  auVar386._8_4_ = fVar248 * auVar110._8_4_ + fVar229 * auVar350._8_4_ + fVar225 * auVar12._8_4_;
  auVar386._12_4_ = fVar250 * auVar110._12_4_ + fVar230 * auVar350._12_4_ + fVar226 * auVar12._12_4_
  ;
  auVar386._16_4_ = fVar245 * auVar110._16_4_ + fVar227 * auVar350._16_4_ + fVar203 * auVar12._16_4_
  ;
  auVar386._20_4_ = fVar246 * auVar110._20_4_ + fVar228 * auVar350._20_4_ + fVar224 * auVar12._20_4_
  ;
  auVar386._24_4_ = fVar248 * auVar110._24_4_ + fVar229 * auVar350._24_4_ + fVar225 * auVar12._24_4_
  ;
  auVar386._28_4_ = fVar230 + in_register_000015dc + in_register_0000151c;
  auVar379._0_4_ = fVar245 * auVar331._0_4_ + fVar227 * auVar13._0_4_ + auVar402._0_4_ * fVar203;
  auVar379._4_4_ = fVar246 * auVar331._4_4_ + fVar228 * auVar13._4_4_ + auVar402._4_4_ * fVar224;
  auVar379._8_4_ = fVar248 * auVar331._8_4_ + fVar229 * auVar13._8_4_ + auVar402._8_4_ * fVar225;
  auVar379._12_4_ = fVar250 * auVar331._12_4_ + fVar230 * auVar13._12_4_ + auVar402._12_4_ * fVar226
  ;
  auVar379._16_4_ = fVar245 * auVar331._16_4_ + fVar227 * auVar13._16_4_ + auVar402._16_4_ * fVar203
  ;
  auVar379._20_4_ = fVar246 * auVar331._20_4_ + fVar228 * auVar13._20_4_ + auVar402._20_4_ * fVar224
  ;
  auVar379._24_4_ = fVar248 * auVar331._24_4_ + fVar229 * auVar13._24_4_ + auVar402._24_4_ * fVar225
  ;
  auVar379._28_4_ = fVar230 + in_register_000015dc + in_register_0000159c;
  auVar269._0_4_ = fVar245 * auVar14._0_4_ + fVar227 * auVar15._0_4_ + auVar303._0_4_ * fVar203;
  auVar269._4_4_ = fVar246 * auVar14._4_4_ + fVar228 * auVar15._4_4_ + auVar303._4_4_ * fVar224;
  auVar269._8_4_ = fVar248 * auVar14._8_4_ + fVar229 * auVar15._8_4_ + auVar303._8_4_ * fVar225;
  auVar269._12_4_ = fVar250 * auVar14._12_4_ + fVar230 * auVar15._12_4_ + auVar303._12_4_ * fVar226;
  auVar269._16_4_ = fVar245 * auVar14._16_4_ + fVar227 * auVar15._16_4_ + auVar303._16_4_ * fVar203;
  auVar269._20_4_ = fVar246 * auVar14._20_4_ + fVar228 * auVar15._20_4_ + auVar303._20_4_ * fVar224;
  auVar269._24_4_ = fVar248 * auVar14._24_4_ + fVar229 * auVar15._24_4_ + auVar303._24_4_ * fVar225;
  auVar269._28_4_ = fVar250 + fVar230 + fVar226;
  auVar143 = vshufps_avx(auVar141,auVar141,0);
  auVar209 = vshufps_avx(auVar141,auVar141,0x55);
  auVar320 = vshufps_avx(auVar141,auVar141,0xaa);
  fVar224 = auVar320._0_4_;
  fVar225 = auVar320._4_4_;
  fVar226 = auVar320._8_4_;
  fVar227 = auVar320._12_4_;
  fVar246 = auVar209._0_4_;
  fVar248 = auVar209._4_4_;
  fVar250 = auVar209._8_4_;
  fVar253 = auVar209._12_4_;
  fVar228 = auVar143._0_4_;
  fVar229 = auVar143._4_4_;
  fVar230 = auVar143._8_4_;
  fVar245 = auVar143._12_4_;
  fVar203 = auVar110._28_4_;
  auVar298._0_4_ = fVar228 * auVar110._0_4_ + fVar246 * auVar350._0_4_ + fVar224 * auVar12._0_4_;
  auVar298._4_4_ = fVar229 * auVar110._4_4_ + fVar248 * auVar350._4_4_ + fVar225 * auVar12._4_4_;
  auVar298._8_4_ = fVar230 * auVar110._8_4_ + fVar250 * auVar350._8_4_ + fVar226 * auVar12._8_4_;
  auVar298._12_4_ = fVar245 * auVar110._12_4_ + fVar253 * auVar350._12_4_ + fVar227 * auVar12._12_4_
  ;
  auVar298._16_4_ = fVar228 * auVar110._16_4_ + fVar246 * auVar350._16_4_ + fVar224 * auVar12._16_4_
  ;
  auVar298._20_4_ = fVar229 * auVar110._20_4_ + fVar248 * auVar350._20_4_ + fVar225 * auVar12._20_4_
  ;
  auVar298._24_4_ = fVar230 * auVar110._24_4_ + fVar250 * auVar350._24_4_ + fVar226 * auVar12._24_4_
  ;
  auVar298._28_4_ = fVar203 + auVar350._28_4_ + auVar12._28_4_;
  auVar158._0_4_ = fVar228 * auVar331._0_4_ + auVar402._0_4_ * fVar224 + fVar246 * auVar13._0_4_;
  auVar158._4_4_ = fVar229 * auVar331._4_4_ + auVar402._4_4_ * fVar225 + fVar248 * auVar13._4_4_;
  auVar158._8_4_ = fVar230 * auVar331._8_4_ + auVar402._8_4_ * fVar226 + fVar250 * auVar13._8_4_;
  auVar158._12_4_ = fVar245 * auVar331._12_4_ + auVar402._12_4_ * fVar227 + fVar253 * auVar13._12_4_
  ;
  auVar158._16_4_ = fVar228 * auVar331._16_4_ + auVar402._16_4_ * fVar224 + fVar246 * auVar13._16_4_
  ;
  auVar158._20_4_ = fVar229 * auVar331._20_4_ + auVar402._20_4_ * fVar225 + fVar248 * auVar13._20_4_
  ;
  auVar158._24_4_ = fVar230 * auVar331._24_4_ + auVar402._24_4_ * fVar226 + fVar250 * auVar13._24_4_
  ;
  auVar158._28_4_ = fVar203 + auVar402._28_4_ + auVar12._28_4_;
  auVar323._8_4_ = 0x7fffffff;
  auVar323._0_8_ = 0x7fffffff7fffffff;
  auVar323._12_4_ = 0x7fffffff;
  auVar323._16_4_ = 0x7fffffff;
  auVar323._20_4_ = 0x7fffffff;
  auVar323._24_4_ = 0x7fffffff;
  auVar323._28_4_ = 0x7fffffff;
  auVar362._8_4_ = 0x219392ef;
  auVar362._0_8_ = 0x219392ef219392ef;
  auVar362._12_4_ = 0x219392ef;
  auVar362._16_4_ = 0x219392ef;
  auVar362._20_4_ = 0x219392ef;
  auVar362._24_4_ = 0x219392ef;
  auVar362._28_4_ = 0x219392ef;
  auVar110 = vandps_avx(auVar386,auVar323);
  auVar110 = vcmpps_avx(auVar110,auVar362,1);
  auVar350 = vblendvps_avx(auVar386,auVar362,auVar110);
  auVar110 = vandps_avx(auVar379,auVar323);
  auVar110 = vcmpps_avx(auVar110,auVar362,1);
  auVar12 = vblendvps_avx(auVar379,auVar362,auVar110);
  auVar110 = vandps_avx(auVar269,auVar323);
  auVar110 = vcmpps_avx(auVar110,auVar362,1);
  auVar110 = vblendvps_avx(auVar269,auVar362,auVar110);
  auVar195._0_4_ = fVar246 * auVar15._0_4_ + auVar303._0_4_ * fVar224 + fVar228 * auVar14._0_4_;
  auVar195._4_4_ = fVar248 * auVar15._4_4_ + auVar303._4_4_ * fVar225 + fVar229 * auVar14._4_4_;
  auVar195._8_4_ = fVar250 * auVar15._8_4_ + auVar303._8_4_ * fVar226 + fVar230 * auVar14._8_4_;
  auVar195._12_4_ = fVar253 * auVar15._12_4_ + auVar303._12_4_ * fVar227 + fVar245 * auVar14._12_4_;
  auVar195._16_4_ = fVar246 * auVar15._16_4_ + auVar303._16_4_ * fVar224 + fVar228 * auVar14._16_4_;
  auVar195._20_4_ = fVar248 * auVar15._20_4_ + auVar303._20_4_ * fVar225 + fVar229 * auVar14._20_4_;
  auVar195._24_4_ = fVar250 * auVar15._24_4_ + auVar303._24_4_ * fVar226 + fVar230 * auVar14._24_4_;
  auVar195._28_4_ = auVar13._28_4_ + fVar227 + fVar203;
  auVar331 = vrcpps_avx(auVar350);
  fVar203 = auVar331._0_4_;
  fVar224 = auVar331._4_4_;
  auVar13._4_4_ = auVar350._4_4_ * fVar224;
  auVar13._0_4_ = auVar350._0_4_ * fVar203;
  fVar225 = auVar331._8_4_;
  auVar13._8_4_ = auVar350._8_4_ * fVar225;
  fVar226 = auVar331._12_4_;
  auVar13._12_4_ = auVar350._12_4_ * fVar226;
  fVar227 = auVar331._16_4_;
  auVar13._16_4_ = auVar350._16_4_ * fVar227;
  fVar228 = auVar331._20_4_;
  auVar13._20_4_ = auVar350._20_4_ * fVar228;
  fVar229 = auVar331._24_4_;
  auVar13._24_4_ = auVar350._24_4_ * fVar229;
  auVar13._28_4_ = auVar350._28_4_;
  auVar348._8_4_ = 0x3f800000;
  auVar348._0_8_ = &DAT_3f8000003f800000;
  auVar348._12_4_ = 0x3f800000;
  auVar348._16_4_ = 0x3f800000;
  auVar348._20_4_ = 0x3f800000;
  auVar348._24_4_ = 0x3f800000;
  auVar348._28_4_ = 0x3f800000;
  auVar13 = vsubps_avx(auVar348,auVar13);
  auVar350 = vrcpps_avx(auVar12);
  fVar203 = fVar203 + fVar203 * auVar13._0_4_;
  fVar224 = fVar224 + fVar224 * auVar13._4_4_;
  fVar225 = fVar225 + fVar225 * auVar13._8_4_;
  fVar226 = fVar226 + fVar226 * auVar13._12_4_;
  fVar227 = fVar227 + fVar227 * auVar13._16_4_;
  fVar228 = fVar228 + fVar228 * auVar13._20_4_;
  fVar229 = fVar229 + fVar229 * auVar13._24_4_;
  fVar259 = auVar350._0_4_;
  fVar279 = auVar350._4_4_;
  auVar402._4_4_ = fVar279 * auVar12._4_4_;
  auVar402._0_4_ = fVar259 * auVar12._0_4_;
  fVar281 = auVar350._8_4_;
  auVar402._8_4_ = fVar281 * auVar12._8_4_;
  fVar283 = auVar350._12_4_;
  auVar402._12_4_ = fVar283 * auVar12._12_4_;
  fVar285 = auVar350._16_4_;
  auVar402._16_4_ = fVar285 * auVar12._16_4_;
  fVar287 = auVar350._20_4_;
  auVar402._20_4_ = fVar287 * auVar12._20_4_;
  fVar289 = auVar350._24_4_;
  auVar402._24_4_ = fVar289 * auVar12._24_4_;
  auVar402._28_4_ = auVar331._28_4_;
  auVar350 = vsubps_avx(auVar348,auVar402);
  fVar259 = fVar259 + fVar259 * auVar350._0_4_;
  fVar279 = fVar279 + fVar279 * auVar350._4_4_;
  fVar281 = fVar281 + fVar281 * auVar350._8_4_;
  fVar283 = fVar283 + fVar283 * auVar350._12_4_;
  fVar285 = fVar285 + fVar285 * auVar350._16_4_;
  fVar287 = fVar287 + fVar287 * auVar350._20_4_;
  fVar289 = fVar289 + fVar289 * auVar350._24_4_;
  auVar350 = vrcpps_avx(auVar110);
  fVar230 = auVar350._0_4_;
  fVar245 = auVar350._4_4_;
  auVar14._4_4_ = fVar245 * auVar110._4_4_;
  auVar14._0_4_ = fVar230 * auVar110._0_4_;
  fVar246 = auVar350._8_4_;
  auVar14._8_4_ = fVar246 * auVar110._8_4_;
  fVar248 = auVar350._12_4_;
  auVar14._12_4_ = fVar248 * auVar110._12_4_;
  fVar250 = auVar350._16_4_;
  auVar14._16_4_ = fVar250 * auVar110._16_4_;
  fVar253 = auVar350._20_4_;
  auVar14._20_4_ = fVar253 * auVar110._20_4_;
  fVar256 = auVar350._24_4_;
  auVar14._24_4_ = fVar256 * auVar110._24_4_;
  auVar14._28_4_ = auVar12._28_4_;
  auVar110 = vsubps_avx(auVar348,auVar14);
  fVar230 = fVar230 + fVar230 * auVar110._0_4_;
  fVar245 = fVar245 + fVar245 * auVar110._4_4_;
  fVar246 = fVar246 + fVar246 * auVar110._8_4_;
  fVar248 = fVar248 + fVar248 * auVar110._12_4_;
  fVar250 = fVar250 + fVar250 * auVar110._16_4_;
  fVar253 = fVar253 + fVar253 * auVar110._20_4_;
  fVar256 = fVar256 + fVar256 * auVar110._24_4_;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *(ulong *)(prim + uVar93 * 7 + 6);
  auVar143 = vpmovsxwd_avx(auVar143);
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar93 * 7 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar209);
  auVar111._16_16_ = auVar209;
  auVar111._0_16_ = auVar143;
  auVar110 = vcvtdq2ps_avx(auVar111);
  auVar110 = vsubps_avx(auVar110,auVar298);
  auVar99._0_4_ = fVar203 * auVar110._0_4_;
  auVar99._4_4_ = fVar224 * auVar110._4_4_;
  auVar99._8_4_ = fVar225 * auVar110._8_4_;
  auVar99._12_4_ = fVar226 * auVar110._12_4_;
  auVar12._16_4_ = fVar227 * auVar110._16_4_;
  auVar12._0_16_ = auVar99;
  auVar12._20_4_ = fVar228 * auVar110._20_4_;
  auVar12._24_4_ = fVar229 * auVar110._24_4_;
  auVar12._28_4_ = auVar110._28_4_;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = *(ulong *)(prim + lVar11 + 6);
  auVar143 = vpmovsxwd_avx(auVar320);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + lVar11 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar102);
  auVar324._16_16_ = auVar209;
  auVar324._0_16_ = auVar143;
  auVar110 = vcvtdq2ps_avx(auVar324);
  auVar110 = vsubps_avx(auVar110,auVar298);
  auVar204._0_4_ = fVar203 * auVar110._0_4_;
  auVar204._4_4_ = fVar224 * auVar110._4_4_;
  auVar204._8_4_ = fVar225 * auVar110._8_4_;
  auVar204._12_4_ = fVar226 * auVar110._12_4_;
  auVar15._16_4_ = fVar227 * auVar110._16_4_;
  auVar15._0_16_ = auVar204;
  auVar15._20_4_ = fVar228 * auVar110._20_4_;
  auVar15._24_4_ = fVar229 * auVar110._24_4_;
  auVar15._28_4_ = auVar331._28_4_ + auVar13._28_4_;
  lVar92 = (ulong)(byte)PVar7 * 0x10;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + lVar92 + 6);
  auVar143 = vpmovsxwd_avx(auVar187);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + lVar92 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar206);
  lVar92 = lVar92 + uVar93 * -2;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + lVar92 + 6);
  auVar320 = vpmovsxwd_avx(auVar3);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + lVar92 + 0xe);
  auVar102 = vpmovsxwd_avx(auVar147);
  auVar299._16_16_ = auVar102;
  auVar299._0_16_ = auVar320;
  auVar110 = vcvtdq2ps_avx(auVar299);
  auVar110 = vsubps_avx(auVar110,auVar158);
  auVar294._0_4_ = fVar259 * auVar110._0_4_;
  auVar294._4_4_ = fVar279 * auVar110._4_4_;
  auVar294._8_4_ = fVar281 * auVar110._8_4_;
  auVar294._12_4_ = fVar283 * auVar110._12_4_;
  auVar331._16_4_ = fVar285 * auVar110._16_4_;
  auVar331._0_16_ = auVar294;
  auVar331._20_4_ = fVar287 * auVar110._20_4_;
  auVar331._24_4_ = fVar289 * auVar110._24_4_;
  auVar331._28_4_ = auVar110._28_4_;
  auVar325._16_16_ = auVar209;
  auVar325._0_16_ = auVar143;
  auVar110 = vcvtdq2ps_avx(auVar325);
  auVar110 = vsubps_avx(auVar110,auVar158);
  auVar142._0_4_ = fVar259 * auVar110._0_4_;
  auVar142._4_4_ = fVar279 * auVar110._4_4_;
  auVar142._8_4_ = fVar281 * auVar110._8_4_;
  auVar142._12_4_ = fVar283 * auVar110._12_4_;
  auVar303._16_4_ = fVar285 * auVar110._16_4_;
  auVar303._0_16_ = auVar142;
  auVar303._20_4_ = fVar287 * auVar110._20_4_;
  auVar303._24_4_ = fVar289 * auVar110._24_4_;
  auVar303._28_4_ = auVar110._28_4_;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = *(ulong *)(prim + uVar90 + uVar93 + 6);
  auVar143 = vpmovsxwd_avx(auVar154);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar90 + uVar93 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar4);
  auVar270._16_16_ = auVar209;
  auVar270._0_16_ = auVar143;
  auVar110 = vcvtdq2ps_avx(auVar270);
  auVar110 = vsubps_avx(auVar110,auVar195);
  auVar262._0_4_ = fVar230 * auVar110._0_4_;
  auVar262._4_4_ = fVar245 * auVar110._4_4_;
  auVar262._8_4_ = fVar246 * auVar110._8_4_;
  auVar262._12_4_ = fVar248 * auVar110._12_4_;
  auVar21._16_4_ = fVar250 * auVar110._16_4_;
  auVar21._0_16_ = auVar262;
  auVar21._20_4_ = fVar253 * auVar110._20_4_;
  auVar21._24_4_ = fVar256 * auVar110._24_4_;
  auVar21._28_4_ = auVar110._28_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar93 * 0x17 + 6);
  auVar143 = vpmovsxwd_avx(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar93 * 0x17 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar6);
  auVar326._16_16_ = auVar209;
  auVar326._0_16_ = auVar143;
  auVar110 = vcvtdq2ps_avx(auVar326);
  auVar110 = vsubps_avx(auVar110,auVar195);
  auVar186._0_4_ = fVar230 * auVar110._0_4_;
  auVar186._4_4_ = fVar245 * auVar110._4_4_;
  auVar186._8_4_ = fVar246 * auVar110._8_4_;
  auVar186._12_4_ = fVar248 * auVar110._12_4_;
  auVar22._16_4_ = fVar250 * auVar110._16_4_;
  auVar22._0_16_ = auVar186;
  auVar22._20_4_ = fVar253 * auVar110._20_4_;
  auVar22._24_4_ = fVar256 * auVar110._24_4_;
  auVar22._28_4_ = auVar110._28_4_;
  auVar143 = vpminsd_avx(auVar12._16_16_,auVar15._16_16_);
  auVar209 = vpminsd_avx(auVar99,auVar204);
  auVar349._16_16_ = auVar143;
  auVar349._0_16_ = auVar209;
  auVar143 = vpminsd_avx(auVar331._16_16_,auVar303._16_16_);
  auVar209 = vpminsd_avx(auVar294,auVar142);
  auVar380._16_16_ = auVar143;
  auVar380._0_16_ = auVar209;
  auVar110 = vmaxps_avx(auVar349,auVar380);
  auVar143 = vpminsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar209 = vpminsd_avx(auVar262,auVar186);
  auVar399._16_16_ = auVar143;
  auVar399._0_16_ = auVar209;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar417._4_4_ = uVar1;
  auVar417._0_4_ = uVar1;
  auVar417._8_4_ = uVar1;
  auVar417._12_4_ = uVar1;
  auVar417._16_4_ = uVar1;
  auVar417._20_4_ = uVar1;
  auVar417._24_4_ = uVar1;
  auVar417._28_4_ = uVar1;
  auVar350 = vmaxps_avx(auVar399,auVar417);
  auVar110 = vmaxps_avx(auVar110,auVar350);
  local_3e0._4_4_ = auVar110._4_4_ * 0.99999964;
  local_3e0._0_4_ = auVar110._0_4_ * 0.99999964;
  local_3e0._8_4_ = auVar110._8_4_ * 0.99999964;
  local_3e0._12_4_ = auVar110._12_4_ * 0.99999964;
  local_3e0._16_4_ = auVar110._16_4_ * 0.99999964;
  local_3e0._20_4_ = auVar110._20_4_ * 0.99999964;
  local_3e0._24_4_ = auVar110._24_4_ * 0.99999964;
  local_3e0._28_4_ = auVar110._28_4_;
  auVar143 = vpmaxsd_avx(auVar12._16_16_,auVar15._16_16_);
  auVar209 = vpmaxsd_avx(auVar99,auVar204);
  auVar112._16_16_ = auVar143;
  auVar112._0_16_ = auVar209;
  auVar143 = vpmaxsd_avx(auVar331._16_16_,auVar303._16_16_);
  auVar209 = vpmaxsd_avx(auVar294,auVar142);
  auVar159._16_16_ = auVar143;
  auVar159._0_16_ = auVar209;
  auVar110 = vminps_avx(auVar112,auVar159);
  auVar143 = vpmaxsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar209 = vpmaxsd_avx(auVar262,auVar186);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar216._4_4_ = uVar1;
  auVar216._0_4_ = uVar1;
  auVar216._8_4_ = uVar1;
  auVar216._12_4_ = uVar1;
  auVar216._16_4_ = uVar1;
  auVar216._20_4_ = uVar1;
  auVar216._24_4_ = uVar1;
  auVar216._28_4_ = uVar1;
  auVar160._16_16_ = auVar143;
  auVar160._0_16_ = auVar209;
  auVar350 = vminps_avx(auVar160,auVar216);
  auVar110 = vminps_avx(auVar110,auVar350);
  auVar350._4_4_ = auVar110._4_4_ * 1.0000004;
  auVar350._0_4_ = auVar110._0_4_ * 1.0000004;
  auVar350._8_4_ = auVar110._8_4_ * 1.0000004;
  auVar350._12_4_ = auVar110._12_4_ * 1.0000004;
  auVar350._16_4_ = auVar110._16_4_ * 1.0000004;
  auVar350._20_4_ = auVar110._20_4_ * 1.0000004;
  auVar350._24_4_ = auVar110._24_4_ * 1.0000004;
  auVar350._28_4_ = auVar110._28_4_;
  auVar110 = vcmpps_avx(local_3e0,auVar350,2);
  auVar143 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar161._16_16_ = auVar143;
  auVar161._0_16_ = auVar143;
  auVar350 = vcvtdq2ps_avx(auVar161);
  auVar350 = vcmpps_avx(_DAT_02020f40,auVar350,1);
  auVar110 = vandps_avx(auVar110,auVar350);
  uVar89 = vmovmskps_avx(auVar110);
  if (uVar89 == 0) {
    return;
  }
  uVar89 = uVar89 & 0xff;
  auVar113._16_16_ = mm_lookupmask_ps._240_16_;
  auVar113._0_16_ = mm_lookupmask_ps._240_16_;
  local_4c0 = vblendps_avx(auVar113,ZEXT832(0) << 0x20,0x80);
  local_9e8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8b0 = prim;
LAB_0117b731:
  local_8a8 = (ulong)uVar89;
  lVar92 = 0;
  if (local_8a8 != 0) {
    for (; (uVar89 >> lVar92 & 1) == 0; lVar92 = lVar92 + 1) {
    }
  }
  local_8a8 = local_8a8 - 1 & local_8a8;
  uVar89 = *(uint *)(local_8b0 + 2);
  uVar8 = *(uint *)(local_8b0 + lVar92 * 4 + 6);
  local_b10 = (ulong)uVar8;
  pGVar9 = (context->scene->geometries).items[uVar89].ptr;
  uVar93 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_b10);
  p_Var10 = pGVar9[1].intersectionFilterN;
  lVar92 = *(long *)&pGVar9[1].time_range.upper;
  auVar143 = *(undefined1 (*) [16])(lVar92 + (long)p_Var10 * uVar93);
  auVar209 = *(undefined1 (*) [16])(lVar92 + (uVar93 + 1) * (long)p_Var10);
  auVar320 = *(undefined1 (*) [16])(lVar92 + (uVar93 + 2) * (long)p_Var10);
  lVar11 = 0;
  if (local_8a8 != 0) {
    for (; (local_8a8 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  auVar102 = *(undefined1 (*) [16])(lVar92 + (uVar93 + 3) * (long)p_Var10);
  if (((local_8a8 != 0) && (uVar93 = local_8a8 - 1 & local_8a8, uVar93 != 0)) &&
     (lVar92 = 0, uVar93 != 0)) {
    for (; (uVar93 >> lVar92 & 1) == 0; lVar92 = lVar92 + 1) {
    }
  }
  auVar187 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar206 = vinsertps_avx(auVar187,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar203 = *(float *)(ray + k * 4 + 0x40);
  auVar358._4_4_ = fVar203;
  auVar358._0_4_ = fVar203;
  auVar358._8_4_ = fVar203;
  auVar358._12_4_ = fVar203;
  fStack_7b0 = fVar203;
  _local_7c0 = auVar358;
  fStack_7ac = fVar203;
  fStack_7a8 = fVar203;
  fStack_7a4 = fVar203;
  fVar224 = *(float *)(ray + k * 4 + 0x50);
  auVar367._4_4_ = fVar224;
  auVar367._0_4_ = fVar224;
  auVar367._8_4_ = fVar224;
  auVar367._12_4_ = fVar224;
  fStack_7d0 = fVar224;
  _local_7e0 = auVar367;
  fStack_7cc = fVar224;
  fStack_7c8 = fVar224;
  fStack_7c4 = fVar224;
  auVar187 = vunpcklps_avx(auVar358,auVar367);
  fVar225 = *(float *)(ray + k * 4 + 0x60);
  auVar378._4_4_ = fVar225;
  auVar378._0_4_ = fVar225;
  auVar378._8_4_ = fVar225;
  auVar378._12_4_ = fVar225;
  fStack_7f0 = fVar225;
  _local_800 = auVar378;
  fStack_7ec = fVar225;
  fStack_7e8 = fVar225;
  fStack_7e4 = fVar225;
  auVar383 = ZEXT3264(_local_800);
  _local_930 = vinsertps_avx(auVar187,auVar378,0x28);
  auVar100._0_4_ = (auVar143._0_4_ + auVar209._0_4_ + auVar320._0_4_ + auVar102._0_4_) * 0.25;
  auVar100._4_4_ = (auVar143._4_4_ + auVar209._4_4_ + auVar320._4_4_ + auVar102._4_4_) * 0.25;
  auVar100._8_4_ = (auVar143._8_4_ + auVar209._8_4_ + auVar320._8_4_ + auVar102._8_4_) * 0.25;
  auVar100._12_4_ = (auVar143._12_4_ + auVar209._12_4_ + auVar320._12_4_ + auVar102._12_4_) * 0.25;
  auVar187 = vsubps_avx(auVar100,auVar206);
  auVar187 = vdpps_avx(auVar187,_local_930,0x7f);
  local_940 = vdpps_avx(_local_930,_local_930,0x7f);
  auVar3 = vrcpss_avx(local_940,local_940);
  fVar226 = auVar187._0_4_ * auVar3._0_4_ * (2.0 - local_940._0_4_ * auVar3._0_4_);
  auVar3 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
  auVar263._0_4_ = auVar206._0_4_ + local_930._0_4_ * auVar3._0_4_;
  auVar263._4_4_ = auVar206._4_4_ + local_930._4_4_ * auVar3._4_4_;
  auVar263._8_4_ = auVar206._8_4_ + local_930._8_4_ * auVar3._8_4_;
  auVar263._12_4_ = auVar206._12_4_ + local_930._12_4_ * auVar3._12_4_;
  auVar187 = vblendps_avx(auVar263,_DAT_01feba10,8);
  _local_a80 = vsubps_avx(auVar143,auVar187);
  _local_a90 = vsubps_avx(auVar320,auVar187);
  auVar223 = ZEXT1664(_local_a90);
  _local_aa0 = vsubps_avx(auVar209,auVar187);
  _local_ab0 = vsubps_avx(auVar102,auVar187);
  auVar143 = vshufps_avx(_local_a80,_local_a80,0);
  register0x00001250 = auVar143;
  _local_1a0 = auVar143;
  auVar143 = vshufps_avx(_local_a80,_local_a80,0x55);
  register0x00001250 = auVar143;
  _local_1c0 = auVar143;
  auVar143 = vshufps_avx(_local_a80,_local_a80,0xaa);
  register0x00001250 = auVar143;
  _local_1e0 = auVar143;
  auVar143 = vshufps_avx(_local_a80,_local_a80,0xff);
  register0x00001290 = auVar143;
  _local_200 = auVar143;
  auVar143 = vshufps_avx(_local_aa0,_local_aa0,0);
  register0x00001290 = auVar143;
  _local_220 = auVar143;
  auVar143 = vshufps_avx(_local_aa0,_local_aa0,0x55);
  register0x00001290 = auVar143;
  _local_240 = auVar143;
  auVar143 = vshufps_avx(_local_aa0,_local_aa0,0xaa);
  register0x00001290 = auVar143;
  _local_260 = auVar143;
  auVar143 = vshufps_avx(_local_aa0,_local_aa0,0xff);
  register0x00001290 = auVar143;
  _local_280 = auVar143;
  auVar143 = vshufps_avx(_local_a90,_local_a90,0);
  register0x00001290 = auVar143;
  _local_2a0 = auVar143;
  auVar143 = vshufps_avx(_local_a90,_local_a90,0x55);
  register0x00001290 = auVar143;
  _local_2c0 = auVar143;
  auVar143 = vshufps_avx(_local_a90,_local_a90,0xaa);
  register0x00001290 = auVar143;
  _local_2e0 = auVar143;
  auVar143 = vshufps_avx(_local_a90,_local_a90,0xff);
  register0x00001290 = auVar143;
  _local_300 = auVar143;
  auVar143 = vshufps_avx(_local_ab0,_local_ab0,0);
  register0x00001290 = auVar143;
  _local_320 = auVar143;
  auVar143 = vshufps_avx(_local_ab0,_local_ab0,0x55);
  register0x00001290 = auVar143;
  _local_340 = auVar143;
  auVar143 = vshufps_avx(_local_ab0,_local_ab0,0xaa);
  register0x00001290 = auVar143;
  _local_360 = auVar143;
  auVar143 = vshufps_avx(_local_ab0,_local_ab0,0xff);
  register0x00001290 = auVar143;
  _local_380 = auVar143;
  auVar143 = ZEXT416((uint)(fVar203 * fVar203 + fVar224 * fVar224 + fVar225 * fVar225));
  auVar143 = vshufps_avx(auVar143,auVar143,0);
  local_3a0._16_16_ = auVar143;
  local_3a0._0_16_ = auVar143;
  fVar203 = *(float *)(ray + k * 4 + 0x30);
  local_8c0 = ZEXT416((uint)fVar226);
  auVar143 = vshufps_avx(ZEXT416((uint)(fVar203 - fVar226)),ZEXT416((uint)(fVar203 - fVar226)),0);
  local_3c0._16_16_ = auVar143;
  local_3c0._0_16_ = auVar143;
  local_710 = vshufps_avx(ZEXT416(uVar89),ZEXT416(uVar89),0);
  local_720 = vshufps_avx(ZEXT416(uVar8),ZEXT416(uVar8),0);
  register0x00001390 = auVar3;
  _local_9a0 = auVar3;
  auVar306 = ZEXT3264(_local_9a0);
  uVar93 = 1;
  uVar90 = 0;
  auVar114._8_4_ = 0x7fffffff;
  auVar114._0_8_ = 0x7fffffff7fffffff;
  auVar114._12_4_ = 0x7fffffff;
  auVar114._16_4_ = 0x7fffffff;
  auVar114._20_4_ = 0x7fffffff;
  auVar114._24_4_ = 0x7fffffff;
  auVar114._28_4_ = 0x7fffffff;
  local_4e0 = vandps_avx(local_3a0,auVar114);
  auVar143 = vsqrtss_avx(local_940,local_940);
  local_b04 = auVar143._0_4_;
  auVar143 = vsqrtss_avx(local_940,local_940);
  local_b08 = auVar143._0_4_;
  auVar334 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar320 = auVar334._0_16_;
    auVar143 = vmovshdup_avx(auVar320);
    fVar224 = auVar143._0_4_ - auVar334._0_4_;
    auVar143 = vshufps_avx(auVar320,auVar320,0);
    local_980._16_16_ = auVar143;
    local_980._0_16_ = auVar143;
    auVar209 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
    local_920._16_16_ = auVar209;
    local_920._0_16_ = auVar209;
    fVar140 = auVar209._0_4_;
    fVar178 = auVar209._4_4_;
    fVar179 = auVar209._8_4_;
    fVar181 = auVar209._12_4_;
    fVar96 = auVar143._0_4_;
    auVar162._0_4_ = fVar96 + fVar140 * 0.0;
    fVar123 = auVar143._4_4_;
    auVar162._4_4_ = fVar123 + fVar178 * 0.14285715;
    fVar126 = auVar143._8_4_;
    auVar162._8_4_ = fVar126 + fVar179 * 0.2857143;
    fVar129 = auVar143._12_4_;
    auVar162._12_4_ = fVar129 + fVar181 * 0.42857146;
    auVar162._16_4_ = fVar96 + fVar140 * 0.5714286;
    auVar162._20_4_ = fVar123 + fVar178 * 0.71428573;
    auVar162._24_4_ = fVar126 + fVar179 * 0.8571429;
    auVar162._28_4_ = fVar129 + fVar181;
    auVar110 = vsubps_avx(auVar244._0_32_,auVar162);
    fVar225 = auVar110._0_4_;
    fVar226 = auVar110._4_4_;
    fVar227 = auVar110._8_4_;
    fVar228 = auVar110._12_4_;
    fVar229 = auVar110._16_4_;
    fVar230 = auVar110._20_4_;
    fVar245 = auVar110._24_4_;
    fVar281 = auVar223._28_4_;
    fVar292 = (float)local_2a0._0_4_ * auVar162._0_4_ + (float)local_220._0_4_ * fVar225;
    fVar307 = (float)local_2a0._4_4_ * auVar162._4_4_ + (float)local_220._4_4_ * fVar226;
    fVar309 = fStack_298 * auVar162._8_4_ + fStack_218 * fVar227;
    fVar311 = fStack_294 * auVar162._12_4_ + fStack_214 * fVar228;
    fVar313 = fStack_290 * auVar162._16_4_ + fStack_210 * fVar229;
    fVar315 = fStack_28c * auVar162._20_4_ + fStack_20c * fVar230;
    fVar317 = fStack_288 * auVar162._24_4_ + fStack_208 * fVar245;
    fVar246 = (float)local_2c0._0_4_ * auVar162._0_4_ + (float)local_240._0_4_ * fVar225;
    fVar248 = (float)local_2c0._4_4_ * auVar162._4_4_ + (float)local_240._4_4_ * fVar226;
    fVar250 = fStack_2b8 * auVar162._8_4_ + fStack_238 * fVar227;
    fVar253 = fStack_2b4 * auVar162._12_4_ + fStack_234 * fVar228;
    fVar256 = fStack_2b0 * auVar162._16_4_ + fStack_230 * fVar229;
    fVar259 = fStack_2ac * auVar162._20_4_ + fStack_22c * fVar230;
    fVar279 = fStack_2a8 * auVar162._24_4_ + fStack_228 * fVar245;
    fVar283 = (float)local_2e0._0_4_ * auVar162._0_4_ + (float)local_260._0_4_ * fVar225;
    fVar285 = (float)local_2e0._4_4_ * auVar162._4_4_ + (float)local_260._4_4_ * fVar226;
    fVar287 = fStack_2d8 * auVar162._8_4_ + fStack_258 * fVar227;
    fVar289 = fStack_2d4 * auVar162._12_4_ + fStack_254 * fVar228;
    fVar251 = fStack_2d0 * auVar162._16_4_ + fStack_250 * fVar229;
    fVar254 = fStack_2cc * auVar162._20_4_ + fStack_24c * fVar230;
    fVar257 = fStack_2c8 * auVar162._24_4_ + fStack_248 * fVar245;
    fVar260 = (float)local_300._0_4_ * auVar162._0_4_ + (float)local_280._0_4_ * fVar225;
    fVar280 = (float)local_300._4_4_ * auVar162._4_4_ + (float)local_280._4_4_ * fVar226;
    fVar282 = fStack_2f8 * auVar162._8_4_ + fStack_278 * fVar227;
    fVar284 = fStack_2f4 * auVar162._12_4_ + fStack_274 * fVar228;
    fVar286 = fStack_2f0 * auVar162._16_4_ + fStack_270 * fVar229;
    fVar288 = fStack_2ec * auVar162._20_4_ + fStack_26c * fVar230;
    fVar290 = fStack_2e8 * auVar162._24_4_ + fStack_268 * fVar245;
    fVar384 = auVar383._28_4_;
    fVar416 = fVar384 + fStack_224;
    fVar395 = fStack_204 + fVar384;
    auVar363._0_4_ =
         ((float)local_220._0_4_ * auVar162._0_4_ + fVar225 * (float)local_1a0._0_4_) * fVar225 +
         auVar162._0_4_ * fVar292;
    auVar363._4_4_ =
         ((float)local_220._4_4_ * auVar162._4_4_ + fVar226 * (float)local_1a0._4_4_) * fVar226 +
         auVar162._4_4_ * fVar307;
    auVar363._8_4_ =
         (fStack_218 * auVar162._8_4_ + fVar227 * fStack_198) * fVar227 + auVar162._8_4_ * fVar309;
    auVar363._12_4_ =
         (fStack_214 * auVar162._12_4_ + fVar228 * fStack_194) * fVar228 + auVar162._12_4_ * fVar311
    ;
    auVar363._16_4_ =
         (fStack_210 * auVar162._16_4_ + fVar229 * fStack_190) * fVar229 + auVar162._16_4_ * fVar313
    ;
    auVar363._20_4_ =
         (fStack_20c * auVar162._20_4_ + fVar230 * fStack_18c) * fVar230 + auVar162._20_4_ * fVar315
    ;
    auVar363._24_4_ =
         (fStack_208 * auVar162._24_4_ + fVar245 * fStack_188) * fVar245 + auVar162._24_4_ * fVar317
    ;
    auVar363._28_4_ = fStack_2e4 + fVar384;
    auVar369._0_4_ =
         fVar225 * ((float)local_240._0_4_ * auVar162._0_4_ + fVar225 * (float)local_1c0._0_4_) +
         auVar162._0_4_ * fVar246;
    auVar369._4_4_ =
         fVar226 * ((float)local_240._4_4_ * auVar162._4_4_ + fVar226 * (float)local_1c0._4_4_) +
         auVar162._4_4_ * fVar248;
    auVar369._8_4_ =
         fVar227 * (fStack_238 * auVar162._8_4_ + fVar227 * fStack_1b8) + auVar162._8_4_ * fVar250;
    auVar369._12_4_ =
         fVar228 * (fStack_234 * auVar162._12_4_ + fVar228 * fStack_1b4) + auVar162._12_4_ * fVar253
    ;
    auVar369._16_4_ =
         fVar229 * (fStack_230 * auVar162._16_4_ + fVar229 * fStack_1b0) + auVar162._16_4_ * fVar256
    ;
    auVar369._20_4_ =
         fVar230 * (fStack_22c * auVar162._20_4_ + fVar230 * fStack_1ac) + auVar162._20_4_ * fVar259
    ;
    auVar369._24_4_ =
         fVar245 * (fStack_228 * auVar162._24_4_ + fVar245 * fStack_1a8) + auVar162._24_4_ * fVar279
    ;
    auVar369._28_4_ = fVar281 + auVar334._28_4_ + fVar384;
    auVar381._0_4_ =
         fVar225 * ((float)local_260._0_4_ * auVar162._0_4_ + fVar225 * (float)local_1e0._0_4_) +
         auVar162._0_4_ * fVar283;
    auVar381._4_4_ =
         fVar226 * ((float)local_260._4_4_ * auVar162._4_4_ + fVar226 * (float)local_1e0._4_4_) +
         auVar162._4_4_ * fVar285;
    auVar381._8_4_ =
         fVar227 * (fStack_258 * auVar162._8_4_ + fVar227 * fStack_1d8) + auVar162._8_4_ * fVar287;
    auVar381._12_4_ =
         fVar228 * (fStack_254 * auVar162._12_4_ + fVar228 * fStack_1d4) + auVar162._12_4_ * fVar289
    ;
    auVar381._16_4_ =
         fVar229 * (fStack_250 * auVar162._16_4_ + fVar229 * fStack_1d0) + auVar162._16_4_ * fVar251
    ;
    auVar381._20_4_ =
         fVar230 * (fStack_24c * auVar162._20_4_ + fVar230 * fStack_1cc) + auVar162._20_4_ * fVar254
    ;
    auVar381._24_4_ =
         fVar245 * (fStack_248 * auVar162._24_4_ + fVar245 * fStack_1c8) + auVar162._24_4_ * fVar257
    ;
    auVar381._28_4_ = fStack_2c4 + fVar384;
    auVar327._0_4_ =
         auVar162._0_4_ * fVar260 +
         fVar225 * ((float)local_280._0_4_ * auVar162._0_4_ + fVar225 * (float)local_200._0_4_);
    auVar327._4_4_ =
         auVar162._4_4_ * fVar280 +
         fVar226 * ((float)local_280._4_4_ * auVar162._4_4_ + fVar226 * (float)local_200._4_4_);
    auVar327._8_4_ =
         auVar162._8_4_ * fVar282 + fVar227 * (fStack_278 * auVar162._8_4_ + fVar227 * fStack_1f8);
    auVar327._12_4_ =
         auVar162._12_4_ * fVar284 + fVar228 * (fStack_274 * auVar162._12_4_ + fVar228 * fStack_1f4)
    ;
    auVar327._16_4_ =
         auVar162._16_4_ * fVar286 + fVar229 * (fStack_270 * auVar162._16_4_ + fVar229 * fStack_1f0)
    ;
    auVar327._20_4_ =
         auVar162._20_4_ * fVar288 + fVar230 * (fStack_26c * auVar162._20_4_ + fVar230 * fStack_1ec)
    ;
    auVar327._24_4_ =
         auVar162._24_4_ * fVar290 + fVar245 * (fStack_268 * auVar162._24_4_ + fVar245 * fStack_1e8)
    ;
    auVar327._28_4_ = fStack_2c4 + fStack_2a4;
    auVar418._0_4_ =
         (auVar162._0_4_ * (float)local_320._0_4_ + (float)local_2a0._0_4_ * fVar225) *
         auVar162._0_4_ + fVar225 * fVar292;
    auVar418._4_4_ =
         (auVar162._4_4_ * (float)local_320._4_4_ + (float)local_2a0._4_4_ * fVar226) *
         auVar162._4_4_ + fVar226 * fVar307;
    auVar418._8_4_ =
         (auVar162._8_4_ * fStack_318 + fStack_298 * fVar227) * auVar162._8_4_ + fVar227 * fVar309;
    auVar418._12_4_ =
         (auVar162._12_4_ * fStack_314 + fStack_294 * fVar228) * auVar162._12_4_ + fVar228 * fVar311
    ;
    auVar418._16_4_ =
         (auVar162._16_4_ * fStack_310 + fStack_290 * fVar229) * auVar162._16_4_ + fVar229 * fVar313
    ;
    auVar418._20_4_ =
         (auVar162._20_4_ * fStack_30c + fStack_28c * fVar230) * auVar162._20_4_ + fVar230 * fVar315
    ;
    auVar418._24_4_ =
         (auVar162._24_4_ * fStack_308 + fStack_288 * fVar245) * auVar162._24_4_ + fVar245 * fVar317
    ;
    auVar418._28_4_ = fStack_2c4 + fVar281 + auVar306._28_4_;
    auVar217._0_4_ =
         (auVar162._0_4_ * (float)local_340._0_4_ + (float)local_2c0._0_4_ * fVar225) *
         auVar162._0_4_ + fVar225 * fVar246;
    auVar217._4_4_ =
         (auVar162._4_4_ * (float)local_340._4_4_ + (float)local_2c0._4_4_ * fVar226) *
         auVar162._4_4_ + fVar226 * fVar248;
    auVar217._8_4_ =
         (auVar162._8_4_ * fStack_338 + fStack_2b8 * fVar227) * auVar162._8_4_ + fVar227 * fVar250;
    auVar217._12_4_ =
         (auVar162._12_4_ * fStack_334 + fStack_2b4 * fVar228) * auVar162._12_4_ + fVar228 * fVar253
    ;
    auVar217._16_4_ =
         (auVar162._16_4_ * fStack_330 + fStack_2b0 * fVar229) * auVar162._16_4_ + fVar229 * fVar256
    ;
    auVar217._20_4_ =
         (auVar162._20_4_ * fStack_32c + fStack_2ac * fVar230) * auVar162._20_4_ + fVar230 * fVar259
    ;
    auVar217._24_4_ =
         (auVar162._24_4_ * fStack_328 + fStack_2a8 * fVar245) * auVar162._24_4_ + fVar245 * fVar279
    ;
    auVar217._28_4_ = fStack_2c4 + auVar244._28_4_ + fVar281;
    auVar240._0_4_ =
         auVar162._0_4_ *
         (auVar162._0_4_ * (float)local_360._0_4_ + (float)local_2e0._0_4_ * fVar225) +
         fVar225 * fVar283;
    auVar240._4_4_ =
         auVar162._4_4_ *
         (auVar162._4_4_ * (float)local_360._4_4_ + (float)local_2e0._4_4_ * fVar226) +
         fVar226 * fVar285;
    auVar240._8_4_ =
         auVar162._8_4_ * (auVar162._8_4_ * fStack_358 + fStack_2d8 * fVar227) + fVar227 * fVar287;
    auVar240._12_4_ =
         auVar162._12_4_ * (auVar162._12_4_ * fStack_354 + fStack_2d4 * fVar228) + fVar228 * fVar289
    ;
    auVar240._16_4_ =
         auVar162._16_4_ * (auVar162._16_4_ * fStack_350 + fStack_2d0 * fVar229) + fVar229 * fVar251
    ;
    auVar240._20_4_ =
         auVar162._20_4_ * (auVar162._20_4_ * fStack_34c + fStack_2cc * fVar230) + fVar230 * fVar254
    ;
    auVar240._24_4_ =
         auVar162._24_4_ * (auVar162._24_4_ * fStack_348 + fStack_2c8 * fVar245) + fVar245 * fVar257
    ;
    auVar240._28_4_ = fVar395 + auVar244._28_4_ + 1.0;
    auVar271._0_4_ =
         (auVar162._0_4_ * (float)local_380._0_4_ + (float)local_300._0_4_ * fVar225) *
         auVar162._0_4_ + fVar225 * fVar260;
    auVar271._4_4_ =
         (auVar162._4_4_ * (float)local_380._4_4_ + (float)local_300._4_4_ * fVar226) *
         auVar162._4_4_ + fVar226 * fVar280;
    auVar271._8_4_ =
         (auVar162._8_4_ * fStack_378 + fStack_2f8 * fVar227) * auVar162._8_4_ + fVar227 * fVar282;
    auVar271._12_4_ =
         (auVar162._12_4_ * fStack_374 + fStack_2f4 * fVar228) * auVar162._12_4_ + fVar228 * fVar284
    ;
    auVar271._16_4_ =
         (auVar162._16_4_ * fStack_370 + fStack_2f0 * fVar229) * auVar162._16_4_ + fVar229 * fVar286
    ;
    auVar271._20_4_ =
         (auVar162._20_4_ * fStack_36c + fStack_2ec * fVar230) * auVar162._20_4_ + fVar230 * fVar288
    ;
    auVar271._24_4_ =
         (auVar162._24_4_ * fStack_368 + fStack_2e8 * fVar245) * auVar162._24_4_ + fVar245 * fVar290
    ;
    auVar271._28_4_ = fVar416 + fVar384 + 1.0;
    fVar97 = auVar363._0_4_ * fVar225 + auVar418._0_4_ * auVar162._0_4_;
    fVar124 = auVar363._4_4_ * fVar226 + auVar418._4_4_ * auVar162._4_4_;
    fVar127 = auVar363._8_4_ * fVar227 + auVar418._8_4_ * auVar162._8_4_;
    fVar130 = auVar363._12_4_ * fVar228 + auVar418._12_4_ * auVar162._12_4_;
    fVar132 = auVar363._16_4_ * fVar229 + auVar418._16_4_ * auVar162._16_4_;
    fVar134 = auVar363._20_4_ * fVar230 + auVar418._20_4_ * auVar162._20_4_;
    fVar136 = auVar363._24_4_ * fVar245 + auVar418._24_4_ * auVar162._24_4_;
    fVar138 = fVar416 + fStack_2c4;
    fVar98 = auVar369._0_4_ * fVar225 + auVar162._0_4_ * auVar217._0_4_;
    fVar125 = auVar369._4_4_ * fVar226 + auVar162._4_4_ * auVar217._4_4_;
    fVar128 = auVar369._8_4_ * fVar227 + auVar162._8_4_ * auVar217._8_4_;
    fVar131 = auVar369._12_4_ * fVar228 + auVar162._12_4_ * auVar217._12_4_;
    fVar133 = auVar369._16_4_ * fVar229 + auVar162._16_4_ * auVar217._16_4_;
    fVar135 = auVar369._20_4_ * fVar230 + auVar162._20_4_ * auVar217._20_4_;
    fVar137 = auVar369._24_4_ * fVar245 + auVar162._24_4_ * auVar217._24_4_;
    fVar139 = fStack_2c4 + fVar395;
    local_540._0_4_ = auVar381._0_4_ * fVar225 + auVar162._0_4_ * auVar240._0_4_;
    local_540._4_4_ = auVar381._4_4_ * fVar226 + auVar162._4_4_ * auVar240._4_4_;
    local_540._8_4_ = auVar381._8_4_ * fVar227 + auVar162._8_4_ * auVar240._8_4_;
    local_540._12_4_ = auVar381._12_4_ * fVar228 + auVar162._12_4_ * auVar240._12_4_;
    local_540._16_4_ = auVar381._16_4_ * fVar229 + auVar162._16_4_ * auVar240._16_4_;
    local_540._20_4_ = auVar381._20_4_ * fVar230 + auVar162._20_4_ * auVar240._20_4_;
    local_540._24_4_ = auVar381._24_4_ * fVar245 + auVar162._24_4_ * auVar240._24_4_;
    local_540._28_4_ = fVar395 + fStack_2c4;
    local_740._0_4_ = fVar225 * auVar327._0_4_ + auVar162._0_4_ * auVar271._0_4_;
    local_740._4_4_ = fVar226 * auVar327._4_4_ + auVar162._4_4_ * auVar271._4_4_;
    local_740._8_4_ = fVar227 * auVar327._8_4_ + auVar162._8_4_ * auVar271._8_4_;
    local_740._12_4_ = fVar228 * auVar327._12_4_ + auVar162._12_4_ * auVar271._12_4_;
    local_740._16_4_ = fVar229 * auVar327._16_4_ + auVar162._16_4_ * auVar271._16_4_;
    local_740._20_4_ = fVar230 * auVar327._20_4_ + auVar162._20_4_ * auVar271._20_4_;
    local_740._24_4_ = fVar245 * auVar327._24_4_ + auVar162._24_4_ * auVar271._24_4_;
    local_740._28_4_ = auVar110._28_4_ + auVar162._28_4_;
    auVar12 = vsubps_avx(auVar418,auVar363);
    auVar110 = vsubps_avx(auVar217,auVar369);
    auVar350 = vsubps_avx(auVar240,auVar381);
    auVar331 = vsubps_avx(auVar271,auVar327);
    auVar143 = vshufps_avx(ZEXT416((uint)(fVar224 * 0.04761905)),
                           ZEXT416((uint)(fVar224 * 0.04761905)),0);
    fVar251 = auVar143._0_4_;
    fVar319 = fVar251 * auVar12._0_4_ * 3.0;
    fVar254 = auVar143._4_4_;
    fVar335 = fVar254 * auVar12._4_4_ * 3.0;
    local_9c0._4_4_ = fVar335;
    local_9c0._0_4_ = fVar319;
    fVar286 = auVar143._8_4_;
    fVar336 = fVar286 * auVar12._8_4_ * 3.0;
    fStack_9b8 = fVar336;
    fVar279 = auVar143._12_4_;
    fVar338 = fVar279 * auVar12._12_4_ * 3.0;
    fStack_9b4 = fVar338;
    fVar340 = fVar251 * auVar12._16_4_ * 3.0;
    unique0x1000a584 = fVar340;
    fVar342 = fVar254 * auVar12._20_4_ * 3.0;
    unique0x1000a588 = fVar342;
    fVar344 = fVar286 * auVar12._24_4_ * 3.0;
    unique0x1000a58c = fVar344;
    unique0x1000a590 = auVar327._28_4_;
    fVar385 = fVar251 * auVar110._0_4_ * 3.0;
    fVar389 = fVar254 * auVar110._4_4_ * 3.0;
    local_b00._4_4_ = fVar389;
    local_b00._0_4_ = fVar385;
    fVar390 = fVar286 * auVar110._8_4_ * 3.0;
    local_b00._8_4_ = fVar390;
    fVar391 = fVar279 * auVar110._12_4_ * 3.0;
    local_b00._12_4_ = fVar391;
    fVar392 = fVar251 * auVar110._16_4_ * 3.0;
    local_b00._16_4_ = fVar392;
    fVar393 = fVar254 * auVar110._20_4_ * 3.0;
    local_b00._20_4_ = fVar393;
    fVar394 = fVar286 * auVar110._24_4_ * 3.0;
    local_b00._24_4_ = fVar394;
    local_b00._28_4_ = fVar395;
    fVar396 = fVar251 * auVar350._0_4_ * 3.0;
    fVar403 = fVar254 * auVar350._4_4_ * 3.0;
    auVar23._4_4_ = fVar403;
    auVar23._0_4_ = fVar396;
    fVar406 = fVar286 * auVar350._8_4_ * 3.0;
    auVar23._8_4_ = fVar406;
    fVar408 = fVar279 * auVar350._12_4_ * 3.0;
    auVar23._12_4_ = fVar408;
    fVar410 = fVar251 * auVar350._16_4_ * 3.0;
    auVar23._16_4_ = fVar410;
    fVar412 = fVar254 * auVar350._20_4_ * 3.0;
    auVar23._20_4_ = fVar412;
    fVar414 = fVar286 * auVar350._24_4_ * 3.0;
    auVar23._24_4_ = fVar414;
    auVar23._28_4_ = fVar416;
    fVar230 = fVar251 * auVar331._0_4_ * 3.0;
    fVar245 = fVar254 * auVar331._4_4_ * 3.0;
    auVar24._4_4_ = fVar245;
    auVar24._0_4_ = fVar230;
    fVar259 = fVar286 * auVar331._8_4_ * 3.0;
    auVar24._8_4_ = fVar259;
    fVar279 = fVar279 * auVar331._12_4_ * 3.0;
    auVar24._12_4_ = fVar279;
    fVar251 = fVar251 * auVar331._16_4_ * 3.0;
    auVar24._16_4_ = fVar251;
    fVar254 = fVar254 * auVar331._20_4_ * 3.0;
    auVar24._20_4_ = fVar254;
    fVar286 = fVar286 * auVar331._24_4_ * 3.0;
    auVar24._24_4_ = fVar286;
    auVar24._28_4_ = auVar12._28_4_;
    auVar81._4_4_ = fVar125;
    auVar81._0_4_ = fVar98;
    auVar81._8_4_ = fVar128;
    auVar81._12_4_ = fVar131;
    auVar81._16_4_ = fVar133;
    auVar81._20_4_ = fVar135;
    auVar81._24_4_ = fVar137;
    auVar81._28_4_ = fVar139;
    auVar110 = vperm2f128_avx(auVar81,auVar81,1);
    auVar110 = vshufps_avx(auVar110,auVar81,0x30);
    auVar331 = vshufps_avx(auVar81,auVar110,0x29);
    auVar110 = vperm2f128_avx(local_540,local_540,1);
    auVar110 = vshufps_avx(auVar110,local_540,0x30);
    local_a40 = vshufps_avx(local_540,auVar110,0x29);
    auVar350 = vsubps_avx(local_740,auVar24);
    auVar110 = vperm2f128_avx(auVar350,auVar350,1);
    auVar110 = vshufps_avx(auVar110,auVar350,0x30);
    local_760 = vshufps_avx(auVar350,auVar110,0x29);
    local_580 = vsubps_avx(auVar331,auVar81);
    local_560 = vsubps_avx(local_a40,local_540);
    fVar225 = local_580._0_4_;
    fVar246 = local_580._4_4_;
    auVar25._4_4_ = fVar403 * fVar246;
    auVar25._0_4_ = fVar396 * fVar225;
    fVar281 = local_580._8_4_;
    auVar25._8_4_ = fVar406 * fVar281;
    fVar257 = local_580._12_4_;
    auVar25._12_4_ = fVar408 * fVar257;
    fVar290 = local_580._16_4_;
    auVar25._16_4_ = fVar410 * fVar290;
    fVar317 = local_580._20_4_;
    auVar25._20_4_ = fVar412 * fVar317;
    fVar16 = local_580._24_4_;
    auVar25._24_4_ = fVar414 * fVar16;
    auVar25._28_4_ = auVar350._28_4_;
    fVar226 = local_560._0_4_;
    fVar248 = local_560._4_4_;
    auVar26._4_4_ = fVar389 * fVar248;
    auVar26._0_4_ = fVar385 * fVar226;
    fVar283 = local_560._8_4_;
    auVar26._8_4_ = fVar390 * fVar283;
    fVar260 = local_560._12_4_;
    auVar26._12_4_ = fVar391 * fVar260;
    fVar292 = local_560._16_4_;
    auVar26._16_4_ = fVar392 * fVar292;
    fVar384 = local_560._20_4_;
    auVar26._20_4_ = fVar393 * fVar384;
    fVar17 = local_560._24_4_;
    auVar26._24_4_ = fVar394 * fVar17;
    auVar26._28_4_ = auVar110._28_4_;
    auVar402 = vsubps_avx(auVar26,auVar25);
    auVar79._4_4_ = fVar124;
    auVar79._0_4_ = fVar97;
    auVar79._8_4_ = fVar127;
    auVar79._12_4_ = fVar130;
    auVar79._16_4_ = fVar132;
    auVar79._20_4_ = fVar134;
    auVar79._24_4_ = fVar136;
    auVar79._28_4_ = fVar138;
    auVar110 = vperm2f128_avx(auVar79,auVar79,1);
    auVar110 = vshufps_avx(auVar110,auVar79,0x30);
    auVar13 = vshufps_avx(auVar79,auVar110,0x29);
    local_5a0 = vsubps_avx(auVar13,auVar79);
    auVar27._4_4_ = fVar248 * fVar335;
    auVar27._0_4_ = fVar226 * fVar319;
    auVar27._8_4_ = fVar283 * fVar336;
    auVar27._12_4_ = fVar260 * fVar338;
    auVar27._16_4_ = fVar292 * fVar340;
    auVar27._20_4_ = fVar384 * fVar342;
    auVar27._24_4_ = fVar17 * fVar344;
    auVar27._28_4_ = auVar110._28_4_;
    fVar227 = local_5a0._0_4_;
    fVar250 = local_5a0._4_4_;
    auVar28._4_4_ = fVar403 * fVar250;
    auVar28._0_4_ = fVar396 * fVar227;
    fVar285 = local_5a0._8_4_;
    auVar28._8_4_ = fVar406 * fVar285;
    fVar280 = local_5a0._12_4_;
    auVar28._12_4_ = fVar408 * fVar280;
    fVar307 = local_5a0._16_4_;
    auVar28._16_4_ = fVar410 * fVar307;
    fVar416 = local_5a0._20_4_;
    auVar28._20_4_ = fVar412 * fVar416;
    fVar18 = local_5a0._24_4_;
    auVar28._24_4_ = fVar414 * fVar18;
    auVar28._28_4_ = fVar138;
    auVar14 = vsubps_avx(auVar28,auVar27);
    auVar29._4_4_ = fVar389 * fVar250;
    auVar29._0_4_ = fVar385 * fVar227;
    auVar29._8_4_ = fVar390 * fVar285;
    auVar29._12_4_ = fVar391 * fVar280;
    auVar29._16_4_ = fVar392 * fVar307;
    auVar29._20_4_ = fVar393 * fVar416;
    auVar29._24_4_ = fVar394 * fVar18;
    auVar29._28_4_ = fVar138;
    auVar30._4_4_ = fVar246 * fVar335;
    auVar30._0_4_ = fVar225 * fVar319;
    auVar30._8_4_ = fVar281 * fVar336;
    auVar30._12_4_ = fVar257 * fVar338;
    auVar30._16_4_ = fVar290 * fVar340;
    auVar30._20_4_ = fVar317 * fVar342;
    auVar30._24_4_ = fVar16 * fVar344;
    auVar30._28_4_ = auVar369._28_4_;
    auVar15 = vsubps_avx(auVar30,auVar29);
    fVar224 = auVar15._28_4_;
    fVar288 = auVar14._28_4_ + fVar224;
    auVar218._0_4_ = fVar227 * fVar227 + fVar225 * fVar225 + fVar226 * fVar226;
    auVar218._4_4_ = fVar250 * fVar250 + fVar246 * fVar246 + fVar248 * fVar248;
    auVar218._8_4_ = fVar285 * fVar285 + fVar281 * fVar281 + fVar283 * fVar283;
    auVar218._12_4_ = fVar280 * fVar280 + fVar257 * fVar257 + fVar260 * fVar260;
    auVar218._16_4_ = fVar307 * fVar307 + fVar290 * fVar290 + fVar292 * fVar292;
    auVar218._20_4_ = fVar416 * fVar416 + fVar317 * fVar317 + fVar384 * fVar384;
    auVar218._24_4_ = fVar18 * fVar18 + fVar16 * fVar16 + fVar17 * fVar17;
    auVar218._28_4_ = fVar224 + fVar224 + fVar288;
    auVar110 = vrcpps_avx(auVar218);
    fVar313 = auVar110._0_4_;
    fVar315 = auVar110._4_4_;
    auVar31._4_4_ = fVar315 * auVar218._4_4_;
    auVar31._0_4_ = fVar313 * auVar218._0_4_;
    fVar247 = auVar110._8_4_;
    auVar31._8_4_ = fVar247 * auVar218._8_4_;
    fVar249 = auVar110._12_4_;
    auVar31._12_4_ = fVar249 * auVar218._12_4_;
    fVar252 = auVar110._16_4_;
    auVar31._16_4_ = fVar252 * auVar218._16_4_;
    fVar255 = auVar110._20_4_;
    auVar31._20_4_ = fVar255 * auVar218._20_4_;
    fVar258 = auVar110._24_4_;
    auVar31._24_4_ = fVar258 * auVar218._24_4_;
    auVar31._28_4_ = auVar369._28_4_;
    auVar115._8_4_ = 0x3f800000;
    auVar115._0_8_ = &DAT_3f8000003f800000;
    auVar115._12_4_ = 0x3f800000;
    auVar115._16_4_ = 0x3f800000;
    auVar115._20_4_ = 0x3f800000;
    auVar115._24_4_ = 0x3f800000;
    auVar115._28_4_ = 0x3f800000;
    auVar303 = vsubps_avx(auVar115,auVar31);
    fVar313 = auVar303._0_4_ * fVar313 + fVar313;
    fVar315 = auVar303._4_4_ * fVar315 + fVar315;
    fVar247 = auVar303._8_4_ * fVar247 + fVar247;
    fVar249 = auVar303._12_4_ * fVar249 + fVar249;
    fVar252 = auVar303._16_4_ * fVar252 + fVar252;
    fVar255 = auVar303._20_4_ * fVar255 + fVar255;
    fVar258 = auVar303._24_4_ * fVar258 + fVar258;
    auVar350 = vperm2f128_avx(local_b00,local_b00,1);
    auVar350 = vshufps_avx(auVar350,local_b00,0x30);
    local_960 = vshufps_avx(local_b00,auVar350,0x29);
    auVar350 = vperm2f128_avx(auVar23,auVar23,1);
    auVar350 = vshufps_avx(auVar350,auVar23,0x30);
    local_900 = vshufps_avx(auVar23,auVar350,0x29);
    fVar397 = local_900._0_4_;
    fVar404 = local_900._4_4_;
    auVar32._4_4_ = fVar404 * fVar246;
    auVar32._0_4_ = fVar397 * fVar225;
    fVar407 = local_900._8_4_;
    auVar32._8_4_ = fVar407 * fVar281;
    fVar409 = local_900._12_4_;
    auVar32._12_4_ = fVar409 * fVar257;
    fVar411 = local_900._16_4_;
    auVar32._16_4_ = fVar411 * fVar290;
    fVar413 = local_900._20_4_;
    auVar32._20_4_ = fVar413 * fVar317;
    fVar415 = local_900._24_4_;
    auVar32._24_4_ = fVar415 * fVar16;
    auVar32._28_4_ = auVar350._28_4_;
    fVar228 = local_960._0_4_;
    fVar253 = local_960._4_4_;
    auVar33._4_4_ = fVar248 * fVar253;
    auVar33._0_4_ = fVar226 * fVar228;
    fVar287 = local_960._8_4_;
    auVar33._8_4_ = fVar283 * fVar287;
    fVar282 = local_960._12_4_;
    auVar33._12_4_ = fVar260 * fVar282;
    fVar309 = local_960._16_4_;
    auVar33._16_4_ = fVar292 * fVar309;
    fVar291 = local_960._20_4_;
    auVar33._20_4_ = fVar384 * fVar291;
    fVar19 = local_960._24_4_;
    auVar33._24_4_ = fVar17 * fVar19;
    auVar33._28_4_ = fVar395;
    auVar21 = vsubps_avx(auVar33,auVar32);
    auVar350 = vperm2f128_avx(_local_9c0,_local_9c0,1);
    auVar350 = vshufps_avx(auVar350,_local_9c0,0x30);
    local_a20 = vshufps_avx(_local_9c0,auVar350,0x29);
    fVar229 = local_a20._0_4_;
    fVar256 = local_a20._4_4_;
    auVar34._4_4_ = fVar248 * fVar256;
    auVar34._0_4_ = fVar226 * fVar229;
    fVar289 = local_a20._8_4_;
    auVar34._8_4_ = fVar283 * fVar289;
    fVar284 = local_a20._12_4_;
    auVar34._12_4_ = fVar260 * fVar284;
    fVar311 = local_a20._16_4_;
    auVar34._16_4_ = fVar292 * fVar311;
    fVar395 = local_a20._20_4_;
    auVar34._20_4_ = fVar384 * fVar395;
    fVar20 = local_a20._24_4_;
    auVar34._24_4_ = fVar17 * fVar20;
    auVar34._28_4_ = auVar350._28_4_;
    auVar35._4_4_ = fVar404 * fVar250;
    auVar35._0_4_ = fVar397 * fVar227;
    auVar35._8_4_ = fVar407 * fVar285;
    auVar35._12_4_ = fVar409 * fVar280;
    auVar35._16_4_ = fVar411 * fVar307;
    auVar35._20_4_ = fVar413 * fVar416;
    uVar8 = local_900._28_4_;
    auVar35._24_4_ = fVar415 * fVar18;
    auVar35._28_4_ = uVar8;
    auVar22 = vsubps_avx(auVar35,auVar34);
    auVar36._4_4_ = fVar250 * fVar253;
    auVar36._0_4_ = fVar227 * fVar228;
    auVar36._8_4_ = fVar285 * fVar287;
    auVar36._12_4_ = fVar280 * fVar282;
    auVar36._16_4_ = fVar307 * fVar309;
    auVar36._20_4_ = fVar416 * fVar291;
    auVar36._24_4_ = fVar18 * fVar19;
    auVar36._28_4_ = uVar8;
    auVar37._4_4_ = fVar246 * fVar256;
    auVar37._0_4_ = fVar225 * fVar229;
    auVar37._8_4_ = fVar281 * fVar289;
    auVar37._12_4_ = fVar257 * fVar284;
    auVar37._16_4_ = fVar290 * fVar311;
    auVar37._20_4_ = fVar317 * fVar395;
    auVar37._24_4_ = fVar16 * fVar20;
    auVar37._28_4_ = auVar418._28_4_;
    auVar350 = vsubps_avx(auVar37,auVar36);
    fVar224 = auVar350._28_4_;
    auVar38._4_4_ =
         (auVar402._4_4_ * auVar402._4_4_ +
         auVar14._4_4_ * auVar14._4_4_ + auVar15._4_4_ * auVar15._4_4_) * fVar315;
    auVar38._0_4_ =
         (auVar402._0_4_ * auVar402._0_4_ +
         auVar14._0_4_ * auVar14._0_4_ + auVar15._0_4_ * auVar15._0_4_) * fVar313;
    auVar38._8_4_ =
         (auVar402._8_4_ * auVar402._8_4_ +
         auVar14._8_4_ * auVar14._8_4_ + auVar15._8_4_ * auVar15._8_4_) * fVar247;
    auVar38._12_4_ =
         (auVar402._12_4_ * auVar402._12_4_ +
         auVar14._12_4_ * auVar14._12_4_ + auVar15._12_4_ * auVar15._12_4_) * fVar249;
    auVar38._16_4_ =
         (auVar402._16_4_ * auVar402._16_4_ +
         auVar14._16_4_ * auVar14._16_4_ + auVar15._16_4_ * auVar15._16_4_) * fVar252;
    auVar38._20_4_ =
         (auVar402._20_4_ * auVar402._20_4_ +
         auVar14._20_4_ * auVar14._20_4_ + auVar15._20_4_ * auVar15._20_4_) * fVar255;
    auVar38._24_4_ =
         (auVar402._24_4_ * auVar402._24_4_ +
         auVar14._24_4_ * auVar14._24_4_ + auVar15._24_4_ * auVar15._24_4_) * fVar258;
    auVar38._28_4_ = auVar402._28_4_ + fVar288;
    auVar39._4_4_ =
         (auVar21._4_4_ * auVar21._4_4_ +
         auVar22._4_4_ * auVar22._4_4_ + auVar350._4_4_ * auVar350._4_4_) * fVar315;
    auVar39._0_4_ =
         (auVar21._0_4_ * auVar21._0_4_ +
         auVar22._0_4_ * auVar22._0_4_ + auVar350._0_4_ * auVar350._0_4_) * fVar313;
    auVar39._8_4_ =
         (auVar21._8_4_ * auVar21._8_4_ +
         auVar22._8_4_ * auVar22._8_4_ + auVar350._8_4_ * auVar350._8_4_) * fVar247;
    auVar39._12_4_ =
         (auVar21._12_4_ * auVar21._12_4_ +
         auVar22._12_4_ * auVar22._12_4_ + auVar350._12_4_ * auVar350._12_4_) * fVar249;
    auVar39._16_4_ =
         (auVar21._16_4_ * auVar21._16_4_ +
         auVar22._16_4_ * auVar22._16_4_ + auVar350._16_4_ * auVar350._16_4_) * fVar252;
    auVar39._20_4_ =
         (auVar21._20_4_ * auVar21._20_4_ +
         auVar22._20_4_ * auVar22._20_4_ + auVar350._20_4_ * auVar350._20_4_) * fVar255;
    auVar39._24_4_ =
         (auVar21._24_4_ * auVar21._24_4_ +
         auVar22._24_4_ * auVar22._24_4_ + auVar350._24_4_ * auVar350._24_4_) * fVar258;
    auVar39._28_4_ = auVar303._28_4_ + auVar110._28_4_;
    auVar110 = vmaxps_avx(auVar38,auVar39);
    auVar350 = vperm2f128_avx(local_740,local_740,1);
    auVar350 = vshufps_avx(auVar350,local_740,0x30);
    local_780 = vshufps_avx(local_740,auVar350,0x29);
    local_7a0._0_4_ = (float)local_740._0_4_ + fVar230;
    local_7a0._4_4_ = local_740._4_4_ + fVar245;
    local_7a0._8_4_ = local_740._8_4_ + fVar259;
    local_7a0._12_4_ = local_740._12_4_ + fVar279;
    local_7a0._16_4_ = local_740._16_4_ + fVar251;
    local_7a0._20_4_ = local_740._20_4_ + fVar254;
    local_7a0._24_4_ = local_740._24_4_ + fVar286;
    local_7a0._28_4_ = local_740._28_4_ + auVar12._28_4_;
    auVar350 = vmaxps_avx(local_740,local_7a0);
    auVar12 = vmaxps_avx(local_760,local_780);
    auVar350 = vmaxps_avx(auVar350,auVar12);
    auVar12 = vrsqrtps_avx(auVar218);
    fVar230 = auVar12._0_4_;
    fVar245 = auVar12._4_4_;
    fVar259 = auVar12._8_4_;
    fVar279 = auVar12._12_4_;
    fVar251 = auVar12._16_4_;
    fVar254 = auVar12._20_4_;
    fVar286 = auVar12._24_4_;
    local_400 = fVar230 * 1.5 + fVar230 * fVar230 * fVar230 * auVar218._0_4_ * -0.5;
    fStack_3fc = fVar245 * 1.5 + fVar245 * fVar245 * fVar245 * auVar218._4_4_ * -0.5;
    fStack_3f8 = fVar259 * 1.5 + fVar259 * fVar259 * fVar259 * auVar218._8_4_ * -0.5;
    fStack_3f4 = fVar279 * 1.5 + fVar279 * fVar279 * fVar279 * auVar218._12_4_ * -0.5;
    fStack_3f0 = fVar251 * 1.5 + fVar251 * fVar251 * fVar251 * auVar218._16_4_ * -0.5;
    fStack_3ec = fVar254 * 1.5 + fVar254 * fVar254 * fVar254 * auVar218._20_4_ * -0.5;
    fStack_3e8 = fVar286 * 1.5 + fVar286 * fVar286 * fVar286 * auVar218._24_4_ * -0.5;
    auVar82._4_4_ = fVar125;
    auVar82._0_4_ = fVar98;
    auVar82._8_4_ = fVar128;
    auVar82._12_4_ = fVar131;
    auVar82._16_4_ = fVar133;
    auVar82._20_4_ = fVar135;
    auVar82._24_4_ = fVar137;
    auVar82._28_4_ = fVar139;
    local_9e0 = vsubps_avx(ZEXT832(0) << 0x20,auVar82);
    auVar402 = vsubps_avx(ZEXT832(0) << 0x20,local_540);
    fVar421 = auVar402._0_4_;
    fVar423 = auVar402._4_4_;
    fVar424 = auVar402._8_4_;
    fVar425 = auVar402._12_4_;
    fVar426 = auVar402._16_4_;
    fVar427 = auVar402._20_4_;
    fVar428 = auVar402._24_4_;
    fVar230 = local_9e0._0_4_;
    fVar259 = local_9e0._4_4_;
    fVar251 = local_9e0._8_4_;
    fVar286 = local_9e0._12_4_;
    fVar313 = local_9e0._16_4_;
    fVar247 = local_9e0._20_4_;
    fVar252 = local_9e0._24_4_;
    auVar80._4_4_ = fVar124;
    auVar80._0_4_ = fVar97;
    auVar80._8_4_ = fVar127;
    auVar80._12_4_ = fVar130;
    auVar80._16_4_ = fVar132;
    auVar80._20_4_ = fVar134;
    auVar80._24_4_ = fVar136;
    auVar80._28_4_ = fVar138;
    auVar14 = vsubps_avx(ZEXT832(0) << 0x20,auVar80);
    fVar245 = auVar14._0_4_;
    fVar279 = auVar14._4_4_;
    fVar254 = auVar14._8_4_;
    fVar288 = auVar14._12_4_;
    fVar315 = auVar14._16_4_;
    fVar249 = auVar14._20_4_;
    fVar255 = auVar14._24_4_;
    auVar387._0_4_ =
         (float)local_7c0._0_4_ * fVar245 +
         (float)local_7e0._0_4_ * fVar230 + fVar421 * (float)local_800._0_4_;
    auVar387._4_4_ =
         (float)local_7c0._4_4_ * fVar279 +
         (float)local_7e0._4_4_ * fVar259 + fVar423 * (float)local_800._4_4_;
    auVar387._8_4_ = fStack_7b8 * fVar254 + fStack_7d8 * fVar251 + fVar424 * fStack_7f8;
    auVar387._12_4_ = fStack_7b4 * fVar288 + fStack_7d4 * fVar286 + fVar425 * fStack_7f4;
    auVar387._16_4_ = fStack_7b0 * fVar315 + fStack_7d0 * fVar313 + fVar426 * fStack_7f0;
    auVar387._20_4_ = fStack_7ac * fVar249 + fStack_7cc * fVar247 + fVar427 * fStack_7ec;
    auVar387._24_4_ = fStack_7a8 * fVar255 + fStack_7c8 * fVar252 + fVar428 * fStack_7e8;
    auVar387._28_4_ = fVar224 + auVar22._28_4_ + fVar224 + auVar12._28_4_;
    auVar400._0_4_ = fVar245 * fVar245 + fVar230 * fVar230 + fVar421 * fVar421;
    auVar400._4_4_ = fVar279 * fVar279 + fVar259 * fVar259 + fVar423 * fVar423;
    auVar400._8_4_ = fVar254 * fVar254 + fVar251 * fVar251 + fVar424 * fVar424;
    auVar400._12_4_ = fVar288 * fVar288 + fVar286 * fVar286 + fVar425 * fVar425;
    auVar400._16_4_ = fVar315 * fVar315 + fVar313 * fVar313 + fVar426 * fVar426;
    auVar400._20_4_ = fVar249 * fVar249 + fVar247 * fVar247 + fVar427 * fVar427;
    auVar400._24_4_ = fVar255 * fVar255 + fVar252 * fVar252 + fVar428 * fVar428;
    auVar400._28_4_ = auVar418._28_4_ + auVar418._28_4_ + fVar224;
    fVar346 = (float)local_7c0._0_4_ * fVar227 * local_400 +
              fVar225 * local_400 * (float)local_7e0._0_4_ +
              fVar226 * local_400 * (float)local_800._0_4_;
    fVar352 = (float)local_7c0._4_4_ * fVar250 * fStack_3fc +
              fVar246 * fStack_3fc * (float)local_7e0._4_4_ +
              fVar248 * fStack_3fc * (float)local_800._4_4_;
    fVar353 = fStack_7b8 * fVar285 * fStack_3f8 +
              fVar281 * fStack_3f8 * fStack_7d8 + fVar283 * fStack_3f8 * fStack_7f8;
    fVar354 = fStack_7b4 * fVar280 * fStack_3f4 +
              fVar257 * fStack_3f4 * fStack_7d4 + fVar260 * fStack_3f4 * fStack_7f4;
    fVar355 = fStack_7b0 * fVar307 * fStack_3f0 +
              fVar290 * fStack_3f0 * fStack_7d0 + fVar292 * fStack_3f0 * fStack_7f0;
    fVar356 = fStack_7ac * fVar416 * fStack_3ec +
              fVar317 * fStack_3ec * fStack_7cc + fVar384 * fStack_3ec * fStack_7ec;
    fVar357 = fStack_7a8 * fVar18 * fStack_3e8 +
              fVar16 * fStack_3e8 * fStack_7c8 + fVar17 * fStack_3e8 * fStack_7e8;
    fVar224 = fStack_7a4 + fStack_7c4 + fStack_7e4;
    fVar366 = fVar245 * fVar227 * local_400 +
              fVar225 * local_400 * fVar230 + fVar421 * fVar226 * local_400;
    fVar371 = fVar279 * fVar250 * fStack_3fc +
              fVar246 * fStack_3fc * fVar259 + fVar423 * fVar248 * fStack_3fc;
    fVar372 = fVar254 * fVar285 * fStack_3f8 +
              fVar281 * fStack_3f8 * fVar251 + fVar424 * fVar283 * fStack_3f8;
    fVar373 = fVar288 * fVar280 * fStack_3f4 +
              fVar257 * fStack_3f4 * fVar286 + fVar425 * fVar260 * fStack_3f4;
    fVar374 = fVar315 * fVar307 * fStack_3f0 +
              fVar290 * fStack_3f0 * fVar313 + fVar426 * fVar292 * fStack_3f0;
    fVar375 = fVar249 * fVar416 * fStack_3ec +
              fVar317 * fStack_3ec * fVar247 + fVar427 * fVar384 * fStack_3ec;
    fVar376 = fVar255 * fVar18 * fStack_3e8 +
              fVar16 * fStack_3e8 * fVar252 + fVar428 * fVar17 * fStack_3e8;
    fVar377 = fStack_7c4 + fVar224;
    auVar40._4_4_ = fVar352 * fVar371;
    auVar40._0_4_ = fVar346 * fVar366;
    auVar40._8_4_ = fVar353 * fVar372;
    auVar40._12_4_ = fVar354 * fVar373;
    auVar40._16_4_ = fVar355 * fVar374;
    auVar40._20_4_ = fVar356 * fVar375;
    auVar40._24_4_ = fVar357 * fVar376;
    auVar40._28_4_ = fVar224;
    auVar15 = vsubps_avx(auVar387,auVar40);
    auVar41._4_4_ = fVar371 * fVar371;
    auVar41._0_4_ = fVar366 * fVar366;
    auVar41._8_4_ = fVar372 * fVar372;
    auVar41._12_4_ = fVar373 * fVar373;
    auVar41._16_4_ = fVar374 * fVar374;
    auVar41._20_4_ = fVar375 * fVar375;
    auVar41._24_4_ = fVar376 * fVar376;
    auVar41._28_4_ = fStack_7c4;
    local_620 = vsubps_avx(auVar400,auVar41);
    auVar402 = vsqrtps_avx(auVar110);
    fVar224 = (auVar402._0_4_ + auVar350._0_4_) * 1.0000002;
    fVar258 = (auVar402._4_4_ + auVar350._4_4_) * 1.0000002;
    fVar180 = (auVar402._8_4_ + auVar350._8_4_) * 1.0000002;
    fVar182 = (auVar402._12_4_ + auVar350._12_4_) * 1.0000002;
    fVar183 = (auVar402._16_4_ + auVar350._16_4_) * 1.0000002;
    fVar184 = (auVar402._20_4_ + auVar350._20_4_) * 1.0000002;
    fVar185 = (auVar402._24_4_ + auVar350._24_4_) * 1.0000002;
    auVar42._4_4_ = fVar258 * fVar258;
    auVar42._0_4_ = fVar224 * fVar224;
    auVar42._8_4_ = fVar180 * fVar180;
    auVar42._12_4_ = fVar182 * fVar182;
    auVar42._16_4_ = fVar183 * fVar183;
    auVar42._20_4_ = fVar184 * fVar184;
    auVar42._24_4_ = fVar185 * fVar185;
    auVar42._28_4_ = auVar402._28_4_ + auVar350._28_4_;
    fVar398 = auVar15._0_4_ + auVar15._0_4_;
    fVar405 = auVar15._4_4_ + auVar15._4_4_;
    local_5c0._0_8_ = CONCAT44(fVar405,fVar398);
    local_5c0._8_4_ = auVar15._8_4_ + auVar15._8_4_;
    local_5c0._12_4_ = auVar15._12_4_ + auVar15._12_4_;
    local_5c0._16_4_ = auVar15._16_4_ + auVar15._16_4_;
    local_5c0._20_4_ = auVar15._20_4_ + auVar15._20_4_;
    local_5c0._24_4_ = auVar15._24_4_ + auVar15._24_4_;
    fVar224 = auVar15._28_4_;
    local_5c0._28_4_ = fVar224 + fVar224;
    auVar350 = vsubps_avx(local_620,auVar42);
    local_420._4_4_ = fVar352 * fVar352;
    local_420._0_4_ = fVar346 * fVar346;
    local_420._8_4_ = fVar353 * fVar353;
    local_420._12_4_ = fVar354 * fVar354;
    local_420._16_4_ = fVar355 * fVar355;
    local_420._20_4_ = fVar356 * fVar356;
    local_420._24_4_ = fVar357 * fVar357;
    local_420._28_4_ = local_5a0._28_4_;
    auVar383 = ZEXT3264(local_420);
    local_660 = vsubps_avx(local_3a0,local_420);
    auVar43._4_4_ = fVar405 * fVar405;
    auVar43._0_4_ = fVar398 * fVar398;
    auVar43._8_4_ = local_5c0._8_4_ * local_5c0._8_4_;
    auVar43._12_4_ = local_5c0._12_4_ * local_5c0._12_4_;
    auVar43._16_4_ = local_5c0._16_4_ * local_5c0._16_4_;
    auVar43._20_4_ = local_5c0._20_4_ * local_5c0._20_4_;
    auVar43._24_4_ = local_5c0._24_4_ * local_5c0._24_4_;
    auVar43._28_4_ = fVar224;
    fVar258 = local_660._0_4_;
    fVar180 = local_660._4_4_;
    fVar182 = local_660._8_4_;
    fVar183 = local_660._12_4_;
    fVar184 = local_660._16_4_;
    fVar185 = local_660._20_4_;
    fVar365 = local_660._24_4_;
    auVar44._4_4_ = fVar180 * 4.0 * auVar350._4_4_;
    auVar44._0_4_ = fVar258 * 4.0 * auVar350._0_4_;
    auVar44._8_4_ = fVar182 * 4.0 * auVar350._8_4_;
    auVar44._12_4_ = fVar183 * 4.0 * auVar350._12_4_;
    auVar44._16_4_ = fVar184 * 4.0 * auVar350._16_4_;
    auVar44._20_4_ = fVar185 * 4.0 * auVar350._20_4_;
    auVar44._24_4_ = fVar365 * 4.0 * auVar350._24_4_;
    auVar44._28_4_ = 0x40800000;
    auVar15 = vsubps_avx(auVar43,auVar44);
    auVar110 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,5);
    fVar224 = local_660._28_4_;
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar110 >> 0x7f,0) == '\0') &&
          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar110 >> 0xbf,0) == '\0') &&
        (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar110[0x1f])
    {
      auVar219._8_4_ = 0x7f800000;
      auVar219._0_8_ = 0x7f8000007f800000;
      auVar219._12_4_ = 0x7f800000;
      auVar219._16_4_ = 0x7f800000;
      auVar219._20_4_ = 0x7f800000;
      auVar219._24_4_ = 0x7f800000;
      auVar219._28_4_ = 0x7f800000;
      auVar419._8_4_ = 0xff800000;
      auVar419._0_8_ = 0xff800000ff800000;
      auVar419._12_4_ = 0xff800000;
      auVar419._16_4_ = 0xff800000;
      auVar419._20_4_ = 0xff800000;
      auVar419._24_4_ = 0xff800000;
      auVar419._28_4_ = 0xff800000;
    }
    else {
      auVar22 = vsqrtps_avx(auVar15);
      auVar300._0_4_ = fVar258 + fVar258;
      auVar300._4_4_ = fVar180 + fVar180;
      auVar300._8_4_ = fVar182 + fVar182;
      auVar300._12_4_ = fVar183 + fVar183;
      auVar300._16_4_ = fVar184 + fVar184;
      auVar300._20_4_ = fVar185 + fVar185;
      auVar300._24_4_ = fVar365 + fVar365;
      auVar300._28_4_ = fVar224 + fVar224;
      auVar21 = vrcpps_avx(auVar300);
      auVar303 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,5);
      fVar293 = auVar21._0_4_;
      fVar308 = auVar21._4_4_;
      auVar45._4_4_ = auVar300._4_4_ * fVar308;
      auVar45._0_4_ = auVar300._0_4_ * fVar293;
      fVar310 = auVar21._8_4_;
      auVar45._8_4_ = auVar300._8_4_ * fVar310;
      fVar312 = auVar21._12_4_;
      auVar45._12_4_ = auVar300._12_4_ * fVar312;
      fVar314 = auVar21._16_4_;
      auVar45._16_4_ = auVar300._16_4_ * fVar314;
      fVar316 = auVar21._20_4_;
      auVar45._20_4_ = auVar300._20_4_ * fVar316;
      fVar318 = auVar21._24_4_;
      auVar45._24_4_ = auVar300._24_4_ * fVar318;
      auVar45._28_4_ = auVar300._28_4_;
      auVar220._8_4_ = 0x3f800000;
      auVar220._0_8_ = &DAT_3f8000003f800000;
      auVar220._12_4_ = 0x3f800000;
      auVar220._16_4_ = 0x3f800000;
      auVar220._20_4_ = 0x3f800000;
      auVar220._24_4_ = 0x3f800000;
      auVar220._28_4_ = 0x3f800000;
      auVar15 = vsubps_avx(auVar220,auVar45);
      fVar293 = fVar293 + fVar293 * auVar15._0_4_;
      fVar308 = fVar308 + fVar308 * auVar15._4_4_;
      fVar310 = fVar310 + fVar310 * auVar15._8_4_;
      fVar312 = fVar312 + fVar312 * auVar15._12_4_;
      fVar314 = fVar314 + fVar314 * auVar15._16_4_;
      fVar316 = fVar316 + fVar316 * auVar15._20_4_;
      fVar318 = fVar318 + fVar318 * auVar15._24_4_;
      auVar328._0_8_ = CONCAT44(fVar405,fVar398) ^ 0x8000000080000000;
      auVar328._8_4_ = -local_5c0._8_4_;
      auVar328._12_4_ = -local_5c0._12_4_;
      auVar328._16_4_ = -local_5c0._16_4_;
      auVar328._20_4_ = -local_5c0._20_4_;
      auVar328._24_4_ = -local_5c0._24_4_;
      auVar328._28_4_ = -local_5c0._28_4_;
      auVar111 = vsubps_avx(auVar328,auVar22);
      fVar398 = auVar111._0_4_ * fVar293;
      fVar405 = auVar111._4_4_ * fVar308;
      auVar46._4_4_ = fVar405;
      auVar46._0_4_ = fVar398;
      fVar337 = auVar111._8_4_ * fVar310;
      auVar46._8_4_ = fVar337;
      fVar339 = auVar111._12_4_ * fVar312;
      auVar46._12_4_ = fVar339;
      fVar341 = auVar111._16_4_ * fVar314;
      auVar46._16_4_ = fVar341;
      fVar343 = auVar111._20_4_ * fVar316;
      auVar46._20_4_ = fVar343;
      fVar345 = auVar111._24_4_ * fVar318;
      auVar46._24_4_ = fVar345;
      auVar46._28_4_ = auVar111._28_4_;
      auVar22 = vsubps_avx(auVar22,local_5c0);
      fVar293 = auVar22._0_4_ * fVar293;
      fVar308 = auVar22._4_4_ * fVar308;
      auVar47._4_4_ = fVar308;
      auVar47._0_4_ = fVar293;
      fVar310 = auVar22._8_4_ * fVar310;
      auVar47._8_4_ = fVar310;
      fVar312 = auVar22._12_4_ * fVar312;
      auVar47._12_4_ = fVar312;
      fVar314 = auVar22._16_4_ * fVar314;
      auVar47._16_4_ = fVar314;
      fVar316 = auVar22._20_4_ * fVar316;
      auVar47._20_4_ = fVar316;
      fVar318 = auVar22._24_4_ * fVar318;
      auVar47._24_4_ = fVar318;
      auVar47._28_4_ = auVar22._28_4_;
      fStack_4e4 = fVar377 + auVar21._28_4_ + auVar15._28_4_;
      local_500[0] = local_400 * (fVar366 + fVar346 * fVar398);
      local_500[1] = fStack_3fc * (fVar371 + fVar352 * fVar405);
      local_500[2] = fStack_3f8 * (fVar372 + fVar353 * fVar337);
      local_500[3] = fStack_3f4 * (fVar373 + fVar354 * fVar339);
      fStack_4f0 = fStack_3f0 * (fVar374 + fVar355 * fVar341);
      fStack_4ec = fStack_3ec * (fVar375 + fVar356 * fVar343);
      fStack_4e8 = fStack_3e8 * (fVar376 + fVar357 * fVar345);
      local_520[0] = local_400 * (fVar366 + fVar346 * fVar293);
      local_520[1] = fStack_3fc * (fVar371 + fVar352 * fVar308);
      local_520[2] = fStack_3f8 * (fVar372 + fVar353 * fVar310);
      local_520[3] = fStack_3f4 * (fVar373 + fVar354 * fVar312);
      fStack_510 = fStack_3f0 * (fVar374 + fVar355 * fVar314);
      fStack_50c = fStack_3ec * (fVar375 + fVar356 * fVar316);
      fStack_508 = fStack_3e8 * (fVar376 + fVar357 * fVar318);
      fStack_504 = fVar377 + fStack_4e4;
      auVar301._8_4_ = 0x7f800000;
      auVar301._0_8_ = 0x7f8000007f800000;
      auVar301._12_4_ = 0x7f800000;
      auVar301._16_4_ = 0x7f800000;
      auVar301._20_4_ = 0x7f800000;
      auVar301._24_4_ = 0x7f800000;
      auVar301._28_4_ = 0x7f800000;
      auVar219 = vblendvps_avx(auVar301,auVar46,auVar303);
      auVar329._8_4_ = 0x7fffffff;
      auVar329._0_8_ = 0x7fffffff7fffffff;
      auVar329._12_4_ = 0x7fffffff;
      auVar329._16_4_ = 0x7fffffff;
      auVar329._20_4_ = 0x7fffffff;
      auVar329._24_4_ = 0x7fffffff;
      auVar329._28_4_ = 0x7fffffff;
      auVar15 = vandps_avx(local_420,auVar329);
      auVar15 = vmaxps_avx(local_4e0,auVar15);
      auVar48._4_4_ = auVar15._4_4_ * 1.9073486e-06;
      auVar48._0_4_ = auVar15._0_4_ * 1.9073486e-06;
      auVar48._8_4_ = auVar15._8_4_ * 1.9073486e-06;
      auVar48._12_4_ = auVar15._12_4_ * 1.9073486e-06;
      auVar48._16_4_ = auVar15._16_4_ * 1.9073486e-06;
      auVar48._20_4_ = auVar15._20_4_ * 1.9073486e-06;
      auVar48._24_4_ = auVar15._24_4_ * 1.9073486e-06;
      auVar48._28_4_ = auVar15._28_4_;
      auVar15 = vandps_avx(local_660,auVar329);
      auVar15 = vcmpps_avx(auVar15,auVar48,1);
      auVar302._8_4_ = 0xff800000;
      auVar302._0_8_ = 0xff800000ff800000;
      auVar302._12_4_ = 0xff800000;
      auVar302._16_4_ = 0xff800000;
      auVar302._20_4_ = 0xff800000;
      auVar302._24_4_ = 0xff800000;
      auVar302._28_4_ = 0xff800000;
      auVar419 = vblendvps_avx(auVar302,auVar47,auVar303);
      auVar21 = auVar303 & auVar15;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar110 = vandps_avx(auVar15,auVar303);
        auVar143 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar15 = vcmpps_avx(auVar350,ZEXT832(0) << 0x20,2);
        auVar351._8_4_ = 0xff800000;
        auVar351._0_8_ = 0xff800000ff800000;
        auVar351._12_4_ = 0xff800000;
        auVar351._16_4_ = 0xff800000;
        auVar351._20_4_ = 0xff800000;
        auVar351._24_4_ = 0xff800000;
        auVar351._28_4_ = 0xff800000;
        auVar401._8_4_ = 0x7f800000;
        auVar401._0_8_ = 0x7f8000007f800000;
        auVar401._12_4_ = 0x7f800000;
        auVar401._16_4_ = 0x7f800000;
        auVar401._20_4_ = 0x7f800000;
        auVar401._24_4_ = 0x7f800000;
        auVar401._28_4_ = 0x7f800000;
        auVar350 = vblendvps_avx(auVar401,auVar351,auVar15);
        auVar209 = vpmovsxwd_avx(auVar143);
        auVar143 = vpunpckhwd_avx(auVar143,auVar143);
        auVar278._16_16_ = auVar143;
        auVar278._0_16_ = auVar209;
        auVar219 = vblendvps_avx(auVar219,auVar350,auVar278);
        auVar350 = vblendvps_avx(auVar351,auVar401,auVar15);
        auVar419 = vblendvps_avx(auVar419,auVar350,auVar278);
        auVar350 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar201._0_4_ = auVar110._0_4_ ^ auVar350._0_4_;
        auVar201._4_4_ = auVar110._4_4_ ^ auVar350._4_4_;
        auVar201._8_4_ = auVar110._8_4_ ^ auVar350._8_4_;
        auVar201._12_4_ = auVar110._12_4_ ^ auVar350._12_4_;
        auVar201._16_4_ = auVar110._16_4_ ^ auVar350._16_4_;
        auVar201._20_4_ = auVar110._20_4_ ^ auVar350._20_4_;
        auVar201._24_4_ = auVar110._24_4_ ^ auVar350._24_4_;
        auVar201._28_4_ = auVar110._28_4_ ^ auVar350._28_4_;
        auVar110 = vorps_avx(auVar15,auVar201);
        auVar110 = vandps_avx(auVar303,auVar110);
      }
    }
    auVar350 = local_4c0 & auVar110;
    auVar306 = ZEXT3264(_local_9a0);
    if ((((((((auVar350 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar350 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar350 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar350 >> 0x7f,0) == '\0') &&
          (auVar350 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar350 >> 0xbf,0) == '\0') &&
        (auVar350 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar350[0x1f])
    {
      auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    else {
      fStack_3e4 = auVar12._28_4_ + auVar218._28_4_;
      auVar143 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8c0._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_8c0._0_4_)),0);
      auVar163._16_16_ = auVar143;
      auVar163._0_16_ = auVar143;
      local_640 = vminps_avx(auVar163,auVar419);
      auVar116._0_4_ =
           (float)local_7c0._0_4_ * fVar319 +
           (float)local_7e0._0_4_ * fVar385 + (float)local_800._0_4_ * fVar396;
      auVar116._4_4_ =
           (float)local_7c0._4_4_ * fVar335 +
           (float)local_7e0._4_4_ * fVar389 + (float)local_800._4_4_ * fVar403;
      auVar116._8_4_ = fStack_7b8 * fVar336 + fStack_7d8 * fVar390 + fStack_7f8 * fVar406;
      auVar116._12_4_ = fStack_7b4 * fVar338 + fStack_7d4 * fVar391 + fStack_7f4 * fVar408;
      auVar116._16_4_ = fStack_7b0 * fVar340 + fStack_7d0 * fVar392 + fStack_7f0 * fVar410;
      auVar116._20_4_ = fStack_7ac * fVar342 + fStack_7cc * fVar393 + fStack_7ec * fVar412;
      auVar116._24_4_ = fStack_7a8 * fVar344 + fStack_7c8 * fVar394 + fStack_7e8 * fVar414;
      auVar116._28_4_ = auVar327._28_4_ + auVar14._28_4_ + 1.0;
      auVar350 = vrcpps_avx(auVar116);
      fVar398 = auVar350._0_4_;
      fVar405 = auVar350._4_4_;
      auVar49._4_4_ = auVar116._4_4_ * fVar405;
      auVar49._0_4_ = auVar116._0_4_ * fVar398;
      fVar293 = auVar350._8_4_;
      auVar49._8_4_ = auVar116._8_4_ * fVar293;
      fVar308 = auVar350._12_4_;
      auVar49._12_4_ = auVar116._12_4_ * fVar308;
      fVar310 = auVar350._16_4_;
      auVar49._16_4_ = auVar116._16_4_ * fVar310;
      fVar312 = auVar350._20_4_;
      auVar49._20_4_ = auVar116._20_4_ * fVar312;
      fVar314 = auVar350._24_4_;
      auVar49._24_4_ = auVar116._24_4_ * fVar314;
      auVar49._28_4_ = 0x3f800000;
      auVar370._8_4_ = 0x3f800000;
      auVar370._0_8_ = &DAT_3f8000003f800000;
      auVar370._12_4_ = 0x3f800000;
      auVar370._16_4_ = 0x3f800000;
      auVar370._20_4_ = 0x3f800000;
      auVar370._24_4_ = 0x3f800000;
      auVar370._28_4_ = 0x3f800000;
      auVar15 = vsubps_avx(auVar370,auVar49);
      auVar330._8_4_ = 0x7fffffff;
      auVar330._0_8_ = 0x7fffffff7fffffff;
      auVar330._12_4_ = 0x7fffffff;
      auVar330._16_4_ = 0x7fffffff;
      auVar330._20_4_ = 0x7fffffff;
      auVar330._24_4_ = 0x7fffffff;
      auVar330._28_4_ = 0x7fffffff;
      auVar350 = vandps_avx(auVar116,auVar330);
      auVar364._8_4_ = 0x219392ef;
      auVar364._0_8_ = 0x219392ef219392ef;
      auVar364._12_4_ = 0x219392ef;
      auVar364._16_4_ = 0x219392ef;
      auVar364._20_4_ = 0x219392ef;
      auVar364._24_4_ = 0x219392ef;
      auVar364._28_4_ = 0x219392ef;
      auVar12 = vcmpps_avx(auVar350,auVar364,1);
      auVar50._4_4_ =
           (fVar405 + fVar405 * auVar15._4_4_) *
           -(fVar279 * fVar335 + fVar389 * fVar259 + fVar423 * fVar403);
      auVar50._0_4_ =
           (fVar398 + fVar398 * auVar15._0_4_) *
           -(fVar245 * fVar319 + fVar385 * fVar230 + fVar421 * fVar396);
      auVar50._8_4_ =
           (fVar293 + fVar293 * auVar15._8_4_) *
           -(fVar254 * fVar336 + fVar390 * fVar251 + fVar424 * fVar406);
      auVar50._12_4_ =
           (fVar308 + fVar308 * auVar15._12_4_) *
           -(fVar288 * fVar338 + fVar391 * fVar286 + fVar425 * fVar408);
      auVar50._16_4_ =
           (fVar310 + fVar310 * auVar15._16_4_) *
           -(fVar315 * fVar340 + fVar392 * fVar313 + fVar426 * fVar410);
      auVar50._20_4_ =
           (fVar312 + fVar312 * auVar15._20_4_) *
           -(fVar249 * fVar342 + fVar393 * fVar247 + fVar427 * fVar412);
      auVar50._24_4_ =
           (fVar314 + fVar314 * auVar15._24_4_) *
           -(fVar255 * fVar344 + fVar394 * fVar252 + fVar428 * fVar414);
      auVar50._28_4_ = -(auVar14._28_4_ + auVar219._28_4_ + 1.0);
      auVar350 = vcmpps_avx(auVar116,ZEXT832(0) << 0x20,1);
      auVar350 = vorps_avx(auVar12,auVar350);
      auVar382._8_4_ = 0xff800000;
      auVar382._0_8_ = 0xff800000ff800000;
      auVar382._12_4_ = 0xff800000;
      auVar382._16_4_ = 0xff800000;
      auVar382._20_4_ = 0xff800000;
      auVar382._24_4_ = 0xff800000;
      auVar382._28_4_ = 0xff800000;
      auVar383 = ZEXT3264(auVar382);
      auVar350 = vblendvps_avx(auVar50,auVar382,auVar350);
      auVar14 = vcmpps_avx(auVar116,ZEXT832(0) << 0x20,6);
      auVar12 = vorps_avx(auVar12,auVar14);
      auVar388._8_4_ = 0x7f800000;
      auVar388._0_8_ = 0x7f8000007f800000;
      auVar388._12_4_ = 0x7f800000;
      auVar388._16_4_ = 0x7f800000;
      auVar388._20_4_ = 0x7f800000;
      auVar388._24_4_ = 0x7f800000;
      auVar388._28_4_ = 0x7f800000;
      auVar12 = vblendvps_avx(auVar50,auVar388,auVar12);
      auVar14 = vmaxps_avx(local_3c0,auVar219);
      auVar14 = vmaxps_avx(auVar14,auVar350);
      auVar15 = vminps_avx(local_640,auVar12);
      auVar303 = ZEXT832(0) << 0x20;
      auVar350 = vsubps_avx(auVar303,auVar331);
      auVar12 = vsubps_avx(auVar303,local_a40);
      auVar51._4_4_ = auVar12._4_4_ * -fVar404;
      auVar51._0_4_ = auVar12._0_4_ * -fVar397;
      auVar51._8_4_ = auVar12._8_4_ * -fVar407;
      auVar51._12_4_ = auVar12._12_4_ * -fVar409;
      auVar51._16_4_ = auVar12._16_4_ * -fVar411;
      auVar51._20_4_ = auVar12._20_4_ * -fVar413;
      auVar51._24_4_ = auVar12._24_4_ * -fVar415;
      auVar51._28_4_ = auVar12._28_4_;
      auVar52._4_4_ = fVar253 * auVar350._4_4_;
      auVar52._0_4_ = fVar228 * auVar350._0_4_;
      auVar52._8_4_ = fVar287 * auVar350._8_4_;
      auVar52._12_4_ = fVar282 * auVar350._12_4_;
      auVar52._16_4_ = fVar309 * auVar350._16_4_;
      auVar52._20_4_ = fVar291 * auVar350._20_4_;
      auVar52._24_4_ = fVar19 * auVar350._24_4_;
      auVar52._28_4_ = auVar350._28_4_;
      auVar350 = vsubps_avx(auVar51,auVar52);
      auVar12 = vsubps_avx(auVar303,auVar13);
      auVar53._4_4_ = fVar256 * auVar12._4_4_;
      auVar53._0_4_ = fVar229 * auVar12._0_4_;
      auVar53._8_4_ = fVar289 * auVar12._8_4_;
      auVar53._12_4_ = fVar284 * auVar12._12_4_;
      auVar53._16_4_ = fVar311 * auVar12._16_4_;
      auVar53._20_4_ = fVar395 * auVar12._20_4_;
      uVar1 = auVar12._28_4_;
      auVar53._24_4_ = fVar20 * auVar12._24_4_;
      auVar53._28_4_ = uVar1;
      auVar331 = vsubps_avx(auVar350,auVar53);
      auVar54._4_4_ = (float)local_800._4_4_ * -fVar404;
      auVar54._0_4_ = (float)local_800._0_4_ * -fVar397;
      auVar54._8_4_ = fStack_7f8 * -fVar407;
      auVar54._12_4_ = fStack_7f4 * -fVar409;
      auVar54._16_4_ = fStack_7f0 * -fVar411;
      auVar54._20_4_ = fStack_7ec * -fVar413;
      auVar54._24_4_ = fStack_7e8 * -fVar415;
      auVar54._28_4_ = uVar8 ^ 0x80000000;
      auVar55._4_4_ = (float)local_7e0._4_4_ * fVar253;
      auVar55._0_4_ = (float)local_7e0._0_4_ * fVar228;
      auVar55._8_4_ = fStack_7d8 * fVar287;
      auVar55._12_4_ = fStack_7d4 * fVar282;
      auVar55._16_4_ = fStack_7d0 * fVar309;
      auVar55._20_4_ = fStack_7cc * fVar291;
      auVar55._24_4_ = fStack_7c8 * fVar19;
      auVar55._28_4_ = uVar1;
      auVar243._8_4_ = 0x3f800000;
      auVar243._0_8_ = &DAT_3f8000003f800000;
      auVar243._12_4_ = 0x3f800000;
      auVar243._16_4_ = 0x3f800000;
      auVar243._20_4_ = 0x3f800000;
      auVar243._24_4_ = 0x3f800000;
      auVar243._28_4_ = 0x3f800000;
      auVar350 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = (float)local_7c0._4_4_ * fVar256;
      auVar56._0_4_ = (float)local_7c0._0_4_ * fVar229;
      auVar56._8_4_ = fStack_7b8 * fVar289;
      auVar56._12_4_ = fStack_7b4 * fVar284;
      auVar56._16_4_ = fStack_7b0 * fVar311;
      auVar56._20_4_ = fStack_7ac * fVar395;
      auVar56._24_4_ = fStack_7a8 * fVar20;
      auVar56._28_4_ = uVar1;
      auVar303 = vsubps_avx(auVar350,auVar56);
      auVar350 = vrcpps_avx(auVar303);
      fVar228 = auVar350._0_4_;
      fVar229 = auVar350._4_4_;
      auVar57._4_4_ = auVar303._4_4_ * fVar229;
      auVar57._0_4_ = auVar303._0_4_ * fVar228;
      fVar230 = auVar350._8_4_;
      auVar57._8_4_ = auVar303._8_4_ * fVar230;
      fVar245 = auVar350._12_4_;
      auVar57._12_4_ = auVar303._12_4_ * fVar245;
      fVar253 = auVar350._16_4_;
      auVar57._16_4_ = auVar303._16_4_ * fVar253;
      fVar256 = auVar350._20_4_;
      auVar57._20_4_ = auVar303._20_4_ * fVar256;
      fVar259 = auVar350._24_4_;
      auVar57._24_4_ = auVar303._24_4_ * fVar259;
      auVar57._28_4_ = local_a20._28_4_;
      auVar21 = vsubps_avx(auVar243,auVar57);
      auVar350 = vandps_avx(auVar303,auVar330);
      auVar12 = vcmpps_avx(auVar350,auVar364,1);
      auVar58._4_4_ = (fVar229 + fVar229 * auVar21._4_4_) * -auVar331._4_4_;
      auVar58._0_4_ = (fVar228 + fVar228 * auVar21._0_4_) * -auVar331._0_4_;
      auVar58._8_4_ = (fVar230 + fVar230 * auVar21._8_4_) * -auVar331._8_4_;
      auVar58._12_4_ = (fVar245 + fVar245 * auVar21._12_4_) * -auVar331._12_4_;
      auVar58._16_4_ = (fVar253 + fVar253 * auVar21._16_4_) * -auVar331._16_4_;
      auVar58._20_4_ = (fVar256 + fVar256 * auVar21._20_4_) * -auVar331._20_4_;
      auVar58._24_4_ = (fVar259 + fVar259 * auVar21._24_4_) * -auVar331._24_4_;
      auVar58._28_4_ = auVar331._28_4_ ^ 0x80000000;
      auVar331 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar350 = vcmpps_avx(auVar303,auVar331,1);
      auVar350 = vorps_avx(auVar12,auVar350);
      auVar350 = vblendvps_avx(auVar58,auVar382,auVar350);
      local_640 = vmaxps_avx(auVar14,auVar350);
      auVar350 = vcmpps_avx(auVar303,auVar331,6);
      auVar350 = vorps_avx(auVar12,auVar350);
      auVar350 = vblendvps_avx(auVar58,auVar388,auVar350);
      auVar110 = vandps_avx(auVar110,local_4c0);
      local_440 = vminps_avx(auVar15,auVar350);
      auVar350 = vcmpps_avx(local_640,local_440,2);
      auVar12 = auVar110 & auVar350;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar12 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar12 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar12 >> 0x7f,0) == '\0') &&
            (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar12 >> 0xbf,0) == '\0') &&
          (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar12[0x1f])
      {
        auVar306 = ZEXT3264(_local_9a0);
LAB_0117c468:
        auVar244 = ZEXT3264(auVar243);
      }
      else {
        auVar12 = vminps_avx(local_740,local_7a0);
        auVar331 = vminps_avx(local_760,local_780);
        auVar12 = vminps_avx(auVar12,auVar331);
        auVar12 = vsubps_avx(auVar12,auVar402);
        auVar110 = vandps_avx(auVar350,auVar110);
        auVar88._4_4_ = local_500[1];
        auVar88._0_4_ = local_500[0];
        auVar88._8_4_ = local_500[2];
        auVar88._12_4_ = local_500[3];
        auVar88._16_4_ = fStack_4f0;
        auVar88._20_4_ = fStack_4ec;
        auVar88._24_4_ = fStack_4e8;
        auVar88._28_4_ = fStack_4e4;
        auVar350 = vminps_avx(auVar88,auVar243);
        auVar350 = vmaxps_avx(auVar350,ZEXT832(0) << 0x20);
        local_500[0] = fVar96 + fVar140 * (auVar350._0_4_ + 0.0) * 0.125;
        local_500[1] = fVar123 + fVar178 * (auVar350._4_4_ + 1.0) * 0.125;
        local_500[2] = fVar126 + fVar179 * (auVar350._8_4_ + 2.0) * 0.125;
        local_500[3] = fVar129 + fVar181 * (auVar350._12_4_ + 3.0) * 0.125;
        fStack_4f0 = fVar96 + fVar140 * (auVar350._16_4_ + 4.0) * 0.125;
        fStack_4ec = fVar123 + fVar178 * (auVar350._20_4_ + 5.0) * 0.125;
        fStack_4e8 = fVar126 + fVar179 * (auVar350._24_4_ + 6.0) * 0.125;
        fStack_4e4 = fVar129 + auVar350._28_4_ + 7.0;
        auVar87._4_4_ = local_520[1];
        auVar87._0_4_ = local_520[0];
        auVar87._8_4_ = local_520[2];
        auVar87._12_4_ = local_520[3];
        auVar87._16_4_ = fStack_510;
        auVar87._20_4_ = fStack_50c;
        auVar87._24_4_ = fStack_508;
        auVar87._28_4_ = fStack_504;
        auVar350 = vminps_avx(auVar87,auVar243);
        auVar350 = vmaxps_avx(auVar350,ZEXT832(0) << 0x20);
        local_520[0] = fVar96 + fVar140 * (auVar350._0_4_ + 0.0) * 0.125;
        local_520[1] = fVar123 + fVar178 * (auVar350._4_4_ + 1.0) * 0.125;
        local_520[2] = fVar126 + fVar179 * (auVar350._8_4_ + 2.0) * 0.125;
        local_520[3] = fVar129 + fVar181 * (auVar350._12_4_ + 3.0) * 0.125;
        fStack_510 = fVar96 + fVar140 * (auVar350._16_4_ + 4.0) * 0.125;
        fStack_50c = fVar123 + fVar178 * (auVar350._20_4_ + 5.0) * 0.125;
        fStack_508 = fVar126 + fVar179 * (auVar350._24_4_ + 6.0) * 0.125;
        fStack_504 = fVar129 + auVar350._28_4_ + 7.0;
        auVar59._4_4_ = auVar12._4_4_ * 0.99999976;
        auVar59._0_4_ = auVar12._0_4_ * 0.99999976;
        auVar59._8_4_ = auVar12._8_4_ * 0.99999976;
        auVar59._12_4_ = auVar12._12_4_ * 0.99999976;
        auVar59._16_4_ = auVar12._16_4_ * 0.99999976;
        auVar59._20_4_ = auVar12._20_4_ * 0.99999976;
        auVar59._24_4_ = auVar12._24_4_ * 0.99999976;
        auVar59._28_4_ = 0x3f7ffffc;
        auVar350 = vmaxps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar59);
        auVar60._4_4_ = auVar350._4_4_ * auVar350._4_4_;
        auVar60._0_4_ = auVar350._0_4_ * auVar350._0_4_;
        auVar60._8_4_ = auVar350._8_4_ * auVar350._8_4_;
        auVar60._12_4_ = auVar350._12_4_ * auVar350._12_4_;
        auVar60._16_4_ = auVar350._16_4_ * auVar350._16_4_;
        auVar60._20_4_ = auVar350._20_4_ * auVar350._20_4_;
        auVar60._24_4_ = auVar350._24_4_ * auVar350._24_4_;
        auVar60._28_4_ = auVar350._28_4_;
        local_ae0 = vsubps_avx(local_620,auVar60);
        auVar61._4_4_ = local_ae0._4_4_ * fVar180 * 4.0;
        auVar61._0_4_ = local_ae0._0_4_ * fVar258 * 4.0;
        auVar61._8_4_ = local_ae0._8_4_ * fVar182 * 4.0;
        auVar61._12_4_ = local_ae0._12_4_ * fVar183 * 4.0;
        auVar61._16_4_ = local_ae0._16_4_ * fVar184 * 4.0;
        auVar61._20_4_ = local_ae0._20_4_ * fVar185 * 4.0;
        auVar61._24_4_ = local_ae0._24_4_ * fVar365 * 4.0;
        auVar61._28_4_ = auVar350._28_4_;
        auVar12 = vsubps_avx(auVar43,auVar61);
        local_8e0 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,5);
        auVar350 = local_8e0;
        if ((((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_8e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_8e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_8e0 >> 0x7f,0) == '\0') &&
              (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_8e0 >> 0xbf,0) == '\0') &&
            (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_8e0[0x1f]) {
          _local_8a0 = ZEXT1232(ZEXT412(0)) << 0x20;
          _local_840 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar213 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar239 = ZEXT828(0) << 0x20;
          auVar360 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar164._8_4_ = 0x7f800000;
          auVar164._0_8_ = 0x7f8000007f800000;
          auVar164._12_4_ = 0x7f800000;
          auVar164._16_4_ = 0x7f800000;
          auVar164._20_4_ = 0x7f800000;
          auVar164._24_4_ = 0x7f800000;
          auVar164._28_4_ = 0x7f800000;
          auVar272._8_4_ = 0xff800000;
          auVar272._0_8_ = 0xff800000ff800000;
          auVar272._12_4_ = 0xff800000;
          auVar272._16_4_ = 0xff800000;
          auVar272._20_4_ = 0xff800000;
          auVar272._24_4_ = 0xff800000;
          auVar272._28_4_ = 0xff800000;
          local_ae0 = auVar13;
          local_8e0 = auVar23;
          _local_880 = _local_8a0;
        }
        else {
          auVar13 = vsqrtps_avx(auVar12);
          auVar165._0_4_ = fVar258 + fVar258;
          auVar165._4_4_ = fVar180 + fVar180;
          auVar165._8_4_ = fVar182 + fVar182;
          auVar165._12_4_ = fVar183 + fVar183;
          auVar165._16_4_ = fVar184 + fVar184;
          auVar165._20_4_ = fVar185 + fVar185;
          auVar165._24_4_ = fVar365 + fVar365;
          auVar165._28_4_ = fVar224 + fVar224;
          auVar331 = vrcpps_avx(auVar165);
          fVar224 = auVar331._0_4_;
          fVar228 = auVar331._4_4_;
          auVar62._4_4_ = auVar165._4_4_ * fVar228;
          auVar62._0_4_ = auVar165._0_4_ * fVar224;
          fVar229 = auVar331._8_4_;
          auVar62._8_4_ = auVar165._8_4_ * fVar229;
          fVar230 = auVar331._12_4_;
          auVar62._12_4_ = auVar165._12_4_ * fVar230;
          fVar245 = auVar331._16_4_;
          auVar62._16_4_ = auVar165._16_4_ * fVar245;
          fVar253 = auVar331._20_4_;
          auVar62._20_4_ = auVar165._20_4_ * fVar253;
          fVar256 = auVar331._24_4_;
          auVar62._24_4_ = auVar165._24_4_ * fVar256;
          auVar62._28_4_ = auVar165._28_4_;
          auVar402 = vsubps_avx(auVar243,auVar62);
          fVar224 = fVar224 + fVar224 * auVar402._0_4_;
          fVar228 = fVar228 + fVar228 * auVar402._4_4_;
          fVar229 = fVar229 + fVar229 * auVar402._8_4_;
          fVar230 = fVar230 + fVar230 * auVar402._12_4_;
          fVar245 = fVar245 + fVar245 * auVar402._16_4_;
          fVar253 = fVar253 + fVar253 * auVar402._20_4_;
          fVar256 = fVar256 + fVar256 * auVar402._24_4_;
          fVar284 = auVar331._28_4_ + auVar402._28_4_;
          auVar166._0_8_ = local_5c0._0_8_ ^ 0x8000000080000000;
          auVar166._8_4_ = -local_5c0._8_4_;
          auVar166._12_4_ = -local_5c0._12_4_;
          auVar166._16_4_ = -local_5c0._16_4_;
          auVar166._20_4_ = -local_5c0._20_4_;
          auVar166._24_4_ = -local_5c0._24_4_;
          auVar166._28_4_ = -local_5c0._28_4_;
          auVar331 = vsubps_avx(auVar166,auVar13);
          fVar259 = auVar331._0_4_ * fVar224;
          fVar279 = auVar331._4_4_ * fVar228;
          auVar63._4_4_ = fVar279;
          auVar63._0_4_ = fVar259;
          fVar287 = auVar331._8_4_ * fVar229;
          auVar63._8_4_ = fVar287;
          fVar289 = auVar331._12_4_ * fVar230;
          auVar63._12_4_ = fVar289;
          fVar251 = auVar331._16_4_ * fVar245;
          auVar63._16_4_ = fVar251;
          fVar254 = auVar331._20_4_ * fVar253;
          auVar63._20_4_ = fVar254;
          fVar282 = auVar331._24_4_ * fVar256;
          auVar63._24_4_ = fVar282;
          auVar63._28_4_ = auVar331._28_4_;
          auVar331 = vsubps_avx(auVar13,local_5c0);
          fVar224 = auVar331._0_4_ * fVar224;
          fVar228 = auVar331._4_4_ * fVar228;
          auVar64._4_4_ = fVar228;
          auVar64._0_4_ = fVar224;
          fVar229 = auVar331._8_4_ * fVar229;
          auVar64._8_4_ = fVar229;
          fVar230 = auVar331._12_4_ * fVar230;
          auVar64._12_4_ = fVar230;
          fVar245 = auVar331._16_4_ * fVar245;
          auVar64._16_4_ = fVar245;
          fVar253 = auVar331._20_4_ * fVar253;
          auVar64._20_4_ = fVar253;
          fVar256 = auVar331._24_4_ * fVar256;
          auVar64._24_4_ = fVar256;
          auVar64._28_4_ = 0x80000000;
          fVar286 = local_400 * (fVar259 * fVar346 + fVar366);
          fVar288 = fStack_3fc * (fVar279 * fVar352 + fVar371);
          fVar309 = fStack_3f8 * (fVar287 * fVar353 + fVar372);
          fVar311 = fStack_3f4 * (fVar289 * fVar354 + fVar373);
          fVar313 = fStack_3f0 * (fVar251 * fVar355 + fVar374);
          fVar315 = fStack_3ec * (fVar254 * fVar356 + fVar375);
          fVar291 = fStack_3e8 * (fVar282 * fVar357 + fVar376);
          auVar221._0_4_ = fVar97 + fVar227 * fVar286;
          auVar221._4_4_ = fVar124 + fVar250 * fVar288;
          auVar221._8_4_ = fVar127 + fVar285 * fVar309;
          auVar221._12_4_ = fVar130 + fVar280 * fVar311;
          auVar221._16_4_ = fVar132 + fVar307 * fVar313;
          auVar221._20_4_ = fVar134 + fVar416 * fVar315;
          auVar221._24_4_ = fVar136 + fVar18 * fVar291;
          auVar221._28_4_ = fVar138 + auVar331._28_4_ + fVar377;
          auVar65._4_4_ = (float)local_7c0._4_4_ * fVar279;
          auVar65._0_4_ = (float)local_7c0._0_4_ * fVar259;
          auVar65._8_4_ = fStack_7b8 * fVar287;
          auVar65._12_4_ = fStack_7b4 * fVar289;
          auVar65._16_4_ = fStack_7b0 * fVar251;
          auVar65._20_4_ = fStack_7ac * fVar254;
          auVar65._24_4_ = fStack_7a8 * fVar282;
          auVar65._28_4_ = fVar284;
          local_a40 = vsubps_avx(auVar65,auVar221);
          auVar241._0_4_ = fVar98 + fVar225 * fVar286;
          auVar241._4_4_ = fVar125 + fVar246 * fVar288;
          auVar241._8_4_ = fVar128 + fVar281 * fVar309;
          auVar241._12_4_ = fVar131 + fVar257 * fVar311;
          auVar241._16_4_ = fVar133 + fVar290 * fVar313;
          auVar241._20_4_ = fVar135 + fVar317 * fVar315;
          auVar241._24_4_ = fVar137 + fVar16 * fVar291;
          auVar241._28_4_ = fVar139 + fVar284;
          auVar66._4_4_ = (float)local_7e0._4_4_ * fVar279;
          auVar66._0_4_ = (float)local_7e0._0_4_ * fVar259;
          auVar66._8_4_ = fStack_7d8 * fVar287;
          auVar66._12_4_ = fStack_7d4 * fVar289;
          auVar66._16_4_ = fStack_7d0 * fVar251;
          auVar66._20_4_ = fStack_7cc * fVar254;
          auVar66._24_4_ = fStack_7c8 * fVar282;
          auVar66._28_4_ = fVar129;
          _local_9c0 = vsubps_avx(auVar66,auVar241);
          auVar273._0_4_ = local_540._0_4_ + fVar226 * fVar286;
          auVar273._4_4_ = local_540._4_4_ + fVar248 * fVar288;
          auVar273._8_4_ = local_540._8_4_ + fVar283 * fVar309;
          auVar273._12_4_ = local_540._12_4_ + fVar260 * fVar311;
          auVar273._16_4_ = local_540._16_4_ + fVar292 * fVar313;
          auVar273._20_4_ = local_540._20_4_ + fVar384 * fVar315;
          auVar273._24_4_ = local_540._24_4_ + fVar17 * fVar291;
          auVar273._28_4_ = local_540._28_4_ + 0.0;
          auVar67._4_4_ = (float)local_800._4_4_ * fVar279;
          auVar67._0_4_ = (float)local_800._0_4_ * fVar259;
          auVar67._8_4_ = fStack_7f8 * fVar287;
          auVar67._12_4_ = fStack_7f4 * fVar289;
          auVar67._16_4_ = fStack_7f0 * fVar251;
          auVar67._20_4_ = fStack_7ec * fVar254;
          auVar67._24_4_ = fStack_7e8 * fVar282;
          auVar67._28_4_ = fVar129;
          local_b00 = vsubps_avx(auVar67,auVar273);
          fVar259 = local_400 * (fVar224 * fVar346 + fVar366);
          fVar279 = fStack_3fc * (fVar228 * fVar352 + fVar371);
          fVar287 = fStack_3f8 * (fVar229 * fVar353 + fVar372);
          fVar289 = fStack_3f4 * (fVar230 * fVar354 + fVar373);
          fVar251 = fStack_3f0 * (fVar245 * fVar355 + fVar374);
          fVar254 = fStack_3ec * (fVar253 * fVar356 + fVar375);
          fVar282 = fStack_3e8 * (fVar256 * fVar357 + fVar376);
          auVar304._0_4_ = fVar97 + fVar227 * fVar259;
          auVar304._4_4_ = fVar124 + fVar250 * fVar279;
          auVar304._8_4_ = fVar127 + fVar285 * fVar287;
          auVar304._12_4_ = fVar130 + fVar280 * fVar289;
          auVar304._16_4_ = fVar132 + fVar307 * fVar251;
          auVar304._20_4_ = fVar134 + fVar416 * fVar254;
          auVar304._24_4_ = fVar136 + fVar18 * fVar282;
          auVar304._28_4_ = fVar138 + fVar129;
          auVar68._4_4_ = fVar228 * (float)local_7c0._4_4_;
          auVar68._0_4_ = fVar224 * (float)local_7c0._0_4_;
          auVar68._8_4_ = fVar229 * fStack_7b8;
          auVar68._12_4_ = fVar230 * fStack_7b4;
          auVar68._16_4_ = fVar245 * fStack_7b0;
          auVar68._20_4_ = fVar253 * fStack_7ac;
          auVar68._24_4_ = fVar256 * fStack_7a8;
          auVar68._28_4_ = fStack_7a4;
          _local_880 = vsubps_avx(auVar68,auVar304);
          auVar305._0_4_ = fVar98 + fVar225 * fVar259;
          auVar305._4_4_ = fVar125 + fVar246 * fVar279;
          auVar305._8_4_ = fVar128 + fVar281 * fVar287;
          auVar305._12_4_ = fVar131 + fVar257 * fVar289;
          auVar305._16_4_ = fVar133 + fVar290 * fVar251;
          auVar305._20_4_ = fVar135 + fVar317 * fVar254;
          auVar305._24_4_ = fVar137 + fVar16 * fVar282;
          auVar305._28_4_ = fVar139 + local_880._28_4_;
          auVar69._4_4_ = (float)local_7e0._4_4_ * fVar228;
          auVar69._0_4_ = (float)local_7e0._0_4_ * fVar224;
          auVar69._8_4_ = fStack_7d8 * fVar229;
          auVar69._12_4_ = fStack_7d4 * fVar230;
          auVar69._16_4_ = fStack_7d0 * fVar245;
          auVar69._20_4_ = fStack_7cc * fVar253;
          auVar69._24_4_ = fStack_7c8 * fVar256;
          auVar69._28_4_ = fStack_7a4;
          _local_8a0 = vsubps_avx(auVar69,auVar305);
          auVar274._0_4_ = local_540._0_4_ + fVar226 * fVar259;
          auVar274._4_4_ = local_540._4_4_ + fVar248 * fVar279;
          auVar274._8_4_ = local_540._8_4_ + fVar283 * fVar287;
          auVar274._12_4_ = local_540._12_4_ + fVar260 * fVar289;
          auVar274._16_4_ = local_540._16_4_ + fVar292 * fVar251;
          auVar274._20_4_ = local_540._20_4_ + fVar384 * fVar254;
          auVar274._24_4_ = local_540._24_4_ + fVar17 * fVar282;
          auVar274._28_4_ = local_540._28_4_ + local_b00._28_4_ + fVar377;
          auVar70._4_4_ = (float)local_800._4_4_ * fVar228;
          auVar70._0_4_ = (float)local_800._0_4_ * fVar224;
          auVar70._8_4_ = fStack_7f8 * fVar229;
          auVar70._12_4_ = fStack_7f4 * fVar230;
          auVar70._16_4_ = fStack_7f0 * fVar245;
          auVar70._20_4_ = fStack_7ec * fVar253;
          auVar70._24_4_ = fStack_7e8 * fVar256;
          auVar70._28_4_ = local_8a0._28_4_;
          _local_840 = vsubps_avx(auVar70,auVar274);
          auVar331 = vcmpps_avx(auVar12,_DAT_02020f00,5);
          auVar275._8_4_ = 0x7f800000;
          auVar275._0_8_ = 0x7f8000007f800000;
          auVar275._12_4_ = 0x7f800000;
          auVar275._16_4_ = 0x7f800000;
          auVar275._20_4_ = 0x7f800000;
          auVar275._24_4_ = 0x7f800000;
          auVar275._28_4_ = 0x7f800000;
          auVar164 = vblendvps_avx(auVar275,auVar63,auVar331);
          auVar332._8_4_ = 0x7fffffff;
          auVar332._0_8_ = 0x7fffffff7fffffff;
          auVar332._12_4_ = 0x7fffffff;
          auVar332._16_4_ = 0x7fffffff;
          auVar332._20_4_ = 0x7fffffff;
          auVar332._24_4_ = 0x7fffffff;
          auVar332._28_4_ = 0x7fffffff;
          auVar12 = vandps_avx(auVar332,local_420);
          auVar12 = vmaxps_avx(local_4e0,auVar12);
          auVar71._4_4_ = auVar12._4_4_ * 1.9073486e-06;
          auVar71._0_4_ = auVar12._0_4_ * 1.9073486e-06;
          auVar71._8_4_ = auVar12._8_4_ * 1.9073486e-06;
          auVar71._12_4_ = auVar12._12_4_ * 1.9073486e-06;
          auVar71._16_4_ = auVar12._16_4_ * 1.9073486e-06;
          auVar71._20_4_ = auVar12._20_4_ * 1.9073486e-06;
          auVar71._24_4_ = auVar12._24_4_ * 1.9073486e-06;
          auVar71._28_4_ = auVar12._28_4_;
          auVar12 = vandps_avx(auVar332,local_660);
          auVar12 = vcmpps_avx(auVar12,auVar71,1);
          auVar276._8_4_ = 0xff800000;
          auVar276._0_8_ = 0xff800000ff800000;
          auVar276._12_4_ = 0xff800000;
          auVar276._16_4_ = 0xff800000;
          auVar276._20_4_ = 0xff800000;
          auVar276._24_4_ = 0xff800000;
          auVar276._28_4_ = 0xff800000;
          auVar272 = vblendvps_avx(auVar276,auVar64,auVar331);
          auVar13 = auVar331 & auVar12;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar350 = vandps_avx(auVar12,auVar331);
            auVar143 = vpackssdw_avx(auVar350._0_16_,auVar350._16_16_);
            auVar402 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar13 = vcmpps_avx(local_ae0,auVar402,2);
            auVar420._8_4_ = 0xff800000;
            auVar420._0_8_ = 0xff800000ff800000;
            auVar420._12_4_ = 0xff800000;
            auVar420._16_4_ = 0xff800000;
            auVar420._20_4_ = 0xff800000;
            auVar420._24_4_ = 0xff800000;
            auVar420._28_4_ = 0xff800000;
            auVar422._8_4_ = 0x7f800000;
            auVar422._0_8_ = 0x7f8000007f800000;
            auVar422._12_4_ = 0x7f800000;
            auVar422._16_4_ = 0x7f800000;
            auVar422._20_4_ = 0x7f800000;
            auVar422._24_4_ = 0x7f800000;
            auVar422._28_4_ = 0x7f800000;
            auVar12 = vblendvps_avx(auVar422,auVar420,auVar13);
            auVar209 = vpmovsxwd_avx(auVar143);
            auVar143 = vpunpckhwd_avx(auVar143,auVar143);
            auVar333._16_16_ = auVar143;
            auVar333._0_16_ = auVar209;
            auVar164 = vblendvps_avx(auVar164,auVar12,auVar333);
            auVar12 = vblendvps_avx(auVar420,auVar422,auVar13);
            auVar272 = vblendvps_avx(auVar272,auVar12,auVar333);
            auVar12 = vcmpps_avx(auVar402,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar202._0_4_ = auVar350._0_4_ ^ auVar12._0_4_;
            auVar202._4_4_ = auVar350._4_4_ ^ auVar12._4_4_;
            auVar202._8_4_ = auVar350._8_4_ ^ auVar12._8_4_;
            auVar202._12_4_ = auVar350._12_4_ ^ auVar12._12_4_;
            auVar202._16_4_ = auVar350._16_4_ ^ auVar12._16_4_;
            auVar202._20_4_ = auVar350._20_4_ ^ auVar12._20_4_;
            auVar202._24_4_ = auVar350._24_4_ ^ auVar12._24_4_;
            auVar202._28_4_ = auVar350._28_4_ ^ auVar12._28_4_;
            auVar350 = vorps_avx(auVar13,auVar202);
            auVar350 = vandps_avx(auVar331,auVar350);
          }
          auVar213 = local_a40._0_28_;
          auVar239 = local_9c0._0_28_;
          auVar360 = local_b00._0_28_;
        }
        auVar306 = ZEXT3264(_local_9a0);
        _local_4a0 = local_640;
        local_480 = vminps_avx(local_440,auVar164);
        _local_460 = vmaxps_avx(local_640,auVar272);
        auVar383 = ZEXT3264(_local_460);
        auVar12 = vcmpps_avx(local_640,local_480,2);
        local_540 = vandps_avx(auVar110,auVar12);
        local_5e0 = local_540;
        auVar12 = vcmpps_avx(_local_460,local_440,2);
        local_600 = vandps_avx(auVar110,auVar12);
        auVar110 = vorps_avx(local_600,local_540);
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0x7f,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar110 >> 0xbf,0) != '\0') ||
            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar110[0x1f] < '\0') {
          local_580 = local_600;
          local_860 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_5c0._0_4_ = auVar350._0_4_ ^ local_860._0_4_;
          local_5c0._4_4_ = auVar350._4_4_ ^ local_860._4_4_;
          local_5c0._8_4_ = (float)(auVar350._8_4_ ^ local_860._8_4_);
          local_5c0._12_4_ = (float)(auVar350._12_4_ ^ local_860._12_4_);
          local_5c0._16_4_ = (float)(auVar350._16_4_ ^ local_860._16_4_);
          local_5c0._20_4_ = (float)(auVar350._20_4_ ^ local_860._20_4_);
          local_5c0._24_4_ = (float)(auVar350._24_4_ ^ local_860._24_4_);
          local_5c0._28_4_ = (float)((uint)auVar350._28_4_ ^ (uint)local_860._28_4_);
          auVar118._0_4_ =
               auVar213._0_4_ * (float)local_7c0._0_4_ +
               auVar239._0_4_ * (float)local_7e0._0_4_ + auVar360._0_4_ * (float)local_800._0_4_;
          auVar118._4_4_ =
               auVar213._4_4_ * (float)local_7c0._4_4_ +
               auVar239._4_4_ * (float)local_7e0._4_4_ + auVar360._4_4_ * (float)local_800._4_4_;
          auVar118._8_4_ =
               auVar213._8_4_ * fStack_7b8 +
               auVar239._8_4_ * fStack_7d8 + auVar360._8_4_ * fStack_7f8;
          auVar118._12_4_ =
               auVar213._12_4_ * fStack_7b4 +
               auVar239._12_4_ * fStack_7d4 + auVar360._12_4_ * fStack_7f4;
          auVar118._16_4_ =
               auVar213._16_4_ * fStack_7b0 +
               auVar239._16_4_ * fStack_7d0 + auVar360._16_4_ * fStack_7f0;
          auVar118._20_4_ =
               auVar213._20_4_ * fStack_7ac +
               auVar239._20_4_ * fStack_7cc + auVar360._20_4_ * fStack_7ec;
          auVar118._24_4_ =
               auVar213._24_4_ * fStack_7a8 +
               auVar239._24_4_ * fStack_7c8 + auVar360._24_4_ * fStack_7e8;
          auVar118._28_4_ = local_860._28_4_ + local_540._28_4_ + auVar350._28_4_;
          auVar167._8_4_ = 0x7fffffff;
          auVar167._0_8_ = 0x7fffffff7fffffff;
          auVar167._12_4_ = 0x7fffffff;
          auVar167._16_4_ = 0x7fffffff;
          auVar167._20_4_ = 0x7fffffff;
          auVar167._24_4_ = 0x7fffffff;
          auVar167._28_4_ = 0x7fffffff;
          auVar110 = vandps_avx(auVar118,auVar167);
          auVar168._8_4_ = 0x3e99999a;
          auVar168._0_8_ = 0x3e99999a3e99999a;
          auVar168._12_4_ = 0x3e99999a;
          auVar168._16_4_ = 0x3e99999a;
          auVar168._20_4_ = 0x3e99999a;
          auVar168._24_4_ = 0x3e99999a;
          auVar168._28_4_ = 0x3e99999a;
          auVar110 = vcmpps_avx(auVar110,auVar168,1);
          auVar110 = vorps_avx(auVar110,local_5c0);
          auVar169._8_4_ = 3;
          auVar169._0_8_ = 0x300000003;
          auVar169._12_4_ = 3;
          auVar169._16_4_ = 3;
          auVar169._20_4_ = 3;
          auVar169._24_4_ = 3;
          auVar169._28_4_ = 3;
          auVar197._8_4_ = 2;
          auVar197._0_8_ = 0x200000002;
          auVar197._12_4_ = 2;
          auVar197._16_4_ = 2;
          auVar197._20_4_ = 2;
          auVar197._24_4_ = 2;
          auVar197._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar197,auVar169,auVar110);
          local_5a0 = ZEXT432((uint)uVar93);
          auVar209 = vpshufd_avx(ZEXT416((uint)uVar93),0);
          auVar143 = vpcmpgtd_avx(auVar110._16_16_,auVar209);
          local_660._0_16_ = auVar209;
          auVar209 = vpcmpgtd_avx(auVar110._0_16_,auVar209);
          auVar170._16_16_ = auVar143;
          auVar170._0_16_ = auVar209;
          local_560 = vblendps_avx(ZEXT1632(auVar209),auVar170,0xf0);
          local_5e0 = vandnps_avx(local_560,local_540);
          auVar110 = local_540 & ~local_560;
          auVar223 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_620._0_8_ = uVar93;
          auVar350 = _local_460;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0x7f,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0xbf,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar110[0x1f] < '\0') {
            local_820._4_4_ = local_640._4_4_ + (float)local_9a0._4_4_;
            local_820._0_4_ = local_640._0_4_ + (float)local_9a0._0_4_;
            fStack_818 = local_640._8_4_ + fStack_998;
            fStack_814 = local_640._12_4_ + fStack_994;
            fStack_810 = local_640._16_4_ + fStack_990;
            fStack_80c = local_640._20_4_ + fStack_98c;
            fStack_808 = local_640._24_4_ + fStack_988;
            fStack_804 = local_640._28_4_ + fStack_984;
            local_9e0 = _local_460;
            do {
              auVar231 = auVar223._0_16_;
              auVar171._8_4_ = 0x7f800000;
              auVar171._0_8_ = 0x7f8000007f800000;
              auVar171._12_4_ = 0x7f800000;
              auVar171._16_4_ = 0x7f800000;
              auVar171._20_4_ = 0x7f800000;
              auVar171._24_4_ = 0x7f800000;
              auVar171._28_4_ = 0x7f800000;
              auVar110 = vblendvps_avx(auVar171,local_640,local_5e0);
              auVar350 = vshufps_avx(auVar110,auVar110,0xb1);
              auVar350 = vminps_avx(auVar110,auVar350);
              auVar12 = vshufpd_avx(auVar350,auVar350,5);
              auVar350 = vminps_avx(auVar350,auVar12);
              auVar12 = vperm2f128_avx(auVar350,auVar350,1);
              auVar350 = vminps_avx(auVar350,auVar12);
              auVar350 = vcmpps_avx(auVar110,auVar350,0);
              auVar12 = local_5e0 & auVar350;
              auVar110 = local_5e0;
              if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar12 >> 0x7f,0) != '\0') ||
                    (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar12 >> 0xbf,0) != '\0') ||
                  (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar12[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar350,local_5e0);
              }
              uVar91 = vmovmskps_avx(auVar110);
              uVar8 = 0;
              if (uVar91 != 0) {
                for (; (uVar91 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                }
              }
              uVar93 = (ulong)uVar8;
              *(undefined4 *)(local_5e0 + uVar93 * 4) = 0;
              fVar224 = local_500[uVar93];
              uVar8 = *(uint *)(local_4a0 + uVar93 * 4);
              fVar225 = local_b04;
              if ((float)local_940._0_4_ < 0.0) {
                fVar225 = sqrtf((float)local_940._0_4_);
                auVar231._8_4_ = 0x7fffffff;
                auVar231._0_8_ = 0x7fffffff7fffffff;
                auVar231._12_4_ = 0x7fffffff;
              }
              auVar244 = ZEXT464(uVar8);
              auVar209 = vminps_avx(_local_a80,_local_aa0);
              auVar143 = vmaxps_avx(_local_a80,_local_aa0);
              auVar102 = vminps_avx(_local_a90,_local_ab0);
              auVar187 = vminps_avx(auVar209,auVar102);
              auVar209 = vmaxps_avx(_local_a90,_local_ab0);
              auVar102 = vmaxps_avx(auVar143,auVar209);
              auVar143 = vandps_avx(auVar187,auVar231);
              auVar209 = vandps_avx(auVar102,auVar231);
              auVar143 = vmaxps_avx(auVar143,auVar209);
              auVar209 = vmovshdup_avx(auVar143);
              auVar209 = vmaxss_avx(auVar209,auVar143);
              auVar143 = vshufpd_avx(auVar143,auVar143,1);
              auVar143 = vmaxss_avx(auVar143,auVar209);
              local_a40._0_4_ = auVar143._0_4_ * 1.9073486e-06;
              local_900._0_4_ = fVar225 * 1.9073486e-06;
              local_7a0._0_16_ = vshufps_avx(auVar102,auVar102,0xff);
              lVar92 = 4;
              do {
                local_b00._0_4_ = 1.0 - fVar224;
                auVar143 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
                fVar225 = auVar143._0_4_;
                fVar226 = auVar143._4_4_;
                fVar227 = auVar143._8_4_;
                fVar228 = auVar143._12_4_;
                auVar143 = vshufps_avx(ZEXT416((uint)local_b00._0_4_),ZEXT416((uint)local_b00._0_4_)
                                       ,0);
                fVar229 = auVar143._0_4_;
                fVar230 = auVar143._4_4_;
                fVar245 = auVar143._8_4_;
                fVar246 = auVar143._12_4_;
                fVar248 = (float)local_a90._0_4_ * fVar225 + (float)local_aa0._0_4_ * fVar229;
                fVar250 = (float)local_a90._4_4_ * fVar226 + (float)local_aa0._4_4_ * fVar230;
                fVar253 = fStack_a88 * fVar227 + fStack_a98 * fVar245;
                fVar256 = fStack_a84 * fVar228 + fStack_a94 * fVar246;
                auVar264._0_4_ =
                     fVar229 * ((float)local_aa0._0_4_ * fVar225 + fVar229 * (float)local_a80._0_4_)
                     + fVar225 * fVar248;
                auVar264._4_4_ =
                     fVar230 * ((float)local_aa0._4_4_ * fVar226 + fVar230 * (float)local_a80._4_4_)
                     + fVar226 * fVar250;
                auVar264._8_4_ =
                     fVar245 * (fStack_a98 * fVar227 + fVar245 * fStack_a78) + fVar227 * fVar253;
                auVar264._12_4_ =
                     fVar246 * (fStack_a94 * fVar228 + fVar246 * fStack_a74) + fVar228 * fVar256;
                auVar205._0_4_ =
                     fVar229 * fVar248 +
                     fVar225 * (fVar225 * (float)local_ab0._0_4_ + (float)local_a90._0_4_ * fVar229)
                ;
                auVar205._4_4_ =
                     fVar230 * fVar250 +
                     fVar226 * (fVar226 * (float)local_ab0._4_4_ + (float)local_a90._4_4_ * fVar230)
                ;
                auVar205._8_4_ =
                     fVar245 * fVar253 + fVar227 * (fVar227 * fStack_aa8 + fStack_a88 * fVar245);
                auVar205._12_4_ =
                     fVar246 * fVar256 + fVar228 * (fVar228 * fStack_aa4 + fStack_a84 * fVar246);
                auVar143 = vshufps_avx(auVar244._0_16_,auVar244._0_16_,0);
                auVar144._0_4_ = auVar143._0_4_ * (float)local_930._0_4_ + 0.0;
                auVar144._4_4_ = auVar143._4_4_ * (float)local_930._4_4_ + 0.0;
                auVar144._8_4_ = auVar143._8_4_ * fStack_928 + 0.0;
                auVar144._12_4_ = auVar143._12_4_ * fStack_924 + 0.0;
                auVar101._0_4_ = fVar229 * auVar264._0_4_ + fVar225 * auVar205._0_4_;
                auVar101._4_4_ = fVar230 * auVar264._4_4_ + fVar226 * auVar205._4_4_;
                auVar101._8_4_ = fVar245 * auVar264._8_4_ + fVar227 * auVar205._8_4_;
                auVar101._12_4_ = fVar246 * auVar264._12_4_ + fVar228 * auVar205._12_4_;
                local_8e0._0_16_ = auVar101;
                auVar143 = vsubps_avx(auVar144,auVar101);
                _local_9c0 = auVar143;
                auVar143 = vdpps_avx(auVar143,auVar143,0x7f);
                fVar225 = auVar143._0_4_;
                local_bc0 = auVar244._0_4_;
                if (fVar225 < 0.0) {
                  local_b00._0_16_ = ZEXT416((uint)local_b00._0_4_);
                  local_ae0._0_16_ = auVar264;
                  local_960._0_16_ = auVar205;
                  fVar226 = sqrtf(fVar225);
                  auVar205 = local_960._0_16_;
                  auVar264 = local_ae0._0_16_;
                }
                else {
                  auVar209 = vsqrtss_avx(auVar143,auVar143);
                  fVar226 = auVar209._0_4_;
                }
                auVar209 = vsubps_avx(auVar205,auVar264);
                auVar295._0_4_ = auVar209._0_4_ * 3.0;
                auVar295._4_4_ = auVar209._4_4_ * 3.0;
                auVar295._8_4_ = auVar209._8_4_ * 3.0;
                auVar295._12_4_ = auVar209._12_4_ * 3.0;
                auVar209 = vshufps_avx(ZEXT416((uint)(fVar224 * 6.0)),ZEXT416((uint)(fVar224 * 6.0))
                                       ,0);
                auVar102 = ZEXT416((uint)(((float)local_b00._0_4_ - (fVar224 + fVar224)) * 6.0));
                auVar187 = vshufps_avx(auVar102,auVar102,0);
                auVar102 = ZEXT416((uint)((fVar224 -
                                          ((float)local_b00._0_4_ + (float)local_b00._0_4_)) * 6.0))
                ;
                auVar206 = vshufps_avx(auVar102,auVar102,0);
                auVar3 = vshufps_avx(ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),
                                     ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),0);
                auVar102 = vdpps_avx(auVar295,auVar295,0x7f);
                auVar145._0_4_ =
                     auVar3._0_4_ * (float)local_a80._0_4_ +
                     auVar206._0_4_ * (float)local_aa0._0_4_ +
                     auVar209._0_4_ * (float)local_ab0._0_4_ +
                     auVar187._0_4_ * (float)local_a90._0_4_;
                auVar145._4_4_ =
                     auVar3._4_4_ * (float)local_a80._4_4_ +
                     auVar206._4_4_ * (float)local_aa0._4_4_ +
                     auVar209._4_4_ * (float)local_ab0._4_4_ +
                     auVar187._4_4_ * (float)local_a90._4_4_;
                auVar145._8_4_ =
                     auVar3._8_4_ * fStack_a78 +
                     auVar206._8_4_ * fStack_a98 +
                     auVar209._8_4_ * fStack_aa8 + auVar187._8_4_ * fStack_a88;
                auVar145._12_4_ =
                     auVar3._12_4_ * fStack_a74 +
                     auVar206._12_4_ * fStack_a94 +
                     auVar209._12_4_ * fStack_aa4 + auVar187._12_4_ * fStack_a84;
                auVar209 = vblendps_avx(auVar102,_DAT_01feba10,0xe);
                auVar187 = vrsqrtss_avx(auVar209,auVar209);
                fVar228 = auVar187._0_4_;
                fVar227 = auVar102._0_4_;
                auVar187 = vdpps_avx(auVar295,auVar145,0x7f);
                auVar206 = vshufps_avx(auVar102,auVar102,0);
                auVar146._0_4_ = auVar145._0_4_ * auVar206._0_4_;
                auVar146._4_4_ = auVar145._4_4_ * auVar206._4_4_;
                auVar146._8_4_ = auVar145._8_4_ * auVar206._8_4_;
                auVar146._12_4_ = auVar145._12_4_ * auVar206._12_4_;
                auVar187 = vshufps_avx(auVar187,auVar187,0);
                auVar232._0_4_ = auVar295._0_4_ * auVar187._0_4_;
                auVar232._4_4_ = auVar295._4_4_ * auVar187._4_4_;
                auVar232._8_4_ = auVar295._8_4_ * auVar187._8_4_;
                auVar232._12_4_ = auVar295._12_4_ * auVar187._12_4_;
                auVar3 = vsubps_avx(auVar146,auVar232);
                auVar187 = vrcpss_avx(auVar209,auVar209);
                auVar209 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                      ZEXT416((uint)(local_bc0 * (float)local_900._0_4_)));
                auVar187 = ZEXT416((uint)(auVar187._0_4_ * (2.0 - fVar227 * auVar187._0_4_)));
                auVar187 = vshufps_avx(auVar187,auVar187,0);
                uVar93 = CONCAT44(auVar295._4_4_,auVar295._0_4_);
                local_a20._0_8_ = uVar93 ^ 0x8000000080000000;
                local_a20._8_4_ = -auVar295._8_4_;
                local_a20._12_4_ = -auVar295._12_4_;
                auVar206 = ZEXT416((uint)(fVar228 * 1.5 +
                                         fVar227 * -0.5 * fVar228 * fVar228 * fVar228));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                auVar207._0_4_ = auVar206._0_4_ * auVar3._0_4_ * auVar187._0_4_;
                auVar207._4_4_ = auVar206._4_4_ * auVar3._4_4_ * auVar187._4_4_;
                auVar207._8_4_ = auVar206._8_4_ * auVar3._8_4_ * auVar187._8_4_;
                auVar207._12_4_ = auVar206._12_4_ * auVar3._12_4_ * auVar187._12_4_;
                auVar359._0_4_ = auVar295._0_4_ * auVar206._0_4_;
                auVar359._4_4_ = auVar295._4_4_ * auVar206._4_4_;
                auVar359._8_4_ = auVar295._8_4_ * auVar206._8_4_;
                auVar359._12_4_ = auVar295._12_4_ * auVar206._12_4_;
                local_b00._0_16_ = auVar295;
                local_ae0._0_4_ = auVar209._0_4_;
                if (fVar227 < 0.0) {
                  local_960._0_4_ = fVar226;
                  local_980._0_16_ = auVar359;
                  local_920._0_16_ = auVar207;
                  fVar228 = sqrtf(fVar227);
                  auVar207 = local_920._0_16_;
                  auVar359 = local_980._0_16_;
                  fVar226 = (float)local_960._0_4_;
                  fVar227 = (float)local_ae0._0_4_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar102,auVar102);
                  fVar228 = auVar102._0_4_;
                  fVar227 = auVar209._0_4_;
                }
                auVar209 = vdpps_avx(_local_9c0,auVar359,0x7f);
                local_960._0_4_ =
                     ((float)local_a40._0_4_ / fVar228) * (fVar226 + 1.0) +
                     fVar227 + fVar226 * (float)local_a40._0_4_;
                auVar102 = vdpps_avx(local_a20._0_16_,auVar359,0x7f);
                auVar187 = vdpps_avx(_local_9c0,auVar207,0x7f);
                auVar206 = vdpps_avx(_local_930,auVar359,0x7f);
                auVar3 = vdpps_avx(_local_9c0,local_a20._0_16_,0x7f);
                fVar226 = auVar102._0_4_ + auVar187._0_4_;
                fVar228 = auVar209._0_4_;
                auVar103._0_4_ = fVar228 * fVar228;
                auVar103._4_4_ = auVar209._4_4_ * auVar209._4_4_;
                auVar103._8_4_ = auVar209._8_4_ * auVar209._8_4_;
                auVar103._12_4_ = auVar209._12_4_ * auVar209._12_4_;
                auVar187 = vsubps_avx(auVar143,auVar103);
                local_a20._0_16_ = ZEXT416((uint)fVar226);
                auVar102 = vdpps_avx(_local_9c0,_local_930,0x7f);
                fVar229 = auVar3._0_4_ - fVar228 * fVar226;
                fVar228 = auVar102._0_4_ - fVar228 * auVar206._0_4_;
                auVar102 = vrsqrtss_avx(auVar187,auVar187);
                fVar230 = auVar187._0_4_;
                fVar226 = auVar102._0_4_;
                fVar226 = fVar226 * 1.5 + fVar230 * -0.5 * fVar226 * fVar226 * fVar226;
                if (fVar230 < 0.0) {
                  local_980._0_16_ = auVar209;
                  local_920._0_16_ = auVar206;
                  local_740._0_4_ = fVar229;
                  local_760._0_4_ = fVar228;
                  local_780._0_4_ = fVar226;
                  fVar230 = sqrtf(fVar230);
                  fVar226 = (float)local_780._0_4_;
                  fVar229 = (float)local_740._0_4_;
                  fVar228 = (float)local_760._0_4_;
                  auVar206 = local_920._0_16_;
                  auVar209 = local_980._0_16_;
                  fVar227 = (float)local_ae0._0_4_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar187,auVar187);
                  fVar230 = auVar102._0_4_;
                }
                auVar187 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar3 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
                fVar229 = fVar229 * fVar226 - auVar3._0_4_;
                auVar233._0_8_ = auVar206._0_8_ ^ 0x8000000080000000;
                auVar233._8_4_ = auVar206._8_4_ ^ 0x80000000;
                auVar233._12_4_ = auVar206._12_4_ ^ 0x80000000;
                auVar265._0_4_ = -fVar229;
                auVar265._4_4_ = 0x80000000;
                auVar265._8_4_ = 0x80000000;
                auVar265._12_4_ = 0x80000000;
                auVar383 = ZEXT1664(local_a20._0_16_);
                auVar102 = vinsertps_avx(ZEXT416((uint)(fVar228 * fVar226)),auVar233,0x10);
                auVar206 = vmovsldup_avx(ZEXT416((uint)(local_a20._0_4_ * fVar228 * fVar226 -
                                                       auVar206._0_4_ * fVar229)));
                auVar102 = vdivps_avx(auVar102,auVar206);
                auVar147 = ZEXT416((uint)(fVar230 - auVar187._0_4_));
                auVar187 = vinsertps_avx(auVar209,auVar147,0x10);
                auVar208._0_4_ = auVar187._0_4_ * auVar102._0_4_;
                auVar208._4_4_ = auVar187._4_4_ * auVar102._4_4_;
                auVar208._8_4_ = auVar187._8_4_ * auVar102._8_4_;
                auVar208._12_4_ = auVar187._12_4_ * auVar102._12_4_;
                auVar102 = vinsertps_avx(auVar265,local_a20._0_16_,0x1c);
                auVar102 = vdivps_avx(auVar102,auVar206);
                auVar188._0_4_ = auVar187._0_4_ * auVar102._0_4_;
                auVar188._4_4_ = auVar187._4_4_ * auVar102._4_4_;
                auVar188._8_4_ = auVar187._8_4_ * auVar102._8_4_;
                auVar188._12_4_ = auVar187._12_4_ * auVar102._12_4_;
                auVar102 = vhaddps_avx(auVar208,auVar208);
                auVar187 = vhaddps_avx(auVar188,auVar188);
                fVar224 = fVar224 - auVar102._0_4_;
                local_bc0 = local_bc0 - auVar187._0_4_;
                auVar244 = ZEXT464((uint)local_bc0);
                auVar234._8_4_ = 0x7fffffff;
                auVar234._0_8_ = 0x7fffffff7fffffff;
                auVar234._12_4_ = 0x7fffffff;
                auVar223 = ZEXT1664(auVar234);
                auVar209 = vandps_avx(auVar209,auVar234);
                if ((float)local_960._0_4_ <= auVar209._0_4_) {
LAB_0117d257:
                  bVar72 = false;
                }
                else {
                  auVar209 = vandps_avx(auVar147,auVar234);
                  if ((float)local_7a0._0_4_ * 1.9073486e-06 + fVar227 + (float)local_960._0_4_ <=
                      auVar209._0_4_) goto LAB_0117d257;
                  local_bc0 = local_bc0 + (float)local_8c0._0_4_;
                  auVar244 = ZEXT464((uint)local_bc0);
                  bVar72 = true;
                  if (((fVar203 <= local_bc0) &&
                      (fVar226 = *(float *)(ray + k * 4 + 0x80), local_bc0 <= fVar226)) &&
                     ((0.0 <= fVar224 && (fVar224 <= 1.0)))) {
                    auVar143 = vrsqrtss_avx(auVar143,auVar143);
                    fVar227 = auVar143._0_4_;
                    pGVar9 = (context->scene->geometries).items[uVar89].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar143 = ZEXT416((uint)(fVar227 * 1.5 +
                                               fVar225 * -0.5 * fVar227 * fVar227 * fVar227));
                      auVar143 = vshufps_avx(auVar143,auVar143,0);
                      auVar148._0_4_ = auVar143._0_4_ * (float)local_9c0._0_4_;
                      auVar148._4_4_ = auVar143._4_4_ * (float)local_9c0._4_4_;
                      auVar148._8_4_ = auVar143._8_4_ * fStack_9b8;
                      auVar148._12_4_ = auVar143._12_4_ * fStack_9b4;
                      auVar104._0_4_ = local_b00._0_4_ + auVar3._0_4_ * auVar148._0_4_;
                      auVar104._4_4_ = local_b00._4_4_ + auVar3._4_4_ * auVar148._4_4_;
                      auVar104._8_4_ = local_b00._8_4_ + auVar3._8_4_ * auVar148._8_4_;
                      auVar104._12_4_ = local_b00._12_4_ + auVar3._12_4_ * auVar148._12_4_;
                      auVar143 = vshufps_avx(auVar148,auVar148,0xc9);
                      auVar209 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                      auVar149._0_4_ = auVar209._0_4_ * auVar148._0_4_;
                      auVar149._4_4_ = auVar209._4_4_ * auVar148._4_4_;
                      auVar149._8_4_ = auVar209._8_4_ * auVar148._8_4_;
                      auVar149._12_4_ = auVar209._12_4_ * auVar148._12_4_;
                      auVar189._0_4_ = local_b00._0_4_ * auVar143._0_4_;
                      auVar189._4_4_ = local_b00._4_4_ * auVar143._4_4_;
                      auVar189._8_4_ = local_b00._8_4_ * auVar143._8_4_;
                      auVar189._12_4_ = local_b00._12_4_ * auVar143._12_4_;
                      auVar102 = vsubps_avx(auVar189,auVar149);
                      auVar143 = vshufps_avx(auVar102,auVar102,0xc9);
                      auVar209 = vshufps_avx(auVar104,auVar104,0xc9);
                      auVar190._0_4_ = auVar209._0_4_ * auVar143._0_4_;
                      auVar190._4_4_ = auVar209._4_4_ * auVar143._4_4_;
                      auVar190._8_4_ = auVar209._8_4_ * auVar143._8_4_;
                      auVar190._12_4_ = auVar209._12_4_ * auVar143._12_4_;
                      auVar143 = vshufps_avx(auVar102,auVar102,0xd2);
                      auVar105._0_4_ = auVar104._0_4_ * auVar143._0_4_;
                      auVar105._4_4_ = auVar104._4_4_ * auVar143._4_4_;
                      auVar105._8_4_ = auVar104._8_4_ * auVar143._8_4_;
                      auVar105._12_4_ = auVar104._12_4_ * auVar143._12_4_;
                      auVar143 = vsubps_avx(auVar190,auVar105);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_bc0;
                        uVar1 = vextractps_avx(auVar143,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                        uVar1 = vextractps_avx(auVar143,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                        *(int *)(ray + k * 4 + 0xe0) = auVar143._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar224;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_b10;
                        *(uint *)(ray + k * 4 + 0x120) = uVar89;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_6d0 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
                        local_700 = (RTCHitN  [16])vshufps_avx(auVar143,auVar143,0x55);
                        auVar209 = vshufps_avx(auVar143,auVar143,0xaa);
                        local_6e0 = vshufps_avx(auVar143,auVar143,0);
                        auStack_6f0 = auVar209;
                        local_6c0 = ZEXT816(0) << 0x20;
                        local_6b0 = local_720._0_8_;
                        uStack_6a8 = local_720._8_8_;
                        local_6a0 = local_710._0_8_;
                        uStack_698 = local_710._8_8_;
                        uVar8 = context->user->instID[0];
                        _local_690 = CONCAT44(uVar8,uVar8);
                        _uStack_688 = CONCAT44(uVar8,uVar8);
                        uVar8 = context->user->instPrimID[0];
                        _uStack_680 = CONCAT44(uVar8,uVar8);
                        _uStack_678 = CONCAT44(uVar8,uVar8);
                        *(float *)(ray + k * 4 + 0x80) = local_bc0;
                        local_b20 = *local_9e8;
                        uStack_b18 = local_9e8[1];
                        local_a70.valid = (int *)&local_b20;
                        local_a70.geometryUserPtr = pGVar9->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_700;
                        local_a70.N = 4;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar383 = ZEXT1664(local_a20._0_16_);
                          (*pGVar9->intersectionFilterN)(&local_a70);
                        }
                        auVar83._8_8_ = uStack_b18;
                        auVar83._0_8_ = local_b20;
                        if (auVar83 == (undefined1  [16])0x0) {
                          auVar143 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar143 = auVar143 ^ _DAT_01febe20;
                          auVar223 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var10 = context->args->filter;
                          auVar223 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar383 = ZEXT1664(auVar383._0_16_);
                            (*p_Var10)(&local_a70);
                            auVar223 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar84._8_8_ = uStack_b18;
                          auVar84._0_8_ = local_b20;
                          auVar102 = vpcmpeqd_avx(auVar84,_DAT_01feba10);
                          auVar209 = vpcmpeqd_avx(auVar209,auVar209);
                          auVar143 = auVar102 ^ auVar209;
                          if (auVar84 != (undefined1  [16])0x0) {
                            auVar102 = auVar102 ^ auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])local_a70.hit);
                            *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x10));
                            *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x20));
                            *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x30));
                            *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x40));
                            *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x50));
                            *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x60));
                            *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x70));
                            *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x80));
                            *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar209;
                          }
                        }
                        auVar244 = ZEXT464((uint)local_bc0);
                        auVar150._8_8_ = 0x100000001;
                        auVar150._0_8_ = 0x100000001;
                        if ((auVar150 & auVar143) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar226;
                        }
                      }
                    }
                  }
                }
                auVar110 = local_5e0;
                bVar95 = lVar92 != 0;
                lVar92 = lVar92 + -1;
              } while ((!bVar72) && (bVar95));
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar119._4_4_ = uVar1;
              auVar119._0_4_ = uVar1;
              auVar119._8_4_ = uVar1;
              auVar119._12_4_ = uVar1;
              auVar119._16_4_ = uVar1;
              auVar119._20_4_ = uVar1;
              auVar119._24_4_ = uVar1;
              auVar119._28_4_ = uVar1;
              auVar350 = vcmpps_avx(_local_820,auVar119,2);
              local_5e0 = vandps_avx(auVar350,local_5e0);
              auVar110 = auVar110 & auVar350;
              uVar93 = local_620._0_8_;
              auVar350 = local_9e0;
            } while ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar110 >> 0x7f,0) != '\0') ||
                       (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar110 >> 0xbf,0) != '\0') ||
                     (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar110[0x1f] < '\0');
          }
          auVar120._0_4_ =
               (float)local_880._0_4_ * (float)local_7c0._0_4_ +
               (float)local_8a0._0_4_ * (float)local_7e0._0_4_ +
               (float)local_840._0_4_ * (float)local_800._0_4_;
          auVar120._4_4_ =
               (float)local_880._4_4_ * (float)local_7c0._4_4_ +
               (float)local_8a0._4_4_ * (float)local_7e0._4_4_ +
               (float)local_840._4_4_ * (float)local_800._4_4_;
          auVar120._8_4_ =
               fStack_878 * fStack_7b8 + fStack_898 * fStack_7d8 + fStack_838 * fStack_7f8;
          auVar120._12_4_ =
               fStack_874 * fStack_7b4 + fStack_894 * fStack_7d4 + fStack_834 * fStack_7f4;
          auVar120._16_4_ =
               fStack_870 * fStack_7b0 + fStack_890 * fStack_7d0 + fStack_830 * fStack_7f0;
          auVar120._20_4_ =
               fStack_86c * fStack_7ac + fStack_88c * fStack_7cc + fStack_82c * fStack_7ec;
          auVar120._24_4_ =
               fStack_868 * fStack_7a8 + fStack_888 * fStack_7c8 + fStack_828 * fStack_7e8;
          auVar120._28_4_ = fStack_864 + fStack_884 + fStack_824;
          auVar172._8_4_ = 0x7fffffff;
          auVar172._0_8_ = 0x7fffffff7fffffff;
          auVar172._12_4_ = 0x7fffffff;
          auVar172._16_4_ = 0x7fffffff;
          auVar172._20_4_ = 0x7fffffff;
          auVar172._24_4_ = 0x7fffffff;
          auVar172._28_4_ = 0x7fffffff;
          auVar110 = vandps_avx(auVar120,auVar172);
          auVar173._8_4_ = 0x3e99999a;
          auVar173._0_8_ = 0x3e99999a3e99999a;
          auVar173._12_4_ = 0x3e99999a;
          auVar173._16_4_ = 0x3e99999a;
          auVar173._20_4_ = 0x3e99999a;
          auVar173._24_4_ = 0x3e99999a;
          auVar173._28_4_ = 0x3e99999a;
          auVar110 = vcmpps_avx(auVar110,auVar173,1);
          auVar12 = vorps_avx(auVar110,local_5c0);
          auVar174._0_4_ = auVar350._0_4_ + (float)local_9a0._0_4_;
          auVar174._4_4_ = auVar350._4_4_ + (float)local_9a0._4_4_;
          auVar174._8_4_ = auVar350._8_4_ + fStack_998;
          auVar174._12_4_ = auVar350._12_4_ + fStack_994;
          auVar174._16_4_ = auVar350._16_4_ + fStack_990;
          auVar174._20_4_ = auVar350._20_4_ + fStack_98c;
          auVar174._24_4_ = auVar350._24_4_ + fStack_988;
          auVar174._28_4_ = auVar350._28_4_ + fStack_984;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar198._4_4_ = uVar1;
          auVar198._0_4_ = uVar1;
          auVar198._8_4_ = uVar1;
          auVar198._12_4_ = uVar1;
          auVar198._16_4_ = uVar1;
          auVar198._20_4_ = uVar1;
          auVar198._24_4_ = uVar1;
          auVar198._28_4_ = uVar1;
          auVar110 = vcmpps_avx(auVar174,auVar198,2);
          _local_880 = vandps_avx(auVar110,local_580);
          auVar175._8_4_ = 3;
          auVar175._0_8_ = 0x300000003;
          auVar175._12_4_ = 3;
          auVar175._16_4_ = 3;
          auVar175._20_4_ = 3;
          auVar175._24_4_ = 3;
          auVar175._28_4_ = 3;
          auVar199._8_4_ = 2;
          auVar199._0_8_ = 0x200000002;
          auVar199._12_4_ = 2;
          auVar199._16_4_ = 2;
          auVar199._20_4_ = 2;
          auVar199._24_4_ = 2;
          auVar199._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar199,auVar175,auVar12);
          auVar143 = vpcmpgtd_avx(auVar110._16_16_,local_660._0_16_);
          auVar209 = vpshufd_avx(local_5a0._0_16_,0);
          auVar209 = vpcmpgtd_avx(auVar110._0_16_,auVar209);
          auVar176._16_16_ = auVar143;
          auVar176._0_16_ = auVar209;
          _local_8a0 = vblendps_avx(ZEXT1632(auVar209),auVar176,0xf0);
          local_600 = vandnps_avx(_local_8a0,_local_880);
          auVar110 = _local_880 & ~_local_8a0;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0x7f,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0xbf,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar110[0x1f] < '\0') {
            local_7a0 = _local_460;
            local_820._4_4_ = (float)local_460._4_4_ + (float)local_9a0._4_4_;
            local_820._0_4_ = (float)local_460._0_4_ + (float)local_9a0._0_4_;
            fStack_818 = fStack_458 + fStack_998;
            fStack_814 = fStack_454 + fStack_994;
            fStack_810 = fStack_450 + fStack_990;
            fStack_80c = fStack_44c + fStack_98c;
            fStack_808 = fStack_448 + fStack_988;
            fStack_804 = fStack_444 + fStack_984;
            do {
              auVar235 = auVar223._0_16_;
              auVar177._8_4_ = 0x7f800000;
              auVar177._0_8_ = 0x7f8000007f800000;
              auVar177._12_4_ = 0x7f800000;
              auVar177._16_4_ = 0x7f800000;
              auVar177._20_4_ = 0x7f800000;
              auVar177._24_4_ = 0x7f800000;
              auVar177._28_4_ = 0x7f800000;
              auVar110 = vblendvps_avx(auVar177,local_7a0,local_600);
              auVar350 = vshufps_avx(auVar110,auVar110,0xb1);
              auVar350 = vminps_avx(auVar110,auVar350);
              auVar12 = vshufpd_avx(auVar350,auVar350,5);
              auVar350 = vminps_avx(auVar350,auVar12);
              auVar12 = vperm2f128_avx(auVar350,auVar350,1);
              auVar350 = vminps_avx(auVar350,auVar12);
              auVar350 = vcmpps_avx(auVar110,auVar350,0);
              auVar12 = local_600 & auVar350;
              auVar110 = local_600;
              if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar12 >> 0x7f,0) != '\0') ||
                    (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar12 >> 0xbf,0) != '\0') ||
                  (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar12[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar350,local_600);
              }
              uVar91 = vmovmskps_avx(auVar110);
              uVar8 = 0;
              if (uVar91 != 0) {
                for (; (uVar91 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                }
              }
              uVar93 = (ulong)uVar8;
              *(undefined4 *)(local_600 + uVar93 * 4) = 0;
              fVar224 = local_520[uVar93];
              uVar8 = *(uint *)(local_440 + uVar93 * 4);
              fVar225 = local_b08;
              if ((float)local_940._0_4_ < 0.0) {
                fVar225 = sqrtf((float)local_940._0_4_);
                auVar235._8_4_ = 0x7fffffff;
                auVar235._0_8_ = 0x7fffffff7fffffff;
                auVar235._12_4_ = 0x7fffffff;
              }
              auVar244 = ZEXT464(uVar8);
              auVar209 = vminps_avx(_local_a80,_local_aa0);
              auVar143 = vmaxps_avx(_local_a80,_local_aa0);
              auVar102 = vminps_avx(_local_a90,_local_ab0);
              auVar187 = vminps_avx(auVar209,auVar102);
              auVar209 = vmaxps_avx(_local_a90,_local_ab0);
              auVar102 = vmaxps_avx(auVar143,auVar209);
              auVar143 = vandps_avx(auVar187,auVar235);
              auVar209 = vandps_avx(auVar102,auVar235);
              auVar143 = vmaxps_avx(auVar143,auVar209);
              auVar209 = vmovshdup_avx(auVar143);
              auVar209 = vmaxss_avx(auVar209,auVar143);
              auVar143 = vshufpd_avx(auVar143,auVar143,1);
              auVar143 = vmaxss_avx(auVar143,auVar209);
              local_a40._0_4_ = auVar143._0_4_ * 1.9073486e-06;
              local_960._0_4_ = fVar225 * 1.9073486e-06;
              local_780._0_16_ = vshufps_avx(auVar102,auVar102,0xff);
              lVar92 = 4;
              do {
                local_b00._0_4_ = 1.0 - fVar224;
                auVar143 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
                fVar225 = auVar143._0_4_;
                fVar226 = auVar143._4_4_;
                fVar227 = auVar143._8_4_;
                fVar228 = auVar143._12_4_;
                auVar143 = vshufps_avx(ZEXT416((uint)local_b00._0_4_),ZEXT416((uint)local_b00._0_4_)
                                       ,0);
                fVar229 = auVar143._0_4_;
                fVar230 = auVar143._4_4_;
                fVar245 = auVar143._8_4_;
                fVar246 = auVar143._12_4_;
                fVar248 = (float)local_a90._0_4_ * fVar225 + (float)local_aa0._0_4_ * fVar229;
                fVar250 = (float)local_a90._4_4_ * fVar226 + (float)local_aa0._4_4_ * fVar230;
                fVar253 = fStack_a88 * fVar227 + fStack_a98 * fVar245;
                fVar256 = fStack_a84 * fVar228 + fStack_a94 * fVar246;
                auVar266._0_4_ =
                     fVar229 * ((float)local_aa0._0_4_ * fVar225 + fVar229 * (float)local_a80._0_4_)
                     + fVar225 * fVar248;
                auVar266._4_4_ =
                     fVar230 * ((float)local_aa0._4_4_ * fVar226 + fVar230 * (float)local_a80._4_4_)
                     + fVar226 * fVar250;
                auVar266._8_4_ =
                     fVar245 * (fStack_a98 * fVar227 + fVar245 * fStack_a78) + fVar227 * fVar253;
                auVar266._12_4_ =
                     fVar246 * (fStack_a94 * fVar228 + fVar246 * fStack_a74) + fVar228 * fVar256;
                auVar210._0_4_ =
                     fVar229 * fVar248 +
                     fVar225 * (fVar225 * (float)local_ab0._0_4_ + (float)local_a90._0_4_ * fVar229)
                ;
                auVar210._4_4_ =
                     fVar230 * fVar250 +
                     fVar226 * (fVar226 * (float)local_ab0._4_4_ + (float)local_a90._4_4_ * fVar230)
                ;
                auVar210._8_4_ =
                     fVar245 * fVar253 + fVar227 * (fVar227 * fStack_aa8 + fStack_a88 * fVar245);
                auVar210._12_4_ =
                     fVar246 * fVar256 + fVar228 * (fVar228 * fStack_aa4 + fStack_a84 * fVar246);
                auVar143 = vshufps_avx(auVar244._0_16_,auVar244._0_16_,0);
                auVar151._0_4_ = auVar143._0_4_ * (float)local_930._0_4_ + 0.0;
                auVar151._4_4_ = auVar143._4_4_ * (float)local_930._4_4_ + 0.0;
                auVar151._8_4_ = auVar143._8_4_ * fStack_928 + 0.0;
                auVar151._12_4_ = auVar143._12_4_ * fStack_924 + 0.0;
                auVar106._0_4_ = fVar229 * auVar266._0_4_ + fVar225 * auVar210._0_4_;
                auVar106._4_4_ = fVar230 * auVar266._4_4_ + fVar226 * auVar210._4_4_;
                auVar106._8_4_ = fVar245 * auVar266._8_4_ + fVar227 * auVar210._8_4_;
                auVar106._12_4_ = fVar246 * auVar266._12_4_ + fVar228 * auVar210._12_4_;
                local_8e0._0_16_ = auVar106;
                auVar143 = vsubps_avx(auVar151,auVar106);
                _local_9c0 = auVar143;
                auVar143 = vdpps_avx(auVar143,auVar143,0x7f);
                fVar225 = auVar143._0_4_;
                local_bc0 = auVar244._0_4_;
                if (fVar225 < 0.0) {
                  local_b00._0_16_ = ZEXT416((uint)local_b00._0_4_);
                  local_ae0._0_16_ = auVar266;
                  local_a20._0_16_ = auVar210;
                  fVar226 = sqrtf(fVar225);
                  auVar210 = local_a20._0_16_;
                  auVar266 = local_ae0._0_16_;
                }
                else {
                  auVar209 = vsqrtss_avx(auVar143,auVar143);
                  fVar226 = auVar209._0_4_;
                }
                auVar209 = vsubps_avx(auVar210,auVar266);
                auVar296._0_4_ = auVar209._0_4_ * 3.0;
                auVar296._4_4_ = auVar209._4_4_ * 3.0;
                auVar296._8_4_ = auVar209._8_4_ * 3.0;
                auVar296._12_4_ = auVar209._12_4_ * 3.0;
                auVar209 = vshufps_avx(ZEXT416((uint)(fVar224 * 6.0)),ZEXT416((uint)(fVar224 * 6.0))
                                       ,0);
                auVar102 = ZEXT416((uint)(((float)local_b00._0_4_ - (fVar224 + fVar224)) * 6.0));
                auVar187 = vshufps_avx(auVar102,auVar102,0);
                auVar102 = ZEXT416((uint)((fVar224 -
                                          ((float)local_b00._0_4_ + (float)local_b00._0_4_)) * 6.0))
                ;
                auVar206 = vshufps_avx(auVar102,auVar102,0);
                auVar3 = vshufps_avx(ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),
                                     ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),0);
                auVar102 = vdpps_avx(auVar296,auVar296,0x7f);
                auVar152._0_4_ =
                     auVar3._0_4_ * (float)local_a80._0_4_ +
                     auVar206._0_4_ * (float)local_aa0._0_4_ +
                     auVar209._0_4_ * (float)local_ab0._0_4_ +
                     auVar187._0_4_ * (float)local_a90._0_4_;
                auVar152._4_4_ =
                     auVar3._4_4_ * (float)local_a80._4_4_ +
                     auVar206._4_4_ * (float)local_aa0._4_4_ +
                     auVar209._4_4_ * (float)local_ab0._4_4_ +
                     auVar187._4_4_ * (float)local_a90._4_4_;
                auVar152._8_4_ =
                     auVar3._8_4_ * fStack_a78 +
                     auVar206._8_4_ * fStack_a98 +
                     auVar209._8_4_ * fStack_aa8 + auVar187._8_4_ * fStack_a88;
                auVar152._12_4_ =
                     auVar3._12_4_ * fStack_a74 +
                     auVar206._12_4_ * fStack_a94 +
                     auVar209._12_4_ * fStack_aa4 + auVar187._12_4_ * fStack_a84;
                auVar209 = vblendps_avx(auVar102,_DAT_01feba10,0xe);
                auVar187 = vrsqrtss_avx(auVar209,auVar209);
                fVar228 = auVar187._0_4_;
                fVar227 = auVar102._0_4_;
                auVar187 = vdpps_avx(auVar296,auVar152,0x7f);
                auVar206 = vshufps_avx(auVar102,auVar102,0);
                auVar153._0_4_ = auVar152._0_4_ * auVar206._0_4_;
                auVar153._4_4_ = auVar152._4_4_ * auVar206._4_4_;
                auVar153._8_4_ = auVar152._8_4_ * auVar206._8_4_;
                auVar153._12_4_ = auVar152._12_4_ * auVar206._12_4_;
                auVar187 = vshufps_avx(auVar187,auVar187,0);
                auVar236._0_4_ = auVar296._0_4_ * auVar187._0_4_;
                auVar236._4_4_ = auVar296._4_4_ * auVar187._4_4_;
                auVar236._8_4_ = auVar296._8_4_ * auVar187._8_4_;
                auVar236._12_4_ = auVar296._12_4_ * auVar187._12_4_;
                auVar3 = vsubps_avx(auVar153,auVar236);
                auVar187 = vrcpss_avx(auVar209,auVar209);
                auVar209 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                      ZEXT416((uint)(local_bc0 * (float)local_960._0_4_)));
                auVar187 = ZEXT416((uint)(auVar187._0_4_ * (2.0 - fVar227 * auVar187._0_4_)));
                auVar187 = vshufps_avx(auVar187,auVar187,0);
                uVar93 = CONCAT44(auVar296._4_4_,auVar296._0_4_);
                auVar267._0_8_ = uVar93 ^ 0x8000000080000000;
                auVar267._8_4_ = -auVar296._8_4_;
                auVar267._12_4_ = -auVar296._12_4_;
                auVar206 = ZEXT416((uint)(fVar228 * 1.5 +
                                         fVar227 * -0.5 * fVar228 * fVar228 * fVar228));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                auVar211._0_4_ = auVar206._0_4_ * auVar3._0_4_ * auVar187._0_4_;
                auVar211._4_4_ = auVar206._4_4_ * auVar3._4_4_ * auVar187._4_4_;
                auVar211._8_4_ = auVar206._8_4_ * auVar3._8_4_ * auVar187._8_4_;
                auVar211._12_4_ = auVar206._12_4_ * auVar3._12_4_ * auVar187._12_4_;
                auVar347._0_4_ = auVar296._0_4_ * auVar206._0_4_;
                auVar347._4_4_ = auVar296._4_4_ * auVar206._4_4_;
                auVar347._8_4_ = auVar296._8_4_ * auVar206._8_4_;
                auVar347._12_4_ = auVar296._12_4_ * auVar206._12_4_;
                local_b00._0_16_ = auVar296;
                local_ae0._0_4_ = auVar209._0_4_;
                if (fVar227 < 0.0) {
                  local_a20._0_4_ = fVar226;
                  local_900._0_16_ = auVar267;
                  local_9e0._0_16_ = auVar347;
                  local_980._0_16_ = auVar211;
                  fVar228 = sqrtf(fVar227);
                  auVar211 = local_980._0_16_;
                  auVar267 = local_900._0_16_;
                  auVar347 = local_9e0._0_16_;
                  fVar227 = (float)local_ae0._0_4_;
                  fVar226 = (float)local_a20._0_4_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar102,auVar102);
                  fVar228 = auVar102._0_4_;
                  fVar227 = auVar209._0_4_;
                }
                auVar209 = vdpps_avx(_local_9c0,auVar347,0x7f);
                fVar226 = ((float)local_a40._0_4_ / fVar228) * (fVar226 + 1.0) +
                          fVar227 + fVar226 * (float)local_a40._0_4_;
                auVar102 = vdpps_avx(auVar267,auVar347,0x7f);
                auVar187 = vdpps_avx(_local_9c0,auVar211,0x7f);
                auVar206 = vdpps_avx(_local_930,auVar347,0x7f);
                auVar3 = vdpps_avx(_local_9c0,auVar267,0x7f);
                fVar228 = auVar102._0_4_ + auVar187._0_4_;
                fVar229 = auVar209._0_4_;
                auVar107._0_4_ = fVar229 * fVar229;
                auVar107._4_4_ = auVar209._4_4_ * auVar209._4_4_;
                auVar107._8_4_ = auVar209._8_4_ * auVar209._8_4_;
                auVar107._12_4_ = auVar209._12_4_ * auVar209._12_4_;
                auVar187 = vsubps_avx(auVar143,auVar107);
                auVar102 = vdpps_avx(_local_9c0,_local_930,0x7f);
                fVar230 = auVar3._0_4_ - fVar229 * fVar228;
                fVar245 = auVar102._0_4_ - fVar229 * auVar206._0_4_;
                auVar102 = vrsqrtss_avx(auVar187,auVar187);
                fVar246 = auVar187._0_4_;
                fVar229 = auVar102._0_4_;
                fVar229 = fVar229 * 1.5 + fVar246 * -0.5 * fVar229 * fVar229 * fVar229;
                if (fVar246 < 0.0) {
                  local_a20._0_16_ = auVar209;
                  local_900._0_4_ = fVar226;
                  local_9e0._0_16_ = ZEXT416((uint)fVar228);
                  local_980._0_16_ = auVar206;
                  local_920._0_4_ = fVar230;
                  local_740._0_4_ = fVar245;
                  local_760._0_4_ = fVar229;
                  fVar246 = sqrtf(fVar246);
                  fVar226 = (float)local_900._0_4_;
                  fVar229 = (float)local_760._0_4_;
                  fVar230 = (float)local_920._0_4_;
                  fVar245 = (float)local_740._0_4_;
                  auVar206 = local_980._0_16_;
                  auVar209 = local_a20._0_16_;
                  auVar102 = local_9e0._0_16_;
                  fVar227 = (float)local_ae0._0_4_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar187,auVar187);
                  fVar246 = auVar102._0_4_;
                  auVar102 = ZEXT416((uint)fVar228);
                }
                auVar383 = ZEXT1664(local_b00._0_16_);
                auVar154 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar147 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
                fVar228 = fVar230 * fVar229 - auVar147._0_4_;
                auVar237._0_8_ = auVar206._0_8_ ^ 0x8000000080000000;
                auVar237._8_4_ = auVar206._8_4_ ^ 0x80000000;
                auVar237._12_4_ = auVar206._12_4_ ^ 0x80000000;
                auVar268._0_4_ = -fVar228;
                auVar268._4_4_ = 0x80000000;
                auVar268._8_4_ = 0x80000000;
                auVar268._12_4_ = 0x80000000;
                auVar187 = vinsertps_avx(ZEXT416((uint)(fVar245 * fVar229)),auVar237,0x10);
                auVar3 = vmovsldup_avx(ZEXT416((uint)(auVar102._0_4_ * fVar245 * fVar229 -
                                                     auVar206._0_4_ * fVar228)));
                auVar187 = vdivps_avx(auVar187,auVar3);
                auVar154 = ZEXT416((uint)(fVar246 - auVar154._0_4_));
                auVar206 = vinsertps_avx(auVar209,auVar154,0x10);
                auVar212._0_4_ = auVar206._0_4_ * auVar187._0_4_;
                auVar212._4_4_ = auVar206._4_4_ * auVar187._4_4_;
                auVar212._8_4_ = auVar206._8_4_ * auVar187._8_4_;
                auVar212._12_4_ = auVar206._12_4_ * auVar187._12_4_;
                auVar102 = vinsertps_avx(auVar268,auVar102,0x1c);
                auVar102 = vdivps_avx(auVar102,auVar3);
                auVar191._0_4_ = auVar206._0_4_ * auVar102._0_4_;
                auVar191._4_4_ = auVar206._4_4_ * auVar102._4_4_;
                auVar191._8_4_ = auVar206._8_4_ * auVar102._8_4_;
                auVar191._12_4_ = auVar206._12_4_ * auVar102._12_4_;
                auVar102 = vhaddps_avx(auVar212,auVar212);
                auVar187 = vhaddps_avx(auVar191,auVar191);
                fVar224 = fVar224 - auVar102._0_4_;
                local_bc0 = local_bc0 - auVar187._0_4_;
                auVar244 = ZEXT464((uint)local_bc0);
                auVar238._8_4_ = 0x7fffffff;
                auVar238._0_8_ = 0x7fffffff7fffffff;
                auVar238._12_4_ = 0x7fffffff;
                auVar223 = ZEXT1664(auVar238);
                auVar209 = vandps_avx(auVar209,auVar238);
                if (fVar226 <= auVar209._0_4_) {
LAB_0117de61:
                  bVar72 = false;
                }
                else {
                  auVar209 = vandps_avx(auVar154,auVar238);
                  if ((float)local_780._0_4_ * 1.9073486e-06 + fVar227 + fVar226 <= auVar209._0_4_)
                  goto LAB_0117de61;
                  local_bc0 = local_bc0 + (float)local_8c0._0_4_;
                  auVar244 = ZEXT464((uint)local_bc0);
                  bVar72 = true;
                  if ((((fVar203 <= local_bc0) &&
                       (fVar226 = *(float *)(ray + k * 4 + 0x80), local_bc0 <= fVar226)) &&
                      (0.0 <= fVar224)) && (fVar224 <= 1.0)) {
                    auVar143 = vrsqrtss_avx(auVar143,auVar143);
                    fVar227 = auVar143._0_4_;
                    pGVar9 = (context->scene->geometries).items[uVar89].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar143 = ZEXT416((uint)(fVar227 * 1.5 +
                                               fVar225 * -0.5 * fVar227 * fVar227 * fVar227));
                      auVar143 = vshufps_avx(auVar143,auVar143,0);
                      auVar155._0_4_ = auVar143._0_4_ * (float)local_9c0._0_4_;
                      auVar155._4_4_ = auVar143._4_4_ * (float)local_9c0._4_4_;
                      auVar155._8_4_ = auVar143._8_4_ * fStack_9b8;
                      auVar155._12_4_ = auVar143._12_4_ * fStack_9b4;
                      auVar108._0_4_ = local_b00._0_4_ + auVar147._0_4_ * auVar155._0_4_;
                      auVar108._4_4_ = local_b00._4_4_ + auVar147._4_4_ * auVar155._4_4_;
                      auVar108._8_4_ = local_b00._8_4_ + auVar147._8_4_ * auVar155._8_4_;
                      auVar108._12_4_ = local_b00._12_4_ + auVar147._12_4_ * auVar155._12_4_;
                      auVar143 = vshufps_avx(auVar155,auVar155,0xc9);
                      auVar209 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                      auVar156._0_4_ = auVar209._0_4_ * auVar155._0_4_;
                      auVar156._4_4_ = auVar209._4_4_ * auVar155._4_4_;
                      auVar156._8_4_ = auVar209._8_4_ * auVar155._8_4_;
                      auVar156._12_4_ = auVar209._12_4_ * auVar155._12_4_;
                      auVar192._0_4_ = local_b00._0_4_ * auVar143._0_4_;
                      auVar192._4_4_ = local_b00._4_4_ * auVar143._4_4_;
                      auVar192._8_4_ = local_b00._8_4_ * auVar143._8_4_;
                      auVar192._12_4_ = local_b00._12_4_ * auVar143._12_4_;
                      auVar102 = vsubps_avx(auVar192,auVar156);
                      auVar143 = vshufps_avx(auVar102,auVar102,0xc9);
                      auVar209 = vshufps_avx(auVar108,auVar108,0xc9);
                      auVar193._0_4_ = auVar209._0_4_ * auVar143._0_4_;
                      auVar193._4_4_ = auVar209._4_4_ * auVar143._4_4_;
                      auVar193._8_4_ = auVar209._8_4_ * auVar143._8_4_;
                      auVar193._12_4_ = auVar209._12_4_ * auVar143._12_4_;
                      auVar143 = vshufps_avx(auVar102,auVar102,0xd2);
                      auVar109._0_4_ = auVar108._0_4_ * auVar143._0_4_;
                      auVar109._4_4_ = auVar108._4_4_ * auVar143._4_4_;
                      auVar109._8_4_ = auVar108._8_4_ * auVar143._8_4_;
                      auVar109._12_4_ = auVar108._12_4_ * auVar143._12_4_;
                      auVar143 = vsubps_avx(auVar193,auVar109);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_bc0;
                        uVar1 = vextractps_avx(auVar143,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                        uVar1 = vextractps_avx(auVar143,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                        *(int *)(ray + k * 4 + 0xe0) = auVar143._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar224;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_b10;
                        *(uint *)(ray + k * 4 + 0x120) = uVar89;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_6d0 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
                        local_700 = (RTCHitN  [16])vshufps_avx(auVar143,auVar143,0x55);
                        auVar209 = vshufps_avx(auVar143,auVar143,0xaa);
                        local_6e0 = vshufps_avx(auVar143,auVar143,0);
                        auStack_6f0 = auVar209;
                        local_6c0 = ZEXT816(0) << 0x20;
                        local_6b0 = local_720._0_8_;
                        uStack_6a8 = local_720._8_8_;
                        local_6a0 = local_710._0_8_;
                        uStack_698 = local_710._8_8_;
                        uVar8 = context->user->instID[0];
                        _local_690 = CONCAT44(uVar8,uVar8);
                        _uStack_688 = CONCAT44(uVar8,uVar8);
                        uVar8 = context->user->instPrimID[0];
                        _uStack_680 = CONCAT44(uVar8,uVar8);
                        _uStack_678 = CONCAT44(uVar8,uVar8);
                        *(float *)(ray + k * 4 + 0x80) = local_bc0;
                        local_b20 = *local_9e8;
                        uStack_b18 = local_9e8[1];
                        local_a70.valid = (int *)&local_b20;
                        local_a70.geometryUserPtr = pGVar9->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_700;
                        local_a70.N = 4;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar383 = ZEXT1664(local_b00._0_16_);
                          (*pGVar9->intersectionFilterN)(&local_a70);
                        }
                        auVar85._8_8_ = uStack_b18;
                        auVar85._0_8_ = local_b20;
                        if (auVar85 == (undefined1  [16])0x0) {
                          auVar143 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar143 = auVar143 ^ _DAT_01febe20;
                          auVar223 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var10 = context->args->filter;
                          auVar223 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar383 = ZEXT1664(auVar383._0_16_);
                            (*p_Var10)(&local_a70);
                            auVar223 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar86._8_8_ = uStack_b18;
                          auVar86._0_8_ = local_b20;
                          auVar102 = vpcmpeqd_avx(auVar86,_DAT_01feba10);
                          auVar209 = vpcmpeqd_avx(auVar209,auVar209);
                          auVar143 = auVar102 ^ auVar209;
                          if (auVar86 != (undefined1  [16])0x0) {
                            auVar102 = auVar102 ^ auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])local_a70.hit);
                            *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x10));
                            *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x20));
                            *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x30));
                            *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x40));
                            *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x50));
                            *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x60));
                            *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x70));
                            *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar209;
                            auVar209 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x80));
                            *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar209;
                          }
                        }
                        auVar244 = ZEXT464((uint)local_bc0);
                        auVar157._8_8_ = 0x100000001;
                        auVar157._0_8_ = 0x100000001;
                        if ((auVar157 & auVar143) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar226;
                        }
                      }
                    }
                  }
                }
                auVar110 = local_600;
                bVar95 = lVar92 != 0;
                lVar92 = lVar92 + -1;
              } while ((!bVar72) && (bVar95));
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar121._4_4_ = uVar1;
              auVar121._0_4_ = uVar1;
              auVar121._8_4_ = uVar1;
              auVar121._12_4_ = uVar1;
              auVar121._16_4_ = uVar1;
              auVar121._20_4_ = uVar1;
              auVar121._24_4_ = uVar1;
              auVar121._28_4_ = uVar1;
              auVar350 = vcmpps_avx(_local_820,auVar121,2);
              local_600 = vandps_avx(auVar350,local_600);
              auVar110 = auVar110 & auVar350;
              uVar93 = local_620._0_8_;
            } while ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar110 >> 0x7f,0) != '\0') ||
                       (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar110 >> 0xbf,0) != '\0') ||
                     (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar110[0x1f] < '\0');
          }
          auVar110 = vandps_avx(local_560,local_540);
          auVar350 = vandps_avx(_local_8a0,_local_880);
          auVar306 = ZEXT3264(_local_9a0);
          auVar200._0_4_ = local_9a0._0_4_ + local_4a0._0_4_;
          auVar200._4_4_ = local_9a0._4_4_ + local_4a0._4_4_;
          auVar200._8_4_ = local_9a0._8_4_ + local_4a0._8_4_;
          auVar200._12_4_ = local_9a0._12_4_ + local_4a0._12_4_;
          auVar200._16_4_ = local_9a0._16_4_ + local_4a0._16_4_;
          auVar200._20_4_ = local_9a0._20_4_ + local_4a0._20_4_;
          auVar200._24_4_ = local_9a0._24_4_ + local_4a0._24_4_;
          auVar200._28_4_ = local_9a0._28_4_ + local_4a0._28_4_;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar242._4_4_ = uVar1;
          auVar242._0_4_ = uVar1;
          auVar242._8_4_ = uVar1;
          auVar242._12_4_ = uVar1;
          auVar242._16_4_ = uVar1;
          auVar242._20_4_ = uVar1;
          auVar242._24_4_ = uVar1;
          auVar242._28_4_ = uVar1;
          auVar12 = vcmpps_avx(auVar200,auVar242,2);
          auVar110 = vandps_avx(auVar12,auVar110);
          auVar277._0_4_ = local_9a0._0_4_ + local_460._0_4_;
          auVar277._4_4_ = local_9a0._4_4_ + local_460._4_4_;
          auVar277._8_4_ = local_9a0._8_4_ + local_460._8_4_;
          auVar277._12_4_ = local_9a0._12_4_ + local_460._12_4_;
          auVar277._16_4_ = local_9a0._16_4_ + local_460._16_4_;
          auVar277._20_4_ = local_9a0._20_4_ + local_460._20_4_;
          auVar277._24_4_ = local_9a0._24_4_ + local_460._24_4_;
          auVar277._28_4_ = local_9a0._28_4_ + local_460._28_4_;
          auVar12 = vcmpps_avx(auVar277,auVar242,2);
          auVar350 = vandps_avx(auVar12,auVar350);
          auVar350 = vorps_avx(auVar110,auVar350);
          if ((((((((auVar350 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar350 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar350 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar350 >> 0x7f,0) == '\0') &&
                (auVar350 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar350 >> 0xbf,0) == '\0') &&
              (auVar350 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar350[0x1f]) {
            auVar243._8_4_ = 0x3f800000;
            auVar243._0_8_ = &DAT_3f8000003f800000;
            auVar243._12_4_ = 0x3f800000;
            auVar243._16_4_ = 0x3f800000;
            auVar243._20_4_ = 0x3f800000;
            auVar243._24_4_ = 0x3f800000;
            auVar243._28_4_ = 0x3f800000;
            goto LAB_0117c468;
          }
          *(undefined1 (*) [32])(auStack_180 + uVar90 * 0x60) = auVar350;
          auVar110 = vblendvps_avx(_local_460,_local_4a0,auVar110);
          *(undefined1 (*) [32])(auStack_160 + uVar90 * 0x60) = auVar110;
          uVar2 = vmovlps_avx(auVar320);
          *(undefined8 *)(afStack_140 + uVar90 * 0x18) = uVar2;
          auStack_138[uVar90 * 0x18] = (int)uVar93 + 1;
          uVar90 = (ulong)((int)uVar90 + 1);
        }
        auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
    }
    auVar334 = ZEXT1664(auVar320);
    do {
      if ((int)uVar90 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar122._4_4_ = uVar1;
        auVar122._0_4_ = uVar1;
        auVar122._8_4_ = uVar1;
        auVar122._12_4_ = uVar1;
        auVar122._16_4_ = uVar1;
        auVar122._20_4_ = uVar1;
        auVar122._24_4_ = uVar1;
        auVar122._28_4_ = uVar1;
        auVar110 = vcmpps_avx(local_3e0,auVar122,2);
        uVar89 = vmovmskps_avx(auVar110);
        uVar89 = (uint)local_8a8 & uVar89;
        if (uVar89 == 0) {
          return;
        }
        goto LAB_0117b731;
      }
      uVar94 = (ulong)((int)uVar90 - 1);
      lVar92 = uVar94 * 0x60;
      auVar110 = *(undefined1 (*) [32])(auStack_160 + lVar92);
      auVar117._0_4_ = auVar306._0_4_ + auVar110._0_4_;
      auVar117._4_4_ = auVar306._4_4_ + auVar110._4_4_;
      auVar117._8_4_ = auVar306._8_4_ + auVar110._8_4_;
      auVar117._12_4_ = auVar306._12_4_ + auVar110._12_4_;
      auVar117._16_4_ = auVar306._16_4_ + auVar110._16_4_;
      auVar117._20_4_ = auVar306._20_4_ + auVar110._20_4_;
      auVar117._24_4_ = auVar306._24_4_ + auVar110._24_4_;
      auVar117._28_4_ = auVar306._28_4_ + auVar110._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar222._4_4_ = uVar1;
      auVar222._0_4_ = uVar1;
      auVar222._8_4_ = uVar1;
      auVar222._12_4_ = uVar1;
      auVar222._16_4_ = uVar1;
      auVar222._20_4_ = uVar1;
      auVar222._24_4_ = uVar1;
      auVar222._28_4_ = uVar1;
      auVar12 = vcmpps_avx(auVar117,auVar222,2);
      auVar350 = vandps_avx(auVar12,*(undefined1 (*) [32])(auStack_180 + lVar92));
      _local_700 = auVar350;
      auVar331 = *(undefined1 (*) [32])(auStack_180 + lVar92) & auVar12;
      bVar77 = (auVar331 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar78 = (auVar331 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar76 = (auVar331 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar75 = SUB321(auVar331 >> 0x7f,0) == '\0';
      bVar74 = (auVar331 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar73 = SUB321(auVar331 >> 0xbf,0) == '\0';
      bVar95 = (auVar331 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar72 = -1 < auVar331[0x1f];
      if (((((((!bVar77 || !bVar78) || !bVar76) || !bVar75) || !bVar74) || !bVar73) || !bVar95) ||
          !bVar72) {
        auVar196._8_4_ = 0x7f800000;
        auVar196._0_8_ = 0x7f8000007f800000;
        auVar196._12_4_ = 0x7f800000;
        auVar196._16_4_ = 0x7f800000;
        auVar196._20_4_ = 0x7f800000;
        auVar196._24_4_ = 0x7f800000;
        auVar196._28_4_ = 0x7f800000;
        auVar110 = vblendvps_avx(auVar196,auVar110,auVar350);
        auVar12 = vshufps_avx(auVar110,auVar110,0xb1);
        auVar12 = vminps_avx(auVar110,auVar12);
        auVar331 = vshufpd_avx(auVar12,auVar12,5);
        auVar331 = vminps_avx(auVar12,auVar331);
        auVar12 = vperm2f128_avx(auVar331,auVar331,1);
        auVar331 = vminps_avx(auVar331,auVar12);
        auVar110 = vcmpps_avx(auVar110,auVar331,0);
        auVar331 = auVar350 & auVar110;
        if ((((((((auVar331 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar331 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar331 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar331 >> 0x7f,0) != '\0') ||
              (auVar331 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar331 >> 0xbf,0) != '\0') ||
            (auVar331 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar331[0x1f] < '\0') {
          auVar350 = vandps_avx(auVar110,auVar350);
        }
        fVar224 = afStack_140[uVar94 * 0x18 + 1];
        uVar93 = (ulong)auStack_138[uVar94 * 0x18];
        uVar91 = vmovmskps_avx(auVar350);
        uVar8 = 0;
        if (uVar91 != 0) {
          for (; (uVar91 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        fVar225 = afStack_140[uVar94 * 0x18];
        *(undefined4 *)(local_700 + (ulong)uVar8 * 4) = 0;
        if ((((((((_local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_700 >> 0x7f,0) != '\0') ||
              (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_700 >> 0xbf,0) != '\0') ||
            (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_700[0x1f] < '\0') {
          uVar94 = uVar90;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar92) = _local_700;
        auVar143 = vshufps_avx(ZEXT416((uint)(fVar224 - fVar225)),ZEXT416((uint)(fVar224 - fVar225))
                               ,0);
        local_4a0._4_4_ = fVar225 + auVar143._4_4_ * 0.14285715;
        local_4a0._0_4_ = fVar225 + auVar143._0_4_ * 0.0;
        fStack_498 = fVar225 + auVar143._8_4_ * 0.2857143;
        fStack_494 = fVar225 + auVar143._12_4_ * 0.42857146;
        fStack_490 = fVar225 + auVar143._0_4_ * 0.5714286;
        fStack_48c = fVar225 + auVar143._4_4_ * 0.71428573;
        fStack_488 = fVar225 + auVar143._8_4_ * 0.8571429;
        fStack_484 = fVar225 + auVar143._12_4_;
        auVar334 = ZEXT864(*(ulong *)(local_4a0 + (ulong)uVar8 * 4));
      }
      uVar90 = uVar94;
      auVar223 = ZEXT3264(auVar12);
    } while (((((((bVar77 && bVar78) && bVar76) && bVar75) && bVar74) && bVar73) && bVar95) &&
             bVar72);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }